

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx::forward_int8_x86
          (Convolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Mat *pMVar1;
  ulong *puVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  undefined4 uVar15;
  size_t sVar16;
  Layer *pLVar17;
  size_t sVar18;
  undefined1 auVar19 [12];
  ulong uVar20;
  undefined1 auVar21 [12];
  undefined4 uVar22;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined4 uVar30;
  undefined1 uVar31;
  undefined1 uVar33;
  undefined1 uVar35;
  undefined1 uVar37;
  undefined4 uVar38;
  undefined1 uVar39;
  undefined1 uVar41;
  undefined1 uVar43;
  undefined1 uVar45;
  undefined1 uVar46;
  undefined1 uVar47;
  undefined1 uVar49;
  undefined1 uVar51;
  int iVar52;
  int iVar53;
  undefined1 (*pauVar54) [16];
  undefined8 *puVar55;
  void *pvVar56;
  ulong *puVar57;
  int *piVar58;
  long lVar59;
  long lVar60;
  ulong uVar61;
  long lVar62;
  long lVar63;
  undefined1 (*pauVar64) [16];
  long lVar65;
  long lVar66;
  int iVar67;
  undefined1 (*pauVar68) [32];
  long lVar69;
  long lVar70;
  ulong uVar71;
  bool *pbVar72;
  undefined4 uVar73;
  int iVar74;
  long lVar75;
  ulong *puVar76;
  int *piVar77;
  int m_3;
  int iVar78;
  long lVar79;
  int iVar80;
  int iVar81;
  undefined1 (*pauVar82) [16];
  undefined1 (*pauVar83) [32];
  long lVar84;
  long lVar85;
  ulong uVar86;
  int iVar87;
  long lVar88;
  long lVar89;
  ulong uVar90;
  uint uVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  undefined4 *puVar95;
  ulong uVar96;
  ulong uVar97;
  int k_20;
  int k;
  int iVar98;
  int iVar99;
  undefined1 *puVar100;
  long lVar101;
  ulong *puVar102;
  int k_6;
  undefined1 *puVar103;
  long lVar104;
  void *pvVar105;
  int *piVar106;
  int m_7;
  int iVar107;
  undefined1 *puVar108;
  long lVar109;
  int m_9;
  int iVar110;
  undefined1 *puVar111;
  long lVar112;
  long lVar113;
  int cstep;
  uint uVar114;
  int iVar115;
  Option *pOVar116;
  undefined1 (*pauVar117) [32];
  undefined1 (*pauVar118) [16];
  int m_4;
  int iVar119;
  uint uVar120;
  uint uVar121;
  int iVar122;
  long lVar123;
  undefined1 (*pauVar124) [16];
  bool bVar125;
  int sum0 [4];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  int sum1 [4];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  int sum0_1 [4];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [64];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [64];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  int in_stack_fffffffffffffa48;
  void *local_5b0;
  undefined1 (*local_580) [16];
  undefined1 *local_578;
  undefined1 *local_570;
  undefined1 *local_560;
  undefined1 *local_558;
  undefined1 *local_530;
  int TILE_N;
  ulong local_520;
  ulong local_518;
  int TILE_M;
  ulong local_508;
  ulong local_500;
  ulong local_4f8;
  ulong local_4f0;
  Option *local_4e8;
  ulong local_4e0;
  int TILE_K;
  int *local_4d0;
  ulong local_4c8;
  ulong local_4c0;
  undefined1 local_4b8 [16];
  undefined1 (*local_4a0) [16];
  ulong local_498;
  void *local_490;
  Mat local_488;
  ulong local_438;
  undefined1 (*local_430) [16];
  undefined1 (*local_428) [16];
  int local_41c;
  Mat local_418;
  Mat m;
  Mat local_378;
  ulong local_330;
  ulong local_328;
  Mat m_1;
  Mat local_290;
  Option opt_q;
  undefined8 local_208;
  int aiStack_200 [2];
  undefined1 local_1f8 [16];
  int aiStack_1e8 [8];
  undefined1 auStack_1c8 [8];
  int local_1c0 [10];
  undefined1 local_198 [6] [16];
  undefined1 local_138 [6] [16];
  undefined1 local_d8 [16];
  ulong local_c0;
  ulong local_b8;
  int local_ac;
  Mat local_a8;
  undefined1 (*local_58) [16];
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  undefined4 uVar24;
  undefined3 uVar26;
  undefined2 uVar28;
  undefined4 uVar32;
  undefined3 uVar34;
  undefined2 uVar36;
  undefined4 uVar40;
  undefined3 uVar42;
  undefined2 uVar44;
  undefined3 uVar48;
  undefined2 uVar50;
  
  local_a8.elempack = bottom_blob->elempack;
  local_a8.elemsize = bottom_blob->elemsize;
  piVar77 = bottom_blob->refcount;
  local_a8.data = bottom_blob->data;
  local_a8.refcount = bottom_blob->refcount;
  local_a8.allocator = bottom_blob->allocator;
  local_a8.dims = bottom_blob->dims;
  local_a8.w = bottom_blob->w;
  local_a8.h = bottom_blob->h;
  local_a8.d = bottom_blob->d;
  local_a8.c = bottom_blob->c;
  local_a8.cstep = bottom_blob->cstep;
  if (piVar77 != (int *)0x0) {
    LOCK();
    *piVar77 = *piVar77 + 1;
    UNLOCK();
  }
  if (local_a8.elempack == 0 || ((int)local_a8.elemsize * 8) / local_a8.elempack != 8) {
    opt_q.lightmode = opt->lightmode;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_ops = opt->use_subgroup_ops;
    opt_q.use_reserved_0 = opt->use_reserved_0;
    opt_q.num_threads = opt->num_threads;
    uVar22 = opt->openmp_blocktime;
    uVar23 = opt->use_winograd_convolution;
    uVar25 = opt->use_sgemm_convolution;
    uVar27 = opt->use_int8_inference;
    uVar29 = opt->use_vulkan_compute;
    uVar28 = CONCAT11(uVar29,uVar27);
    uVar26 = CONCAT21(uVar28,uVar25);
    uVar24 = CONCAT31(uVar26,uVar23);
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    uVar30 = opt->vulkan_device_index;
    uVar31 = opt->use_reserved_1;
    uVar33 = opt->use_image_storage;
    uVar35 = opt->use_tensor_storage;
    uVar37 = opt->use_reserved_2;
    uVar36 = CONCAT11(uVar37,uVar35);
    uVar34 = CONCAT21(uVar36,uVar33);
    uVar32 = CONCAT31(uVar34,uVar31);
    uVar38 = opt->flush_denormals;
    uVar39 = opt->use_local_pool_allocator;
    uVar41 = opt->use_shader_local_memory;
    uVar43 = opt->use_cooperative_matrix;
    uVar45 = opt->use_winograd23_convolution;
    uVar44 = CONCAT11(uVar45,uVar43);
    uVar42 = CONCAT21(uVar44,uVar41);
    uVar40 = CONCAT31(uVar42,uVar39);
    uVar3._0_1_ = opt->use_winograd43_convolution;
    uVar3._1_1_ = opt->use_winograd63_convolution;
    uVar3._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar3._3_1_ = opt->use_fp16_uniform;
    uVar46 = opt->use_int8_uniform;
    uVar47 = opt->use_reserved_9;
    uVar49 = opt->use_reserved_10;
    uVar51 = opt->use_reserved_11;
    uVar50 = CONCAT11(uVar51,uVar49);
    uVar48 = CONCAT21(uVar50,uVar47);
    uVar3._4_4_ = CONCAT31(uVar48,uVar46);
    opt_q._56_4_ = SUB84(uVar3,0);
    opt_q.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.workspace_allocator._4_4_ = (int)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.openmp_blocktime = uVar22;
    opt_q._28_4_ = uVar24;
    opt_q.vulkan_device_index = uVar30;
    opt_q._44_4_ = uVar32;
    opt_q.flush_denormals = uVar38;
    opt_q._52_4_ = uVar40;
    opt_q._60_4_ = uVar3._4_4_;
    quantize_to_int8(bottom_blob,&local_a8,&(this->super_Convolution).bottom_blob_int8_scales,&opt_q
                    );
    auVar130._0_4_ = -100;
    if ((local_a8.data == (void *)0x0) || ((long)local_a8.c * local_a8.cstep == 0))
    goto LAB_00208226;
  }
  local_488.cstep = 0;
  local_488.data = (void *)0x0;
  local_488.refcount._0_4_ = 0;
  local_488.refcount._4_4_ = 0;
  local_488.elemsize = 0;
  local_488.elempack = 0;
  local_488.allocator = (Allocator *)0x0;
  local_488.dims = 0;
  local_488.w = 0;
  local_488.h = 0;
  local_488.d = 0;
  local_488.c = 0;
  Convolution::make_padding(&this->super_Convolution,&local_a8,&local_488,opt);
  iVar53 = local_488.c;
  iVar52 = local_488.elempack;
  auVar130._0_4_ = -100;
  if ((local_488.data != (void *)0x0) && (local_488.cstep * (long)local_488.c != 0)) {
    auVar130._4_4_ = (this->super_Convolution).num_output;
    iVar119 = (~(((this->super_Convolution).kernel_w + -1) * (this->super_Convolution).dilation_w) +
              local_488.w) / (this->super_Convolution).stride_w + 1;
    iVar80 = (~(((this->super_Convolution).kernel_h + -1) * (this->super_Convolution).dilation_h) +
             local_488.h) / (this->super_Convolution).stride_h + 1;
    iVar14 = (this->super_Convolution).int8_scale_term;
    if (opt->use_packing_layout == true) {
      if (iVar14 < 0x65) {
        uVar121 = (uint)((auVar130._4_4_ & 3) == 0) * 3 + 1;
      }
      else {
        uVar121 = 1;
      }
      if ((auVar130._4_4_ & 7) == 0) {
        uVar121 = 8;
      }
    }
    else {
      uVar121 = 1;
    }
    uVar120 = uVar121 * 4;
    if (100 < iVar14) {
      uVar120 = uVar121;
    }
    Mat::create(top_blob,iVar119,iVar80,(int)auVar130._4_4_ / (int)uVar121,(ulong)uVar120,uVar121,
                opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (opt->use_packing_layout == true) {
        auVar130._4_4_ = (this->super_Convolution).num_output;
        if (iVar14 < 0x65) {
          auVar130._0_4_ = (uint)((auVar130._4_4_ & 3) == 0) * 3 + 1;
        }
        else {
          auVar130._0_4_ = 1;
        }
        if ((auVar130._4_4_ & 7) == 0) {
          auVar130._0_4_ = 8;
        }
      }
      else {
        auVar130._0_4_ = 1;
      }
      if ((opt->use_winograd23_convolution == false) && (opt->use_winograd43_convolution != true)) {
        bVar125 = false;
      }
      else {
        bVar125 = true;
        if (iVar52 * iVar53 < 9) {
          bVar125 = 8 < (this->super_Convolution).num_output;
        }
      }
      if ((opt->use_packing_layout != false) &&
         ((auVar137._0_4_ = (this->super_Convolution).kernel_w,
          auVar137._4_4_ = (this->super_Convolution).kernel_h,
          auVar137._8_4_ = (this->super_Convolution).dilation_w,
          auVar137._12_4_ = (this->super_Convolution).dilation_h,
          ((this->super_Convolution).stride_w == 1 & opt->use_winograd_convolution &
           (this->super_Convolution).stride_h == 1 & auVar137 == _DAT_00539540 & bVar125) != 0 ||
          (opt->use_sgemm_convolution == false)))) {
        auVar130._0_4_ = (uint)(((this->super_Convolution).num_output & 3) == 0) * 3 + 1;
      }
      local_418.cstep = 0;
      local_418.data = (void *)0x0;
      local_418.refcount._0_4_ = 0;
      local_418.refcount._4_4_ = 0;
      local_418.elemsize = 0;
      local_418.elempack = 0;
      local_418.allocator = (Allocator *)0x0;
      local_418.dims = 0;
      local_418.w = 0;
      local_418.h = 0;
      local_418.d = 0;
      local_418.c = 0;
      Mat::create(&local_418,iVar119,iVar80,(this->super_Convolution).num_output / auVar130._0_4_,
                  (ulong)(uint)(auVar130._0_4_ * 4),auVar130._0_4_,opt->workspace_allocator);
      auVar130._0_4_ = -100;
      if ((local_418.data != (void *)0x0) &&
         (local_4e8 = opt, (long)local_418.c * local_418.cstep != 0)) {
        auVar130._0_4_ = this->nT;
        iVar52 = auVar130._0_4_;
        if (auVar130._0_4_ == 0) {
          iVar52 = opt->num_threads;
        }
        if (opt->num_threads != auVar130._0_4_ && auVar130._0_4_ != 0) {
          fprintf(_stderr,"opt.num_threads %d changed, convolution gemm will use load-time value %d"
                 );
          fputc(10,_stderr);
        }
        auVar130._0_4_ = (this->super_Convolution).kernel_w;
        auVar130._4_4_ = (this->super_Convolution).kernel_h;
        auVar130._8_4_ = (this->super_Convolution).dilation_w;
        auVar130._12_4_ = (this->super_Convolution).dilation_h;
        uVar121 = (this->super_Convolution).stride_w;
        local_518 = (ulong)uVar121;
        uVar120 = (this->super_Convolution).stride_h;
        local_4e0 = (ulong)uVar120;
        if ((uVar121 == 1 & opt->use_winograd_convolution & uVar120 == 1 & bVar125 &
            auVar130 == _DAT_00539540) == 1) {
          if (((opt->use_winograd43_convolution == true) &&
              ((this->weight_winograd43_data).data != (void *)0x0)) &&
             ((long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep != 0)) {
            auVar130._0_4_ = cpu_support_x86_avx_vnni();
            pMVar1 = &this->weight_winograd43_data;
            if (auVar130._0_4_ == 0) {
              auVar130._0_4_ = cpu_support_x86_avx2();
              if (auVar130._0_4_ == 0) {
                auVar130._0_4_ = cpu_support_x86_xop();
                if (auVar130._0_4_ == 0) {
                  auVar129._4_4_ = local_418.h;
                  auVar129._0_4_ = local_418.w;
                  auVar136._8_4_ = 3;
                  auVar136._0_8_ = 0x300000003;
                  auVar136._12_4_ = 3;
                  auVar129._8_8_ = 0;
                  auVar130 = vpaddd_avx(auVar129,auVar136);
                  auVar137 = vpsrad_avx(auVar130,0x1f);
                  auVar137 = vpsrld_avx(auVar137,0x1e);
                  auVar130 = vpaddd_avx(auVar130,auVar137);
                  auVar130 = vpsrad_avx(auVar130,2);
                  iVar107 = local_418.elempack * local_418.c;
                  uVar121 = auVar130._4_4_ * auVar130._0_4_;
                  auVar130._4_4_ = local_488.elempack * local_488.c;
                  uVar61 = (ulong)auVar130._4_4_;
                  get_optimal_tile_mnk_int8
                            (iVar107,uVar121,auVar130._4_4_,&TILE_M,&TILE_N,&TILE_K,iVar52);
                  iVar80 = TILE_K;
                  iVar53 = TILE_N;
                  iVar119 = (iVar107 + TILE_M + -1) / TILE_M;
                  iVar92 = (int)(uVar121 + TILE_N + -1) / TILE_N;
                  iVar98 = (int)(auVar130._4_4_ + TILE_K + -1) / TILE_K;
                  local_378.cstep = 0;
                  iVar78 = TILE_K * TILE_N;
                  local_378.data = (void *)0x0;
                  local_378.refcount._0_4_ = 0;
                  local_378.refcount._4_4_ = 0;
                  local_378.elemsize = 0;
                  local_378.elempack = 0;
                  local_378.allocator = (Allocator *)0x0;
                  local_378.dims = 0;
                  local_378.w = 0;
                  local_378.h = 0;
                  local_378.d = 0;
                  local_378.c = 0;
                  Mat::create(&local_378,iVar78,0x24,iVar98,iVar92,4,local_4e8->workspace_allocator)
                  ;
                  auVar130._0_4_ = -100;
                  local_330 = uVar61;
                  if ((local_378.data != (void *)0x0) && ((long)local_378.c * local_378.cstep != 0))
                  {
                    iVar92 = iVar92 * iVar98;
                    iVar78 = iVar78 * 0x24;
                    local_328 = (ulong)uVar121;
                    if ((iVar52 < 2) || (iVar52 <= iVar92)) {
                      local_208 = 0;
                      opt_q.lightmode = false;
                      opt_q.use_shader_pack8 = false;
                      opt_q.use_subgroup_ops = false;
                      opt_q.use_reserved_0 = false;
                      opt_q.num_threads = 0;
                      opt_q.blob_allocator._0_4_ = 0;
                      opt_q.blob_allocator._4_4_ = 0;
                      opt_q.workspace_allocator._0_4_ = 0;
                      opt_q.workspace_allocator._4_4_ = 0;
                      opt_q.openmp_blocktime = 0;
                      opt_q.use_bf16_storage = false;
                      opt_q.use_fp16_packed = false;
                      opt_q.use_fp16_storage = false;
                      opt_q.use_fp16_arithmetic = false;
                      opt_q.use_int8_packed = false;
                      opt_q.use_int8_storage = false;
                      opt_q.use_int8_arithmetic = false;
                      opt_q.use_packing_layout = false;
                      opt_q.vulkan_device_index = 0;
                      opt_q.use_reserved_1 = false;
                      opt_q.use_image_storage = false;
                      opt_q.use_tensor_storage = false;
                      opt_q.use_reserved_2 = false;
                      opt_q.flush_denormals = 0;
                      opt_q.use_local_pool_allocator = false;
                      opt_q.use_shader_local_memory = false;
                      opt_q.use_cooperative_matrix = false;
                      opt_q.use_winograd23_convolution = false;
                      opt_q.use_winograd43_convolution = false;
                      opt_q.use_winograd63_convolution = false;
                      opt_q.use_a53_a55_optimized_kernel = false;
                      opt_q.use_fp16_uniform = false;
                      Mat::create((Mat *)&opt_q,iVar78,1,iVar52,4,local_4e8->workspace_allocator);
                      if ((opt_q._0_8_ != 0) && ((long)(int)opt_q._56_4_ * local_208 != 0)) {
                        auVar130._0_4_ = 0;
                        if (iVar92 < 1) {
                          iVar92 = 0;
                        }
                        for (; iVar92 != auVar130._0_4_; auVar130._0_4_ = auVar130._0_4_ + 1) {
                          iVar74 = (auVar130._0_4_ / iVar98) * iVar53;
                          iVar93 = (int)((long)auVar130._0_4_ % (long)iVar98) * iVar80;
                          iVar78 = (int)local_328 - iVar74;
                          if (iVar53 < iVar78) {
                            iVar78 = iVar53;
                          }
                          iVar122 = (int)local_330 - iVar93;
                          if (iVar80 < iVar122) {
                            iVar122 = iVar80;
                          }
                          iVar99 = get_omp_thread_num();
                          m.elemsize = CONCAT44(opt_q.workspace_allocator._4_4_,
                                                opt_q.workspace_allocator._0_4_);
                          m.data = (void *)((long)iVar99 * local_208 * m.elemsize + opt_q._0_8_);
                          m.refcount._0_4_ = 0;
                          m.refcount._4_4_ = 0;
                          m.elempack = opt_q.openmp_blocktime;
                          m.allocator = (Allocator *)opt_q._32_8_;
                          m.w._0_1_ = opt_q.use_reserved_1;
                          m.w._1_1_ = opt_q.use_image_storage;
                          m.w._2_1_ = opt_q.use_tensor_storage;
                          m.w._3_1_ = opt_q.use_reserved_2;
                          m.h = opt_q.flush_denormals;
                          m.d = 1;
                          m.c._0_1_ = opt_q.use_local_pool_allocator;
                          m.c._1_1_ = opt_q.use_shader_local_memory;
                          m.c._2_1_ = opt_q.use_cooperative_matrix;
                          m.c._3_1_ = opt_q.use_winograd23_convolution;
                          m.dims = opt_q.vulkan_device_index + -1;
                          m.cstep = (m.elemsize *
                                     (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_ + 0xf &
                                    0xfffffffffffffff0) / m.elemsize;
                          if (opt_q.vulkan_device_index == 4) {
                            m.cstep = (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_;
                          }
                          conv3x3s1_winograd43_transform_input_tile_int8
                                    (&local_488,&m,iVar74,iVar78,iVar93,iVar122,
                                     in_stack_fffffffffffffa48);
                          m_1.cstep = (long)local_378.h * (long)local_378.w;
                          m_1.data = (void *)((long)local_378.data +
                                             ((long)auVar130._0_4_ % (long)iVar98 & 0xffffffffU) *
                                             local_378.elemsize * m_1.cstep +
                                             (long)(auVar130._0_4_ / iVar98) * local_378.cstep *
                                             local_378.elemsize);
                          m_1.refcount = (int *)0x0;
                          m_1.elemsize = local_378.elemsize;
                          m_1.elempack = local_378.elempack;
                          m_1.allocator = local_378.allocator;
                          m_1.dims = 2;
                          m_1.w = local_378.w;
                          m_1.h = local_378.h;
                          m_1.d = 1;
                          m_1.c = 1;
                          transpose_pack_B_tile_int8(&m,&m_1,0x24,iVar78,iVar122,(int)m_1.cstep);
                        }
                        piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                  opt_q.blob_allocator._0_4_);
                        if (piVar77 != (int *)0x0) {
                          LOCK();
                          *piVar77 = *piVar77 + -1;
                          UNLOCK();
                          if (*piVar77 == 0) {
                            if (opt_q._32_8_ == 0) goto LAB_00209395;
                            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                          }
                        }
                        goto LAB_0020939d;
                      }
                      piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                opt_q.blob_allocator._0_4_);
                      if (piVar77 != (int *)0x0) {
                        LOCK();
                        *piVar77 = *piVar77 + -1;
                        UNLOCK();
                        if (*piVar77 == 0) {
                          if (opt_q._32_8_ == 0) goto LAB_00209349;
                          (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                        }
                      }
                    }
                    else {
                      local_208 = 0;
                      opt_q.lightmode = false;
                      opt_q.use_shader_pack8 = false;
                      opt_q.use_subgroup_ops = false;
                      opt_q.use_reserved_0 = false;
                      opt_q.num_threads = 0;
                      opt_q.blob_allocator._0_4_ = 0;
                      opt_q.blob_allocator._4_4_ = 0;
                      opt_q.workspace_allocator._0_4_ = 0;
                      opt_q.workspace_allocator._4_4_ = 0;
                      opt_q.openmp_blocktime = 0;
                      opt_q.use_bf16_storage = false;
                      opt_q.use_fp16_packed = false;
                      opt_q.use_fp16_storage = false;
                      opt_q.use_fp16_arithmetic = false;
                      opt_q.use_int8_packed = false;
                      opt_q.use_int8_storage = false;
                      opt_q.use_int8_arithmetic = false;
                      opt_q.use_packing_layout = false;
                      opt_q.vulkan_device_index = 0;
                      opt_q.use_reserved_1 = false;
                      opt_q.use_image_storage = false;
                      opt_q.use_tensor_storage = false;
                      opt_q.use_reserved_2 = false;
                      opt_q.flush_denormals = 0;
                      opt_q.use_local_pool_allocator = false;
                      opt_q.use_shader_local_memory = false;
                      opt_q.use_cooperative_matrix = false;
                      opt_q.use_winograd23_convolution = false;
                      opt_q.use_winograd43_convolution = false;
                      opt_q.use_winograd63_convolution = false;
                      opt_q.use_a53_a55_optimized_kernel = false;
                      opt_q.use_fp16_uniform = false;
                      Mat::create((Mat *)&opt_q,iVar78,4,local_4e8->workspace_allocator);
                      if ((opt_q._0_8_ == 0) || ((long)(int)opt_q._56_4_ * local_208 == 0)) {
                        piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                  opt_q.blob_allocator._0_4_);
                        if (piVar77 != (int *)0x0) {
                          LOCK();
                          *piVar77 = *piVar77 + -1;
                          UNLOCK();
                          if (*piVar77 == 0) {
                            if (opt_q._32_8_ == 0) {
LAB_00209349:
                              free((void *)opt_q._0_8_);
                            }
                            else {
                              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                            }
                          }
                        }
                      }
                      else {
                        auVar130._0_4_ = 0;
                        if (iVar92 < 1) {
                          iVar92 = 0;
                        }
                        for (; iVar92 != auVar130._0_4_; auVar130._0_4_ = auVar130._0_4_ + 1) {
                          iVar74 = (auVar130._0_4_ / iVar98) * iVar53;
                          iVar93 = (int)((long)auVar130._0_4_ % (long)iVar98) * iVar80;
                          iVar78 = (int)local_328 - iVar74;
                          if (iVar53 < iVar78) {
                            iVar78 = iVar53;
                          }
                          iVar122 = (int)local_330 - iVar93;
                          if (iVar80 < iVar122) {
                            iVar122 = iVar80;
                          }
                          conv3x3s1_winograd43_transform_input_tile_int8
                                    (&local_488,(Mat *)&opt_q,iVar74,iVar78,iVar93,iVar122,
                                     in_stack_fffffffffffffa48);
                          m.cstep = (long)local_378.h * (long)local_378.w;
                          m.data = (void *)((long)local_378.data +
                                           ((long)auVar130._0_4_ % (long)iVar98 & 0xffffffffU) *
                                           local_378.elemsize * m.cstep +
                                           (long)(auVar130._0_4_ / iVar98) * local_378.cstep *
                                           local_378.elemsize);
                          m.refcount._0_4_ = 0;
                          m.refcount._4_4_ = 0;
                          m.elemsize = local_378.elemsize;
                          m.elempack = local_378.elempack;
                          m.allocator = local_378.allocator;
                          m.dims = 2;
                          m.w = local_378.w;
                          m.h = local_378.h;
                          m.d = 1;
                          m.c = 1;
                          transpose_pack_B_tile_int8
                                    ((Mat *)&opt_q,&m,0x24,iVar78,iVar122,(int)m.cstep);
                        }
                        piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                  opt_q.blob_allocator._0_4_);
                        if (piVar77 != (int *)0x0) {
                          LOCK();
                          *piVar77 = *piVar77 + -1;
                          UNLOCK();
                          if (*piVar77 == 0) {
                            if (opt_q._32_8_ == 0) {
LAB_00209395:
                              free((void *)opt_q._0_8_);
                            }
                            else {
                              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                            }
                          }
                        }
LAB_0020939d:
                        m.cstep = 0;
                        m.data = (void *)0x0;
                        m.refcount._0_4_ = 0;
                        m.refcount._4_4_ = 0;
                        m.elemsize = 0;
                        m.elempack = 0;
                        m.allocator = (Allocator *)0x0;
                        m.dims = 0;
                        m.w = 0;
                        m.h = 0;
                        m.d = 0;
                        m.c = 0;
                        Mat::create(&m,TILE_N * TILE_M * 0x24,1,iVar52,4,
                                    local_4e8->workspace_allocator);
                        local_438 = 0xffffffffffffff9c;
                        if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                          local_438 = 0;
                          if (iVar119 < 1) {
                            iVar119 = 0;
                          }
                          for (local_41c = 0; auVar130._0_4_ = TILE_M, local_41c != iVar119;
                              local_41c = local_41c + 1) {
                            iVar52 = get_omp_thread_num();
                            m_1.data = (void *)((long)iVar52 * m.cstep * m.elemsize + (long)m.data);
                            m_1.refcount = (int *)0x0;
                            m_1.elemsize = m.elemsize;
                            m_1.elempack = m.elempack;
                            m_1.allocator = m.allocator;
                            m_1.w = m.w;
                            m_1.h = m.h;
                            m_1.d = 1;
                            m_1.c = m.d;
                            m_1.dims = m.dims + -1;
                            m_1.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf &
                                        0xfffffffffffffff0) / m.elemsize;
                            if (m.dims == 4) {
                              m_1.cstep = (long)m.h * (long)m.w;
                            }
                            auVar130._4_4_ = auVar130._0_4_ * local_41c;
                            local_518 = (ulong)auVar130._4_4_;
                            iVar52 = iVar107 - auVar130._4_4_;
                            if (auVar130._0_4_ < (int)(iVar107 - auVar130._4_4_)) {
                              iVar52 = auVar130._0_4_;
                            }
                            local_4e0 = (ulong)(int)auVar130._4_4_;
                            local_430 = (undefined1 (*) [16])CONCAT44(local_430._4_4_,iVar52);
                            local_500 = (ulong)iVar52;
                            for (auVar130._0_4_ = 0; iVar80 = TILE_K, iVar53 = TILE_M,
                                iVar52 = TILE_N, auVar130._4_4_ = (int)local_328 - auVar130._0_4_,
                                auVar130._4_4_ != 0 && auVar130._0_4_ <= (int)local_328;
                                auVar130._0_4_ = auVar130._0_4_ + TILE_N) {
                              if (TILE_N < (int)auVar130._4_4_) {
                                auVar130._4_4_ = TILE_N;
                              }
                              local_498 = (ulong)auVar130._4_4_;
                              iVar78 = (int)local_330;
                              uVar61 = local_330 & 0xffffffff;
                              iVar92 = 0;
                              while( true ) {
                                iVar74 = (int)uVar61;
                                iVar98 = (int)local_498;
                                if (iVar78 <= iVar92) break;
                                iVar93 = iVar74;
                                if (iVar80 < iVar74) {
                                  iVar93 = iVar80;
                                }
                                opt_q._44_4_ = (this->weight_winograd43_data).w;
                                opt_q.flush_denormals = (this->weight_winograd43_data).h;
                                sVar18 = (this->weight_winograd43_data).elemsize;
                                opt_q.openmp_blocktime = (this->weight_winograd43_data).elempack;
                                opt_q._32_8_ = (this->weight_winograd43_data).allocator;
                                local_208 = (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_;
                                opt_q._0_8_ = (long)(this->weight_winograd43_data).data +
                                              sVar18 * local_208 * (long)(iVar92 / iVar80) +
                                              (long)(int)((long)((ulong)(uint)((int)local_518 >>
                                                                              0x1f) << 0x20 |
                                                                local_518 & 0xffffffff) /
                                                         (long)iVar53) *
                                              (this->weight_winograd43_data).cstep * sVar18;
                                opt_q.blob_allocator._0_4_ = 0;
                                opt_q.blob_allocator._4_4_ = 0;
                                opt_q.workspace_allocator._0_4_ = (undefined4)sVar18;
                                opt_q.workspace_allocator._4_4_ = (int)(sVar18 >> 0x20);
                                local_290.dims = 2;
                                opt_q.use_local_pool_allocator = true;
                                opt_q.use_shader_local_memory = false;
                                opt_q.use_cooperative_matrix = false;
                                opt_q.use_winograd23_convolution = false;
                                opt_q.use_winograd43_convolution = true;
                                opt_q.use_winograd63_convolution = false;
                                opt_q.use_a53_a55_optimized_kernel = false;
                                opt_q.use_fp16_uniform = false;
                                local_290.cstep = (long)local_378.h * (long)local_378.w;
                                local_290.data =
                                     (void *)((long)local_378.data +
                                             local_290.cstep * local_378.elemsize *
                                             (long)(iVar92 / iVar80) +
                                             (long)(auVar130._0_4_ / iVar52) * local_378.cstep *
                                             local_378.elemsize);
                                local_290.refcount = (int *)0x0;
                                local_290.elemsize = local_378.elemsize;
                                local_290.elempack = local_378.elempack;
                                local_290.allocator = local_378.allocator;
                                local_290.w = local_378.w;
                                local_290.h = local_378.h;
                                local_290.d = 1;
                                local_290.c = 1;
                                opt_q.vulkan_device_index = local_290.dims;
                                gemm_transB_packed_tile_int8
                                          ((Mat *)&opt_q,&local_290,&m_1,0x24,(int)local_430,iVar98,
                                           iVar92,iVar93,iVar78 <= iVar92 + iVar80);
                                uVar61 = (ulong)(uint)-(iVar80 - iVar74);
                                iVar92 = iVar92 + iVar80;
                              }
                              iVar52 = (int)local_418.cstep * local_418.elempack;
                              iVar53 = (local_418.w + 3) / 4;
                              local_520 = CONCAT44(local_520._4_4_,iVar53);
                              local_4a0 = (undefined1 (*) [16])
                                          CONCAT44(local_4a0._4_4_,iVar98 * 0x24);
                              local_4f8 = (ulong)(iVar98 * 4);
                              local_4c0 = (ulong)(iVar98 * 8);
                              lVar69 = (long)iVar52;
                              lVar59 = (long)(iVar52 * 2);
                              lVar60 = (long)(iVar52 * 3);
                              iVar52 = 0;
                              uVar61 = 0;
                              if (0 < iVar98) {
                                uVar61 = local_498 & 0xffffffff;
                              }
                              local_4f0 = (long)(iVar98 * 0x14) * 4;
                              local_508 = CONCAT44(local_508._4_4_,iVar98 * 0x90);
                              local_4d0 = (int *)(local_4c0 * 4);
                              local_490 = (void *)(local_4f8 * 4);
                              for (uVar71 = 0; (long)(uVar71 | 3) < (long)local_500;
                                  uVar71 = uVar71 + 4) {
                                lVar62 = (long)iVar52;
                                lVar113 = local_4f0 + lVar62 * 4;
                                lVar66 = (long)(iVar98 << 4) * 4 + lVar62 * 4;
                                lVar75 = (long)(iVar98 * 0xc) * 4 + lVar62 * 4;
                                lVar65 = 0;
                                for (uVar90 = 0; uVar90 != uVar61; uVar90 = uVar90 + 1) {
                                  lVar70 = (long)m_1.data + lVar65;
                                  for (lVar63 = -0x50; lVar63 != 0; lVar63 = lVar63 + 0x10) {
                                    auVar137 = *(undefined1 (*) [16])
                                                ((long)local_490 + lVar70 + lVar62 * 4);
                                    auVar154 = *(undefined1 (*) [16])
                                                ((long)local_4d0 + lVar70 + lVar62 * 4);
                                    auVar174 = *(undefined1 (*) [16])(lVar70 + lVar75);
                                    auVar158 = *(undefined1 (*) [16])(lVar70 + lVar66);
                                    auVar147 = vpaddd_avx(auVar154,auVar137);
                                    auVar141 = vpaddd_avx(auVar158,auVar174);
                                    auVar186 = vpsubd_avx(auVar137,auVar154);
                                    auVar137 = vpaddd_avx(auVar147,*(undefined1 (*) [16])
                                                                    (lVar70 + lVar62 * 4));
                                    auVar158 = vpsubd_avx(auVar174,auVar158);
                                    auVar137 = vpaddd_avx(auVar137,auVar141);
                                    auVar154 = vpaddd_avx(auVar158,auVar158);
                                    auVar154 = vpaddd_avx(auVar154,auVar186);
                                    auVar174 = vpslld_avx(auVar141,2);
                                    auVar174 = vpaddd_avx(auVar174,auVar147);
                                    auVar147 = vpslld_avx(auVar158,3);
                                    auVar158 = vpslld_avx(*(undefined1 (*) [16])(lVar70 + lVar113),2
                                                         );
                                    auVar158 = vpaddd_avx(auVar186,auVar158);
                                    auVar158 = vpaddd_avx(auVar147,auVar158);
                                    *(undefined1 (*) [16])(local_1f8 + lVar63) = auVar137;
                                    *(undefined1 (*) [16])(local_198[0] + lVar63) = auVar154;
                                    *(undefined1 (*) [16])(local_138[0] + lVar63) = auVar174;
                                    *(undefined1 (*) [16])(local_d8 + lVar63) = auVar158;
                                    lVar70 = lVar70 + (long)(iVar98 * 0x18) * 4;
                                  }
                                  local_4b8._0_8_ = uVar90;
                                  iVar92 = auVar130._0_4_ + (int)uVar90;
                                  auVar137 = *(undefined1 (*) [16])(lVar70 + lVar75);
                                  auVar154 = *(undefined1 (*) [16])(lVar70 + lVar66);
                                  auVar174 = *(undefined1 (*) [16])
                                              ((long)local_490 + lVar70 + lVar62 * 4);
                                  auVar158 = *(undefined1 (*) [16])
                                              ((long)local_4d0 + lVar70 + lVar62 * 4);
                                  auVar147 = vpaddd_avx(auVar154,auVar137);
                                  auVar141 = vpaddd_avx(auVar158,auVar174);
                                  auVar186 = vpaddd_avx(auVar141,auVar147);
                                  auVar186 = vpaddd_avx(auVar186,*(undefined1 (*) [16])
                                                                  (lVar70 + lVar62 * 4));
                                  iVar80 = iVar92 % iVar53;
                                  auVar154 = vpsubd_avx(auVar137,auVar154);
                                  auVar140 = vpslld_avx(auVar154,5);
                                  auVar137 = vpsubd_avx(auVar174,auVar158);
                                  auVar174 = vpslld_avx(auVar137,2);
                                  auVar137 = vpaddd_avx(auVar174,auVar140);
                                  auVar158 = vpslld_avx(*(undefined1 (*) [16])(lVar70 + lVar113),4);
                                  local_d8 = vpaddd_avx(auVar137,auVar158);
                                  auVar137 = vpslld_avx(auVar147,4);
                                  auVar158 = vpslld_avx(auVar141,2);
                                  local_138[0] = vpaddd_avx(auVar158,auVar137);
                                  auVar137 = vpslld_avx(auVar154,3);
                                  local_198[0] = vpaddd_avx(auVar174,auVar137);
                                  local_1f8 = vpslld_avx(auVar186,2);
                                  auVar130._4_4_ = iVar92 / iVar53 << 2;
                                  pauVar64 = (undefined1 (*) [16])
                                             ((long)local_418.data +
                                             (long)(iVar80 * 4 * local_418.elempack) * 4 +
                                             (long)local_418.w * local_418.elemsize *
                                             (long)(int)auVar130._4_4_ +
                                             (long)(((int)local_518 + (int)uVar71) /
                                                   local_418.elempack) * local_418.cstep *
                                             local_418.elemsize);
                                  iVar92 = iVar80 * 4 + 1;
                                  iVar78 = iVar80 * 4 + 2;
                                  iVar80 = iVar80 * 4 + 3;
                                  pauVar82 = &local_1f8;
                                  for (lVar63 = 0; lVar63 != 4; lVar63 = lVar63 + 1) {
                                    if ((int)(auVar130._4_4_ | (uint)lVar63) < local_418.h) {
                                      auVar137 = vpaddd_avx(pauVar82[-3],pauVar82[-4]);
                                      auVar154 = vpaddd_avx(pauVar82[-1],pauVar82[-2]);
                                      auVar147 = vpsubd_avx(pauVar82[-4],pauVar82[-3]);
                                      auVar141 = vpsubd_avx(pauVar82[-2],pauVar82[-1]);
                                      auVar174 = vpaddd_avx(auVar137,pauVar82[-5]);
                                      auVar174 = vpaddd_avx(auVar174,auVar154);
                                      auVar158 = vpaddd_avx(auVar141,auVar141);
                                      auVar158 = vpaddd_avx(auVar158,auVar147);
                                      auVar154 = vpslld_avx(auVar154,2);
                                      auVar154 = vpaddd_avx(auVar154,auVar137);
                                      auVar141 = vpslld_avx(auVar141,3);
                                      auVar137 = vpaddd_avx(auVar147,*pauVar82);
                                      auVar147 = vpaddd_avx(auVar137,auVar141);
                                      auVar137 = vcvtdq2ps_avx(auVar174);
                                      auVar155._0_4_ = (int)(auVar137._0_4_ * 0.0017361111);
                                      auVar155._4_4_ = (int)(auVar137._4_4_ * 0.0017361111);
                                      auVar155._8_4_ = (int)(auVar137._8_4_ * 0.0017361111);
                                      auVar155._12_4_ = (int)(auVar137._12_4_ * 0.0017361111);
                                      auVar137 = vcvtdq2ps_avx(auVar158);
                                      auVar148._0_4_ = (int)(auVar137._0_4_ * 0.0017361111);
                                      auVar148._4_4_ = (int)(auVar137._4_4_ * 0.0017361111);
                                      auVar148._8_4_ = (int)(auVar137._8_4_ * 0.0017361111);
                                      auVar148._12_4_ = (int)(auVar137._12_4_ * 0.0017361111);
                                      auVar137 = vcvtdq2ps_avx(auVar154);
                                      auVar142._0_4_ = (int)(auVar137._0_4_ * 0.0017361111);
                                      auVar142._4_4_ = (int)(auVar137._4_4_ * 0.0017361111);
                                      auVar142._8_4_ = (int)(auVar137._8_4_ * 0.0017361111);
                                      auVar142._12_4_ = (int)(auVar137._12_4_ * 0.0017361111);
                                      auVar137 = vcvtdq2ps_avx(auVar147);
                                      auVar132._0_4_ = (int)(auVar137._0_4_ * 0.0017361111);
                                      auVar132._4_4_ = (int)(auVar137._4_4_ * 0.0017361111);
                                      auVar132._8_4_ = (int)(auVar137._8_4_ * 0.0017361111);
                                      auVar132._12_4_ = (int)(auVar137._12_4_ * 0.0017361111);
                                      if (local_418.elempack == 1) {
                                        *(int *)*pauVar64 = auVar155._0_4_;
                                        *(int *)(*pauVar64 + lVar69 * 4) = auVar155._4_4_;
                                        *(int *)(*pauVar64 + lVar59 * 4) = auVar155._8_4_;
                                        *(int *)(*pauVar64 + lVar60 * 4) = auVar155._12_4_;
                                        if (iVar92 < local_418.w) {
                                          *(int *)(*pauVar64 + 4) = auVar148._0_4_;
                                          *(int *)(*pauVar64 + lVar69 * 4 + 4) = auVar148._4_4_;
                                          *(int *)(*pauVar64 + lVar59 * 4 + 4) = auVar148._8_4_;
                                          *(int *)(*pauVar64 + lVar60 * 4 + 4) = auVar148._12_4_;
                                        }
                                        if (iVar78 < local_418.w) {
                                          *(int *)(*pauVar64 + 8) = auVar142._0_4_;
                                          *(int *)(*pauVar64 + lVar69 * 4 + 8) = auVar142._4_4_;
                                          *(int *)(*pauVar64 + lVar59 * 4 + 8) = auVar142._8_4_;
                                          *(int *)(*pauVar64 + lVar60 * 4 + 8) = auVar142._12_4_;
                                        }
                                        if (iVar80 < local_418.w) {
                                          *(int *)(*pauVar64 + 0xc) = auVar132._0_4_;
                                          *(int *)(*pauVar64 + lVar69 * 4 + 0xc) = auVar132._4_4_;
                                          *(int *)(*pauVar64 + lVar59 * 4 + 0xc) = auVar132._8_4_;
                                          *(int *)(*pauVar64 + lVar60 * 4 + 0xc) = auVar132._12_4_;
                                        }
                                      }
                                      else if (local_418.elempack == 4) {
                                        *pauVar64 = auVar155;
                                        if (iVar92 < local_418.w) {
                                          pauVar64[1] = auVar148;
                                        }
                                        if (iVar78 < local_418.w) {
                                          pauVar64[2] = auVar142;
                                        }
                                        if (iVar80 < local_418.w) {
                                          pauVar64[3] = auVar132;
                                        }
                                      }
                                      pauVar64 = (undefined1 (*) [16])
                                                 (*pauVar64 +
                                                 (long)(local_418.elempack * local_418.w) * 4);
                                    }
                                    pauVar82 = pauVar82 + 6;
                                  }
                                  lVar65 = lVar65 + 0x10;
                                }
                                iVar52 = iVar52 + iVar98 * 0x90;
                              }
                              lVar113 = (long)(iVar98 * 2);
                              lVar59 = (long)(iVar98 * 6);
                              lVar60 = (long)(iVar98 * 10);
                              local_4c8 = CONCAT44(local_4c8._4_4_,iVar98 * 0x48);
                              for (; (long)(uVar71 | 1) < (long)local_500; uVar71 = uVar71 + 2) {
                                local_428 = (undefined1 (*) [16])local_418.elemsize;
                                local_490 = (void *)((local_4e0 + uVar71) * local_418.cstep *
                                                     local_418.elemsize + (long)local_418.data);
                                uVar90 = 0;
                                piVar77 = (int *)((long)iVar52 * 4 + (long)m_1.data);
                                while (piVar58 = piVar77, uVar86 = uVar90, uVar86 != uVar61) {
                                  piVar77 = piVar58;
                                  for (lVar66 = -5; lVar66 != 0; lVar66 = lVar66 + 1) {
                                    iVar80 = piVar77[local_4f8] + piVar77[lVar113];
                                    iVar92 = piVar77[local_4f8 + 1] + piVar77[lVar113 + 1];
                                    iVar81 = piVar77[lVar113] - piVar77[local_4f8];
                                    iVar67 = piVar77[lVar113 + 1] - piVar77[local_4f8 + 1];
                                    iVar78 = piVar77[local_4c0] + piVar77[lVar59];
                                    iVar94 = piVar77[lVar59] - piVar77[local_4c0];
                                    iVar74 = piVar77[local_4c0 + 1] + piVar77[lVar59 + 1];
                                    iVar87 = piVar77[lVar59 + 1] - piVar77[local_4c0 + 1];
                                    iVar93 = piVar77[lVar60];
                                    iVar122 = piVar77[lVar60 + 1];
                                    iVar99 = piVar77[1];
                                    (&opt_q.vulkan_device_index)[lVar66 * 2] =
                                         iVar78 + iVar80 + *piVar77;
                                    *(int *)(&opt_q.use_reserved_1 + lVar66 * 8) =
                                         iVar74 + iVar92 + iVar99;
                                    *(int *)(local_1f8 + lVar66 * 8 + 8) = iVar81 + iVar94 * 2;
                                    aiStack_1e8[lVar66 * 2 + -1] = iVar67 + iVar87 * 2;
                                    local_1c0[lVar66 * 2] = iVar80 + iVar78 * 4;
                                    local_1c0[lVar66 * 2 + 1] = iVar92 + iVar74 * 4;
                                    *(int *)(local_198[0] + lVar66 * 8 + 8) =
                                         iVar81 + iVar94 * 8 + iVar93 * 4;
                                    *(int *)(local_198[0] + lVar66 * 8 + 0xc) =
                                         iVar67 + iVar87 * 8 + iVar122 * 4;
                                    piVar77 = piVar77 + iVar98 * 0xc;
                                  }
                                  iVar99 = piVar77[lVar59 + 1] - piVar77[local_4c0 + 1];
                                  iVar74 = piVar77[lVar113 + 1] - piVar77[local_4f8 + 1];
                                  iVar87 = piVar77[lVar59] - piVar77[local_4c0];
                                  iVar81 = piVar77[lVar113] - piVar77[local_4f8];
                                  iVar67 = piVar77[lVar59 + 1] + piVar77[local_4c0 + 1];
                                  iVar78 = piVar77[local_4f8 + 1] + piVar77[lVar113 + 1];
                                  iVar93 = piVar77[local_4c0] + piVar77[lVar59];
                                  iVar122 = piVar77[local_4f8] + piVar77[lVar113];
                                  iVar92 = auVar130._0_4_ + (int)uVar86;
                                  iVar80 = iVar92 % iVar53;
                                  opt_q.vulkan_device_index = (iVar122 + iVar93 + *piVar77) * 4;
                                  opt_q._44_4_ = (iVar78 + iVar67 + piVar77[1]) * 4;
                                  local_1f8._8_4_ = iVar87 * 8 + iVar81 * 4;
                                  local_1f8._12_4_ = iVar99 * 8 + iVar74 * 4;
                                  local_1c0[0] = iVar93 * 0x10 + iVar122 * 4;
                                  local_1c0[1] = iVar67 * 0x10 + iVar78 * 4;
                                  local_198[0]._8_4_ =
                                       piVar77[lVar60] * 0x10 + iVar87 * 0x20 + iVar81 * 4;
                                  local_198[0]._12_4_ =
                                       piVar77[lVar60 + 1] * 0x10 + iVar99 * 0x20 + iVar74 * 4;
                                  auVar130._4_4_ = iVar92 / iVar53 << 2;
                                  piVar77 = (int *)((long)local_490 +
                                                   (long)(iVar80 * 4) * 4 +
                                                   (long)local_418.w * local_418.elemsize *
                                                   (long)(int)auVar130._4_4_);
                                  iVar92 = iVar80 * 4 + 3;
                                  local_4f0 = CONCAT44(local_4f0._4_4_,iVar92);
                                  pbVar72 = &opt_q.use_reserved_1;
                                  local_4b8._0_4_ = auVar130._4_4_;
                                  for (lVar66 = 0; lVar66 != 4; lVar66 = lVar66 + 1) {
                                    if ((int)(auVar130._4_4_ | (uint)lVar66) < local_418.h) {
                                      iVar78 = *(int *)(pbVar72 + -0x1c) + *(int *)(pbVar72 + -0x24)
                                      ;
                                      iVar74 = *(int *)(pbVar72 + -0x18) + *(int *)(pbVar72 + -0x20)
                                      ;
                                      iVar93 = *(int *)(pbVar72 + -0xc) + *(int *)(pbVar72 + -0x14);
                                      iVar110 = *(int *)(pbVar72 + -0x24) -
                                                *(int *)(pbVar72 + -0x1c);
                                      iVar122 = *(int *)(pbVar72 + -8) + *(int *)(pbVar72 + -0x10);
                                      iVar94 = *(int *)(pbVar72 + -0x20) - *(int *)(pbVar72 + -0x18)
                                      ;
                                      iVar87 = *(int *)(pbVar72 + -0x14) - *(int *)(pbVar72 + -0xc);
                                      iVar99 = *(int *)(pbVar72 + -0x28);
                                      iVar115 = *(int *)(pbVar72 + -0x10) - *(int *)(pbVar72 + -8);
                                      iVar67 = *(int *)(pbVar72 + -4);
                                      iVar81 = *(int *)pbVar72;
                                      *piVar77 = (iVar93 + iVar78 + *(int *)(pbVar72 + -0x2c)) /
                                                 0x240;
                                      piVar77[lVar69] = (iVar122 + iVar74 + iVar99) / 0x240;
                                      if (iVar80 * 4 + 1 < local_418.w) {
                                        piVar77[1] = (iVar110 + iVar87 * 2) / 0x240;
                                        piVar77[lVar69 + 1] = (iVar94 + iVar115 * 2) / 0x240;
                                      }
                                      if (iVar80 * 4 + 2 < local_418.w) {
                                        piVar77[2] = (iVar78 + iVar93 * 4) / 0x240;
                                        piVar77[lVar69 + 2] = (iVar74 + iVar122 * 4) / 0x240;
                                      }
                                      if (iVar92 < local_418.w) {
                                        piVar77[3] = (iVar110 + iVar87 * 8 + iVar67) / 0x240;
                                        piVar77[lVar69 + 3] =
                                             (iVar94 + iVar115 * 8 + iVar81) / 0x240;
                                      }
                                      piVar77 = piVar77 + local_418.w;
                                    }
                                    pbVar72 = pbVar72 + 0x30;
                                  }
                                  piVar77 = piVar58 + 2;
                                  local_508 = uVar86;
                                  local_4d0 = piVar58;
                                  uVar90 = uVar86 + 1;
                                }
                                iVar52 = iVar52 + iVar98 * 0x48;
                              }
                              lVar60 = (long)iVar98;
                              local_4b8._0_8_ = lVar60;
                              for (; (long)uVar71 < (long)local_500; uVar71 = uVar71 + 1) {
                                piVar77 = (int *)((long)iVar52 * 4 + (long)m_1.data);
                                for (uVar90 = 0; uVar90 != uVar61; uVar90 = uVar90 + 1) {
                                  piVar58 = piVar77;
                                  for (lVar69 = -5; lVar69 != 0; lVar69 = lVar69 + 1) {
                                    iVar80 = piVar58[lVar113] + piVar58[lVar60];
                                    iVar92 = piVar58[local_4f8] + piVar58[iVar98 * 3];
                                    iVar74 = piVar58[lVar60] - piVar58[lVar113];
                                    iVar93 = piVar58[iVar98 * 3] - piVar58[local_4f8];
                                    iVar78 = piVar58[iVar98 * 5];
                                    *(int *)((long)&opt_q.workspace_allocator + lVar69 * 4 + 4) =
                                         iVar92 + iVar80 + *piVar58;
                                    *(int *)(&opt_q.use_reserved_1 + lVar69 * 4) =
                                         iVar74 + iVar93 * 2;
                                    aiStack_200[lVar69 + -1] = iVar80 + iVar92 * 4;
                                    aiStack_1e8[lVar69 + -1] = iVar74 + iVar93 * 8 + iVar78 * 4;
                                    piVar58 = piVar58 + lVar59;
                                  }
                                  iVar74 = piVar58[iVar98 * 3] - piVar58[local_4f8];
                                  iVar122 = piVar58[lVar60] - piVar58[lVar113];
                                  iVar92 = piVar58[iVar98 * 3] + piVar58[local_4f8];
                                  iVar93 = piVar58[lVar113] + piVar58[lVar60];
                                  iVar78 = auVar130._0_4_ + (int)uVar90;
                                  iVar80 = iVar78 % iVar53;
                                  opt_q.workspace_allocator._4_4_ = (iVar93 + iVar92 + *piVar58) * 4
                                  ;
                                  opt_q._44_4_ = iVar74 * 8 + iVar122 * 4;
                                  local_208 = CONCAT44(iVar92 * 0x10 + iVar93 * 4,
                                                       (undefined4)local_208);
                                  local_1f8._12_4_ =
                                       piVar58[iVar98 * 5] * 0x10 + iVar74 * 0x20 + iVar122 * 4;
                                  auVar130._4_4_ = iVar78 / iVar53 << 2;
                                  piVar58 = (int *)((long)local_418.data +
                                                   (long)(iVar80 * 4) * 4 +
                                                   (long)local_418.w * local_418.elemsize *
                                                   (long)(int)auVar130._4_4_ +
                                                   (local_4e0 + uVar71) * local_418.cstep *
                                                   local_418.elemsize);
                                  piVar106 = (int *)((long)&opt_q.workspace_allocator + 4);
                                  for (lVar69 = 0; lVar69 != 4; lVar69 = lVar69 + 1) {
                                    if ((int)(auVar130._4_4_ | (uint)lVar69) < local_418.h) {
                                      iVar92 = piVar106[-3] + piVar106[-4];
                                      iVar78 = piVar106[-1] + piVar106[-2];
                                      iVar122 = piVar106[-4] - piVar106[-3];
                                      iVar93 = piVar106[-2] - piVar106[-1];
                                      iVar74 = *piVar106;
                                      *piVar58 = (iVar78 + iVar92 + piVar106[-5]) / 0x240;
                                      if (iVar80 * 4 + 1 < local_418.w) {
                                        piVar58[1] = (iVar122 + iVar93 * 2) / 0x240;
                                      }
                                      if (iVar80 * 4 + 2 < local_418.w) {
                                        piVar58[2] = (iVar92 + iVar78 * 4) / 0x240;
                                      }
                                      if (iVar80 * 4 + 3 < local_418.w) {
                                        piVar58[3] = (iVar122 + iVar93 * 8 + iVar74) / 0x240;
                                      }
                                      piVar58 = piVar58 + local_418.w;
                                    }
                                    piVar106 = piVar106 + 6;
                                  }
                                  piVar77 = piVar77 + 1;
                                }
                                iVar52 = iVar52 + iVar98 * 0x24;
                              }
                            }
                            if (m_1.refcount != (int *)0x0) {
                              LOCK();
                              *m_1.refcount = *m_1.refcount + -1;
                              UNLOCK();
                              if (*m_1.refcount == 0) {
                                if (m_1.allocator == (Allocator *)0x0) {
                                  free(m_1.data);
                                }
                                else {
                                  (*(m_1.allocator)->_vptr_Allocator[3])();
                                }
                              }
                            }
                          }
                        }
                        piVar77 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                        if (piVar77 != (int *)0x0) {
                          LOCK();
                          *piVar77 = *piVar77 + -1;
                          UNLOCK();
                          if (*piVar77 == 0) {
                            if (m.allocator == (Allocator *)0x0) {
                              free(m.data);
                            }
                            else {
                              (*(m.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        auVar130._0_4_ = (int)local_438;
                      }
                    }
                  }
                  piVar77 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
                  if (piVar77 != (int *)0x0) {
                    LOCK();
                    *piVar77 = *piVar77 + -1;
                    UNLOCK();
                    if (*piVar77 == 0) {
                      pvVar105 = local_378.data;
                      if (local_378.allocator == (Allocator *)0x0) goto LAB_00207948;
                      (*(local_378.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                else {
                  auVar130._0_4_ =
                       conv3x3s1_winograd43_int8_xop(&local_488,&local_418,pMVar1,iVar52,local_4e8);
                }
              }
              else {
                auVar130._0_4_ =
                     conv3x3s1_winograd43_int8_avx2(&local_488,&local_418,pMVar1,iVar52,local_4e8);
              }
            }
            else {
              auVar130._0_4_ =
                   conv3x3s1_winograd43_int8_avxvnni(&local_488,&local_418,pMVar1,iVar52,local_4e8);
            }
          }
          else {
            iVar53 = cpu_support_x86_avx_vnni();
            pMVar1 = &this->weight_winograd23_data;
            if (iVar53 == 0) {
              iVar53 = cpu_support_x86_avx2();
              if (iVar53 == 0) {
                iVar53 = cpu_support_x86_xop();
                if (iVar53 == 0) {
                  auVar128._4_4_ = local_418.h;
                  auVar128._0_4_ = local_418.w;
                  auVar130 = vpcmpeqd_avx(auVar130,auVar130);
                  auVar128._8_8_ = 0;
                  auVar130 = vpsubd_avx(auVar128,auVar130);
                  auVar137 = vpsrld_avx(auVar130,0x1f);
                  auVar130 = vpaddd_avx(auVar130,auVar137);
                  auVar130 = vpsrad_avx(auVar130,1);
                  uVar120 = local_418.elempack * local_418.c;
                  uVar90 = (ulong)uVar120;
                  uVar121 = auVar130._4_4_ * auVar130._0_4_;
                  uVar71 = (ulong)uVar121;
                  auVar130._4_4_ = local_488.elempack * local_488.c;
                  uVar61 = (ulong)auVar130._4_4_;
                  get_optimal_tile_mnk_int8
                            (uVar120,uVar121,auVar130._4_4_,&TILE_M,&TILE_N,&TILE_K,iVar52);
                  iVar80 = TILE_K;
                  iVar53 = TILE_N;
                  local_518 = CONCAT44(local_518._4_4_,(int)(uVar120 + TILE_M + -1) / TILE_M);
                  iVar119 = (int)(uVar121 + TILE_N + -1) / TILE_N;
                  iVar78 = (int)(TILE_K + auVar130._4_4_ + -1) / TILE_K;
                  local_378.cstep = 0;
                  iVar92 = TILE_K * TILE_N;
                  local_378.data = (void *)0x0;
                  local_378.refcount._0_4_ = 0;
                  local_378.refcount._4_4_ = 0;
                  local_378.elemsize = 0;
                  local_378.elempack = 0;
                  local_378.allocator = (Allocator *)0x0;
                  local_378.dims = 0;
                  local_378.w = 0;
                  local_378.h = 0;
                  local_378.d = 0;
                  local_378.c = 0;
                  Mat::create(&local_378,iVar92,0x10,iVar78,iVar119,2,local_4e8->workspace_allocator
                             );
                  auVar130._0_4_ = -100;
                  local_4e0 = uVar90;
                  local_4c0 = uVar61;
                  if ((local_378.data != (void *)0x0) && ((long)local_378.c * local_378.cstep != 0))
                  {
                    iVar119 = iVar119 * iVar78;
                    iVar92 = iVar92 * 0x10;
                    if ((iVar52 < 2) || (iVar52 <= iVar119)) {
                      local_208 = 0;
                      opt_q.lightmode = false;
                      opt_q.use_shader_pack8 = false;
                      opt_q.use_subgroup_ops = false;
                      opt_q.use_reserved_0 = false;
                      opt_q.num_threads = 0;
                      opt_q.blob_allocator._0_4_ = 0;
                      opt_q.blob_allocator._4_4_ = 0;
                      opt_q.workspace_allocator._0_4_ = 0;
                      opt_q.workspace_allocator._4_4_ = 0;
                      opt_q.openmp_blocktime = 0;
                      opt_q.use_bf16_storage = false;
                      opt_q.use_fp16_packed = false;
                      opt_q.use_fp16_storage = false;
                      opt_q.use_fp16_arithmetic = false;
                      opt_q.use_int8_packed = false;
                      opt_q.use_int8_storage = false;
                      opt_q.use_int8_arithmetic = false;
                      opt_q.use_packing_layout = false;
                      opt_q.vulkan_device_index = 0;
                      opt_q.use_reserved_1 = false;
                      opt_q.use_image_storage = false;
                      opt_q.use_tensor_storage = false;
                      opt_q.use_reserved_2 = false;
                      opt_q.flush_denormals = 0;
                      opt_q.use_local_pool_allocator = false;
                      opt_q.use_shader_local_memory = false;
                      opt_q.use_cooperative_matrix = false;
                      opt_q.use_winograd23_convolution = false;
                      opt_q.use_winograd43_convolution = false;
                      opt_q.use_winograd63_convolution = false;
                      opt_q.use_a53_a55_optimized_kernel = false;
                      opt_q.use_fp16_uniform = false;
                      Mat::create((Mat *)&opt_q,iVar92,1,iVar52,2,local_4e8->workspace_allocator);
                      if ((opt_q._0_8_ != 0) && ((long)(int)opt_q._56_4_ * local_208 != 0)) {
                        auVar130._0_4_ = 0;
                        local_500 = uVar71;
                        if (iVar119 < 1) {
                          iVar119 = auVar130._0_4_;
                        }
                        for (; iVar119 != auVar130._0_4_; auVar130._0_4_ = auVar130._0_4_ + 1) {
                          iVar98 = (auVar130._0_4_ / iVar78) * iVar53;
                          iVar107 = (int)((long)auVar130._0_4_ % (long)iVar78) * iVar80;
                          iVar92 = (int)local_500 - iVar98;
                          if (iVar53 < iVar92) {
                            iVar92 = iVar53;
                          }
                          iVar74 = (int)local_4c0 - iVar107;
                          if (iVar80 < iVar74) {
                            iVar74 = iVar80;
                          }
                          iVar93 = get_omp_thread_num();
                          m.elemsize = CONCAT44(opt_q.workspace_allocator._4_4_,
                                                opt_q.workspace_allocator._0_4_);
                          m.data = (void *)((long)iVar93 * local_208 * m.elemsize + opt_q._0_8_);
                          m.refcount._0_4_ = 0;
                          m.refcount._4_4_ = 0;
                          m.elempack = opt_q.openmp_blocktime;
                          m.allocator = (Allocator *)opt_q._32_8_;
                          m.w._0_1_ = opt_q.use_reserved_1;
                          m.w._1_1_ = opt_q.use_image_storage;
                          m.w._2_1_ = opt_q.use_tensor_storage;
                          m.w._3_1_ = opt_q.use_reserved_2;
                          m.h = opt_q.flush_denormals;
                          m.d = 1;
                          m.c._0_1_ = opt_q.use_local_pool_allocator;
                          m.c._1_1_ = opt_q.use_shader_local_memory;
                          m.c._2_1_ = opt_q.use_cooperative_matrix;
                          m.c._3_1_ = opt_q.use_winograd23_convolution;
                          m.dims = opt_q.vulkan_device_index + -1;
                          m.cstep = (m.elemsize *
                                     (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_ + 0xf &
                                    0xfffffffffffffff0) / m.elemsize;
                          if (opt_q.vulkan_device_index == 4) {
                            m.cstep = (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_;
                          }
                          conv3x3s1_winograd23_transform_input_tile_int8
                                    (&local_488,&m,iVar98,iVar92,iVar107,iVar74,
                                     in_stack_fffffffffffffa48);
                          m_1.cstep = (long)local_378.h * (long)local_378.w;
                          m_1.data = (void *)((long)local_378.data +
                                             ((long)auVar130._0_4_ % (long)iVar78 & 0xffffffffU) *
                                             local_378.elemsize * m_1.cstep +
                                             (long)(auVar130._0_4_ / iVar78) * local_378.cstep *
                                             local_378.elemsize);
                          m_1.refcount = (int *)0x0;
                          m_1.elemsize = local_378.elemsize;
                          m_1.elempack = local_378.elempack;
                          m_1.allocator = local_378.allocator;
                          m_1.dims = 2;
                          m_1.w = local_378.w;
                          m_1.h = local_378.h;
                          m_1.d = 1;
                          m_1.c = 1;
                          transpose_pack_B_tile_int8(&m,&m_1,0x10,iVar92,iVar74,(int)m_1.cstep);
                        }
                        piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                  opt_q.blob_allocator._0_4_);
                        if (piVar77 != (int *)0x0) {
                          LOCK();
                          *piVar77 = *piVar77 + -1;
                          UNLOCK();
                          if (*piVar77 == 0) {
                            if (opt_q._32_8_ == 0) goto LAB_002087cc;
                            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                          }
                        }
                        goto LAB_002087d4;
                      }
                      piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                opt_q.blob_allocator._0_4_);
                      if (piVar77 != (int *)0x0) {
                        LOCK();
                        *piVar77 = *piVar77 + -1;
                        UNLOCK();
                        if (*piVar77 == 0) {
                          pvVar105 = (void *)opt_q._0_8_;
                          if (opt_q._32_8_ == 0) goto LAB_00209300;
                          (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                        }
                      }
                    }
                    else {
                      local_208 = 0;
                      opt_q.lightmode = false;
                      opt_q.use_shader_pack8 = false;
                      opt_q.use_subgroup_ops = false;
                      opt_q.use_reserved_0 = false;
                      opt_q.num_threads = 0;
                      opt_q.blob_allocator._0_4_ = 0;
                      opt_q.blob_allocator._4_4_ = 0;
                      opt_q.workspace_allocator._0_4_ = 0;
                      opt_q.workspace_allocator._4_4_ = 0;
                      opt_q.openmp_blocktime = 0;
                      opt_q.use_bf16_storage = false;
                      opt_q.use_fp16_packed = false;
                      opt_q.use_fp16_storage = false;
                      opt_q.use_fp16_arithmetic = false;
                      opt_q.use_int8_packed = false;
                      opt_q.use_int8_storage = false;
                      opt_q.use_int8_arithmetic = false;
                      opt_q.use_packing_layout = false;
                      opt_q.vulkan_device_index = 0;
                      opt_q.use_reserved_1 = false;
                      opt_q.use_image_storage = false;
                      opt_q.use_tensor_storage = false;
                      opt_q.use_reserved_2 = false;
                      opt_q.flush_denormals = 0;
                      opt_q.use_local_pool_allocator = false;
                      opt_q.use_shader_local_memory = false;
                      opt_q.use_cooperative_matrix = false;
                      opt_q.use_winograd23_convolution = false;
                      opt_q.use_winograd43_convolution = false;
                      opt_q.use_winograd63_convolution = false;
                      opt_q.use_a53_a55_optimized_kernel = false;
                      opt_q.use_fp16_uniform = false;
                      Mat::create((Mat *)&opt_q,iVar92,2,local_4e8->workspace_allocator);
                      if ((opt_q._0_8_ == 0) || ((long)(int)opt_q._56_4_ * local_208 == 0)) {
                        piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                  opt_q.blob_allocator._0_4_);
                        local_500 = uVar71;
                        if (piVar77 != (int *)0x0) {
                          LOCK();
                          *piVar77 = *piVar77 + -1;
                          UNLOCK();
                          if (*piVar77 == 0) {
                            pvVar105 = (void *)opt_q._0_8_;
                            if (opt_q._32_8_ == 0) goto LAB_00209300;
                            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                          }
                        }
                      }
                      else {
                        auVar130._0_4_ = 0;
                        local_500 = uVar71;
                        if (iVar119 < 1) {
                          iVar119 = auVar130._0_4_;
                        }
                        for (; iVar119 != auVar130._0_4_; auVar130._0_4_ = auVar130._0_4_ + 1) {
                          iVar98 = (auVar130._0_4_ / iVar78) * iVar53;
                          iVar107 = (int)((long)auVar130._0_4_ % (long)iVar78) * iVar80;
                          iVar92 = (int)local_500 - iVar98;
                          if (iVar53 < iVar92) {
                            iVar92 = iVar53;
                          }
                          iVar74 = (int)local_4c0 - iVar107;
                          if (iVar80 < iVar74) {
                            iVar74 = iVar80;
                          }
                          conv3x3s1_winograd23_transform_input_tile_int8
                                    (&local_488,(Mat *)&opt_q,iVar98,iVar92,iVar107,iVar74,
                                     in_stack_fffffffffffffa48);
                          m.cstep = (long)local_378.h * (long)local_378.w;
                          m.data = (void *)((long)local_378.data +
                                           ((long)auVar130._0_4_ % (long)iVar78 & 0xffffffffU) *
                                           local_378.elemsize * m.cstep +
                                           (long)(auVar130._0_4_ / iVar78) * local_378.cstep *
                                           local_378.elemsize);
                          m.refcount._0_4_ = 0;
                          m.refcount._4_4_ = 0;
                          m.elemsize = local_378.elemsize;
                          m.elempack = local_378.elempack;
                          m.allocator = local_378.allocator;
                          m.dims = 2;
                          m.w = local_378.w;
                          m.h = local_378.h;
                          m.d = 1;
                          m.c = 1;
                          transpose_pack_B_tile_int8
                                    ((Mat *)&opt_q,&m,0x10,iVar92,iVar74,(int)m.cstep);
                        }
                        piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,
                                                  opt_q.blob_allocator._0_4_);
                        if (piVar77 != (int *)0x0) {
                          LOCK();
                          *piVar77 = *piVar77 + -1;
                          UNLOCK();
                          if (*piVar77 == 0) {
                            if (opt_q._32_8_ == 0) {
LAB_002087cc:
                              free((void *)opt_q._0_8_);
                            }
                            else {
                              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                            }
                          }
                        }
LAB_002087d4:
                        m.cstep = 0;
                        m.data = (void *)0x0;
                        m.refcount._0_4_ = 0;
                        m.refcount._4_4_ = 0;
                        m.elemsize = 0;
                        m.elempack = 0;
                        m.allocator = (Allocator *)0x0;
                        m.dims = 0;
                        m.w = 0;
                        m.h = 0;
                        m.d = 0;
                        m.c = 0;
                        Mat::create(&m,TILE_N * TILE_M * 0x10,1,iVar52,4,
                                    local_4e8->workspace_allocator);
                        auVar130._0_4_ = -100;
                        if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                          iVar52 = 0;
                          auVar130._0_4_ = (int)local_518;
                          if ((int)local_518 < 1) {
                            auVar130._0_4_ = 0;
                          }
                          local_518 = CONCAT44(local_518._4_4_,auVar130._0_4_);
                          uVar61 = local_500;
                          for (; auVar130._0_4_ = TILE_M, iVar52 != (int)local_518;
                              iVar52 = iVar52 + 1) {
                            iVar53 = get_omp_thread_num();
                            m_1.data = (void *)((long)iVar53 * m.cstep * m.elemsize + (long)m.data);
                            m_1.refcount = (int *)0x0;
                            m_1.elemsize = m.elemsize;
                            m_1.elempack = m.elempack;
                            m_1.allocator = m.allocator;
                            m_1.w = m.w;
                            m_1.h = m.h;
                            m_1.d = 1;
                            m_1.c = m.d;
                            m_1.dims = m.dims + -1;
                            m_1.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf &
                                        0xfffffffffffffff0) / m.elemsize;
                            if (m.dims == 4) {
                              m_1.cstep = (long)m.h * (long)m.w;
                            }
                            auVar130._4_4_ = auVar130._0_4_ * iVar52;
                            local_520 = (ulong)auVar130._4_4_;
                            iVar53 = (int)local_4e0 - auVar130._4_4_;
                            if (auVar130._0_4_ < iVar53) {
                              iVar53 = auVar130._0_4_;
                            }
                            local_508 = (ulong)(int)auVar130._4_4_;
                            local_428 = (undefined1 (*) [16])CONCAT44(local_428._4_4_,iVar53);
                            lVar59 = (long)iVar53;
                            for (auVar130._0_4_ = 0; iVar119 = TILE_K, iVar80 = TILE_M,
                                iVar53 = TILE_N, auVar130._4_4_ = (int)uVar61 - auVar130._0_4_,
                                auVar130._4_4_ != 0 && auVar130._0_4_ <= (int)uVar61;
                                auVar130._0_4_ = auVar130._0_4_ + TILE_N) {
                              if (TILE_N < (int)auVar130._4_4_) {
                                auVar130._4_4_ = TILE_N;
                              }
                              local_4f8 = (ulong)auVar130._4_4_;
                              iVar78 = (int)local_4c0;
                              uVar61 = local_4c0 & 0xffffffff;
                              iVar92 = 0;
                              while( true ) {
                                iVar107 = (int)uVar61;
                                iVar98 = (int)local_4f8;
                                if (iVar78 <= iVar92) break;
                                iVar74 = iVar107;
                                if (iVar119 < iVar107) {
                                  iVar74 = iVar119;
                                }
                                opt_q._44_4_ = (this->weight_winograd23_data).w;
                                opt_q.flush_denormals = (this->weight_winograd23_data).h;
                                sVar18 = (this->weight_winograd23_data).elemsize;
                                opt_q.openmp_blocktime = (this->weight_winograd23_data).elempack;
                                opt_q._32_8_ = (this->weight_winograd23_data).allocator;
                                local_208 = (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_;
                                opt_q._0_8_ = (long)(this->weight_winograd23_data).data +
                                              sVar18 * local_208 * (long)(iVar92 / iVar119) +
                                              (long)(int)((long)((ulong)(uint)((int)local_520 >>
                                                                              0x1f) << 0x20 |
                                                                local_520 & 0xffffffff) /
                                                         (long)iVar80) *
                                              (this->weight_winograd23_data).cstep * sVar18;
                                opt_q.blob_allocator._0_4_ = 0;
                                opt_q.blob_allocator._4_4_ = 0;
                                opt_q.workspace_allocator._0_4_ = (undefined4)sVar18;
                                opt_q.workspace_allocator._4_4_ = (int)(sVar18 >> 0x20);
                                local_290.dims = 2;
                                opt_q.use_local_pool_allocator = true;
                                opt_q.use_shader_local_memory = false;
                                opt_q.use_cooperative_matrix = false;
                                opt_q.use_winograd23_convolution = false;
                                opt_q.use_winograd43_convolution = true;
                                opt_q.use_winograd63_convolution = false;
                                opt_q.use_a53_a55_optimized_kernel = false;
                                opt_q.use_fp16_uniform = false;
                                local_290.cstep = (long)local_378.h * (long)local_378.w;
                                local_290.data =
                                     (void *)((long)local_378.data +
                                             local_290.cstep * local_378.elemsize *
                                             (long)(iVar92 / iVar119) +
                                             (long)(auVar130._0_4_ / iVar53) * local_378.cstep *
                                             local_378.elemsize);
                                local_290.refcount = (int *)0x0;
                                local_290.elemsize = local_378.elemsize;
                                local_290.elempack = local_378.elempack;
                                local_290.allocator = local_378.allocator;
                                local_290.w = local_378.w;
                                local_290.h = local_378.h;
                                local_290.d = 1;
                                local_290.c = 1;
                                opt_q.vulkan_device_index = local_290.dims;
                                gemm_transB_packed_tile_int8
                                          ((Mat *)&opt_q,&local_290,&m_1,0x10,(int)local_428,iVar98,
                                           iVar92,iVar74,iVar78 <= iVar92 + iVar119);
                                uVar61 = (ulong)(uint)-(iVar119 - iVar107);
                                iVar92 = iVar92 + iVar119;
                              }
                              iVar119 = (int)local_418.cstep * local_418.elempack;
                              iVar80 = (local_418.w + 1) / 2;
                              iVar92 = iVar98 * 0x10;
                              local_4f0 = (ulong)(iVar98 * 4);
                              lVar60 = (long)iVar119;
                              iVar53 = 0;
                              uVar61 = 0;
                              if (0 < iVar98) {
                                uVar61 = local_4f8 & 0xffffffff;
                              }
                              local_4d0 = (int *)CONCAT44(local_4d0._4_4_,iVar92);
                              lVar69 = (long)(iVar98 * 8) * 4;
                              local_4b8._0_8_ = local_4f0 * 4;
                              for (uVar71 = 0; (long)(uVar71 | 3) < lVar59; uVar71 = uVar71 + 4) {
                                lVar113 = (long)iVar53;
                                lVar66 = 0;
                                for (uVar90 = 0; uVar90 != uVar61; uVar90 = uVar90 + 1) {
                                  lVar62 = (long)m_1.data + lVar66;
                                  for (lVar75 = -0x40; lVar75 != 0; lVar75 = lVar75 + 0x10) {
                                    auVar137 = *(undefined1 (*) [16])
                                                (lVar62 + local_4f0 * 4 + lVar113 * 4);
                                    auVar154 = *(undefined1 (*) [16])(lVar62 + lVar69 + lVar113 * 4)
                                    ;
                                    auVar174 = vpaddd_avx(auVar137,*(undefined1 (*) [16])
                                                                    (lVar62 + lVar113 * 4));
                                    auVar174 = vpaddd_avx(auVar174,auVar154);
                                    auVar137 = vpsubd_avx(auVar137,auVar154);
                                    auVar137 = vpaddd_avx(auVar137,*(undefined1 (*) [16])
                                                                    (lVar62 + (long)(iVar98 * 0xc) *
                                                                              4 + lVar113 * 4));
                                    *(undefined1 (*) [16])((long)aiStack_200 + lVar75 + -8) =
                                         auVar174;
                                    *(undefined1 (*) [16])(auStack_1c8 + lVar75) = auVar137;
                                    lVar62 = lVar62 + (long)iVar92 * 4;
                                  }
                                  iVar107 = auVar130._0_4_ + (int)uVar90;
                                  iVar78 = iVar107 % iVar80;
                                  auVar130._4_4_ = (iVar107 / iVar80) * 2;
                                  pauVar64 = (undefined1 (*) [16])
                                             ((long)local_418.data +
                                             (long)(iVar78 * 2 * local_418.elempack) * 4 +
                                             (long)local_418.w * local_418.elemsize *
                                             (long)(int)auVar130._4_4_ +
                                             (long)(((int)local_520 + (int)uVar71) /
                                                   local_418.elempack) * local_418.cstep *
                                             local_418.elemsize);
                                  iVar78 = iVar78 * 2 + 1;
                                  piVar77 = &opt_q.flush_denormals;
                                  for (lVar75 = 0; lVar75 != 2; lVar75 = lVar75 + 1) {
                                    if ((int)(auVar130._4_4_ | (uint)lVar75) < local_418.h) {
                                      pOVar116 = (Option *)(piVar77 + -0xc);
                                      auVar4[0] = pOVar116->lightmode;
                                      auVar4[1] = pOVar116->use_shader_pack8;
                                      auVar4[2] = pOVar116->use_subgroup_ops;
                                      auVar4[3] = pOVar116->use_reserved_0;
                                      auVar4._4_4_ = pOVar116->num_threads;
                                      auVar4._8_8_ = pOVar116->blob_allocator;
                                      auVar137 = vpaddd_avx(*(undefined1 (*) [16])(piVar77 + -8),
                                                            auVar4);
                                      auVar154 = vpsubd_avx(*(undefined1 (*) [16])(piVar77 + -8),
                                                            *(undefined1 (*) [16])(piVar77 + -4));
                                      auVar154 = vpaddd_avx(auVar154,*(undefined1 (*) [16])piVar77);
                                      auVar137 = vpaddd_avx(auVar137,*(undefined1 (*) [16])
                                                                      (piVar77 + -4));
                                      auVar174 = vpsrad_avx(auVar137,2);
                                      auVar137 = vpsrad_avx(auVar154,2);
                                      if (local_418.elempack == 1) {
                                        *(int *)*pauVar64 = auVar174._0_4_;
                                        *(int *)(*pauVar64 + lVar60 * 4) = auVar174._4_4_;
                                        *(int *)(*pauVar64 + (long)(iVar119 * 2) * 4) =
                                             auVar174._8_4_;
                                        *(int *)(*pauVar64 + (long)(iVar119 * 3) * 4) =
                                             auVar174._12_4_;
                                        if (iVar78 < local_418.w) {
                                          *(int *)(*pauVar64 + 4) = auVar137._0_4_;
                                          *(int *)(*pauVar64 + lVar60 * 4 + 4) = auVar137._4_4_;
                                          *(int *)(*pauVar64 + (long)(iVar119 * 2) * 4 + 4) =
                                               auVar137._8_4_;
                                          *(int *)(*pauVar64 + (long)(iVar119 * 3) * 4 + 4) =
                                               auVar137._12_4_;
                                        }
                                      }
                                      else if ((local_418.elempack == 4) &&
                                              (*pauVar64 = auVar174, iVar78 < local_418.w)) {
                                        pauVar64[1] = auVar137;
                                      }
                                      pauVar64 = (undefined1 (*) [16])
                                                 (*pauVar64 +
                                                 (long)(local_418.elempack * local_418.w) * 4);
                                    }
                                    piVar77 = piVar77 + 0x10;
                                  }
                                  lVar66 = lVar66 + 0x10;
                                }
                                iVar53 = iVar53 + iVar98 * 0x40;
                              }
                              local_490 = (void *)CONCAT44(local_490._4_4_,iVar98 * 0x20);
                              for (; (long)(uVar71 | 1) < lVar59; uVar71 = uVar71 + 2) {
                                puVar76 = (ulong *)((long)iVar53 * 4 + (long)m_1.data);
                                for (uVar90 = 0; uVar90 != uVar61; uVar90 = uVar90 + 1) {
                                  puVar57 = puVar76;
                                  for (lVar113 = -4; lVar113 != 0; lVar113 = lVar113 + 1) {
                                    auVar131._8_8_ = 0;
                                    auVar131._0_8_ = *puVar57;
                                    auVar138._8_8_ = 0;
                                    auVar138._0_8_ =
                                         *(ulong *)((long)puVar57 + (long)(iVar98 * 2) * 4);
                                    auVar137 = vpaddd_avx(auVar138,auVar131);
                                    auVar146._8_8_ = 0;
                                    auVar146._0_8_ = *(ulong *)((long)puVar57 + local_4f0 * 4);
                                    auVar137 = vpaddd_avx(auVar137,auVar146);
                                    *(long *)(&opt_q.use_bf16_storage + lVar113 * 8) =
                                         auVar137._0_8_;
                                    auVar137 = vpsubd_avx(auVar138,auVar146);
                                    auVar139._8_8_ = 0;
                                    auVar139._0_8_ =
                                         *(ulong *)((long)puVar57 + (long)(iVar98 * 6) * 4);
                                    auVar137 = vpaddd_avx(auVar137,auVar139);
                                    *(long *)(aiStack_200 + lVar113 * 2 + -2) = auVar137._0_8_;
                                    puVar57 = (ulong *)((long)puVar57 + lVar69);
                                  }
                                  iVar78 = auVar130._0_4_ + (int)uVar90;
                                  iVar119 = iVar78 % iVar80;
                                  auVar130._4_4_ = (iVar78 / iVar80) * 2;
                                  piVar77 = (int *)((long)local_418.data +
                                                   (long)(iVar119 * 2) * 4 +
                                                   (long)local_418.w * local_418.elemsize *
                                                   (long)(int)auVar130._4_4_ +
                                                   (local_508 + uVar71) * local_418.cstep *
                                                   local_418.elemsize);
                                  pbVar72 = &opt_q.use_winograd_convolution;
                                  for (lVar113 = 0; lVar113 != 2; lVar113 = lVar113 + 1) {
                                    if ((int)(auVar130._4_4_ | (uint)lVar113) < local_418.h) {
                                      iVar78 = *(int *)(pbVar72 + -0x14);
                                      iVar107 = *(int *)(pbVar72 + -0x10);
                                      iVar74 = *(int *)(pbVar72 + -0xc);
                                      iVar93 = *(int *)(pbVar72 + -0x18);
                                      iVar122 = *(int *)(pbVar72 + -8);
                                      iVar99 = *(int *)(pbVar72 + -4);
                                      iVar67 = *(int *)pbVar72;
                                      *piVar77 = *(int *)(pbVar72 + -0x1c) + iVar78 + iVar74 >> 2;
                                      piVar77[lVar60] = iVar93 + iVar107 + iVar122 >> 2;
                                      if (iVar119 * 2 + 1 < local_418.w) {
                                        piVar77[1] = (iVar78 - iVar74) + iVar99 >> 2;
                                        piVar77[lVar60 + 1] = (iVar107 - iVar122) + iVar67 >> 2;
                                      }
                                      piVar77 = piVar77 + local_418.w;
                                    }
                                    pbVar72 = pbVar72 + 0x20;
                                  }
                                  puVar76 = puVar76 + 1;
                                }
                                iVar53 = iVar53 + iVar98 * 0x20;
                              }
                              for (; (long)uVar71 < lVar59; uVar71 = uVar71 + 1) {
                                piVar77 = (int *)((long)iVar53 * 4 + (long)m_1.data);
                                for (uVar90 = 0; uVar90 != uVar61; uVar90 = uVar90 + 1) {
                                  piVar58 = piVar77;
                                  for (lVar60 = -4; lVar60 != 0; lVar60 = lVar60 + 1) {
                                    iVar119 = piVar58[iVar98];
                                    iVar78 = piVar58[iVar98 * 2];
                                    *(int *)((long)&opt_q.workspace_allocator + lVar60 * 4) =
                                         *piVar58 + iVar119 + iVar78;
                                    *(int *)(&opt_q.use_bf16_storage + lVar60 * 4) =
                                         (iVar119 - iVar78) + piVar58[iVar98 * 3];
                                    piVar58 = piVar58 + local_4f0;
                                  }
                                  iVar78 = auVar130._0_4_ + (int)uVar90;
                                  iVar119 = iVar78 % iVar80;
                                  auVar130._4_4_ = (iVar78 / iVar80) * 2;
                                  piVar58 = (int *)((long)local_418.data +
                                                   (long)(iVar119 * 2) * 4 +
                                                   (long)local_418.w * local_418.elemsize *
                                                   (long)(int)auVar130._4_4_ +
                                                   (local_508 + uVar71) * local_418.cstep *
                                                   local_418.elemsize);
                                  piVar106 = (int *)((long)&opt_q.blob_allocator + 4);
                                  for (lVar60 = 0; lVar60 != 2; lVar60 = lVar60 + 1) {
                                    if ((int)(auVar130._4_4_ | (uint)lVar60) < local_418.h) {
                                      iVar78 = piVar106[-2];
                                      iVar107 = piVar106[-1];
                                      iVar74 = *piVar106;
                                      *piVar58 = piVar106[-3] + iVar78 + iVar107 >> 2;
                                      if (iVar119 * 2 + 1 < local_418.w) {
                                        piVar58[1] = (iVar78 - iVar107) + iVar74 >> 2;
                                      }
                                      piVar58 = piVar58 + local_418.w;
                                    }
                                    piVar106 = piVar106 + 4;
                                  }
                                  piVar77 = piVar77 + 1;
                                }
                                iVar53 = iVar53 + iVar92;
                              }
                              uVar61 = local_500;
                            }
                            if (m_1.refcount != (int *)0x0) {
                              LOCK();
                              *m_1.refcount = *m_1.refcount + -1;
                              UNLOCK();
                              if (*m_1.refcount == 0) {
                                if (m_1.allocator == (Allocator *)0x0) {
                                  free(m_1.data);
                                }
                                else {
                                  (*(m_1.allocator)->_vptr_Allocator[3])();
                                }
                              }
                            }
                          }
                          auVar130._0_4_ = 0;
                        }
                        piVar77 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                        if (piVar77 != (int *)0x0) {
                          LOCK();
                          *piVar77 = *piVar77 + -1;
                          UNLOCK();
                          if (*piVar77 == 0) {
                            pvVar105 = m.data;
                            if (m.allocator == (Allocator *)0x0) {
LAB_00209300:
                              free(pvVar105);
                            }
                            else {
                              (*(m.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                      }
                    }
                  }
                  piVar77 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
                  if (piVar77 != (int *)0x0) {
                    LOCK();
                    *piVar77 = *piVar77 + -1;
                    UNLOCK();
                    if (*piVar77 == 0) {
                      pvVar105 = local_378.data;
                      if (local_378.allocator == (Allocator *)0x0) goto LAB_00207948;
                      (*(local_378.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                else {
                  auVar130._0_4_ =
                       conv3x3s1_winograd23_int8_xop(&local_488,&local_418,pMVar1,iVar52,local_4e8);
                }
              }
              else {
                auVar130._0_4_ =
                     conv3x3s1_winograd23_int8_avx2(&local_488,&local_418,pMVar1,iVar52,local_4e8);
              }
            }
            else {
              auVar130._0_4_ =
                   conv3x3s1_winograd23_int8_avxvnni(&local_488,&local_418,pMVar1,iVar52,local_4e8);
            }
          }
LAB_0020770b:
          if (auVar130._0_4_ != 0) goto LAB_002081a9;
        }
        else {
          local_520 = (ulong)(uint)auVar130._12_4_;
          if (opt->use_sgemm_convolution == true) {
            iVar53 = auVar130._4_4_ * auVar130._0_4_;
            uVar120 = local_418.elempack * local_418.c;
            uVar61 = (ulong)uVar120;
            uVar121 = local_418.h * local_418.w;
            uVar114 = local_488.c * iVar53 * local_488.elempack;
            uVar71 = (ulong)uVar114;
            convolution_im2col_gemm_get_optimal_tile_mnk_int8
                      (uVar120,uVar121,uVar114,&TILE_M,&TILE_N,&TILE_K,iVar52);
            local_4a0 = (undefined1 (*) [16])
                        CONCAT44(local_4a0._4_4_,(int)(uVar120 + TILE_M + -1) / TILE_M);
            iVar119 = (int)(TILE_N + uVar121 + -1) / TILE_N;
            iVar80 = (int)(uVar114 + TILE_K + -1) / TILE_K;
            local_208 = 0;
            opt_q.lightmode = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_ops = false;
            opt_q.use_reserved_0 = false;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.vulkan_device_index = 0;
            opt_q.use_reserved_1 = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_2 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_a53_a55_optimized_kernel = false;
            opt_q.use_fp16_uniform = false;
            local_508 = CONCAT44(local_508._4_4_,iVar80);
            Mat::create((Mat *)&opt_q,TILE_K * TILE_N,iVar80,iVar119,1,
                        local_4e8->workspace_allocator);
            local_438 = 0xffffffffffffff9c;
            local_4c0 = uVar71;
            if ((opt_q._0_8_ != 0) && ((long)(int)opt_q._56_4_ * local_208 != 0)) {
              auVar137 = vpcmpeqd_avx(auVar130,_DAT_00539540);
              uVar73 = vmovmskps_avx(auVar137);
              iVar119 = iVar119 * (int)local_508;
              local_500 = CONCAT71(local_500._1_7_,
                                   (((auVar130._4_4_ == 1 && auVar130._0_4_ == 1) &&
                                    (int)local_4e0 == 1) && (uint)local_518 == 1) &
                                   (byte)uVar73 >> 2 & (byte)uVar73 >> 3);
              local_4c8 = (ulong)(uint)~((auVar130._0_4_ + -1) * auVar130._8_4_);
              iVar80 = 0;
              if (iVar119 < 1) {
                iVar119 = 0;
              }
              local_4b8 = vpshufd_avx(ZEXT416((uint)local_518),0);
              pOVar116 = local_4e8;
              local_4f8 = (ulong)auVar130._4_4_;
              local_498 = uVar61;
              local_490 = (void *)(ulong)uVar121;
              for (; pvVar105 = local_490, iVar80 != iVar119; iVar80 = iVar80 + 1) {
                iVar78 = TILE_N * (iVar80 / (int)local_508);
                iVar98 = TILE_K * (iVar80 % (int)local_508);
                iVar92 = (int)local_490 - iVar78;
                if (TILE_N < iVar92) {
                  iVar92 = TILE_N;
                }
                iVar107 = (int)local_4c0 - iVar98;
                if (TILE_K < iVar107) {
                  iVar107 = TILE_K;
                }
                local_378.cstep = (size_t)(int)opt_q._44_4_;
                local_378.elemsize =
                     CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
                local_378.data =
                     (void *)((uint)(iVar80 % (int)local_508) * local_378.cstep * local_378.elemsize
                             + (long)(iVar80 / (int)local_508) * local_208 * local_378.elemsize +
                               opt_q._0_8_);
                local_378.refcount._0_4_ = 0;
                local_378.refcount._4_4_ = 0;
                local_378.elempack = opt_q.openmp_blocktime;
                local_378.allocator = (Allocator *)opt_q._32_8_;
                local_378.dims = 2;
                local_378.w._0_1_ = opt_q.use_reserved_1;
                local_378.w._1_1_ = opt_q.use_image_storage;
                local_378.w._2_1_ = opt_q.use_tensor_storage;
                local_378.w._3_1_ = opt_q.use_reserved_2;
                local_378.h = 1;
                local_378.d = 1;
                local_378.c = 1;
                iVar74 = cpu_support_x86_avx_vnni_int8();
                if (iVar74 == 0) {
                  iVar74 = cpu_support_x86_avx_vnni();
                  if (iVar74 == 0) {
                    iVar74 = cpu_support_x86_avx2();
                    if (iVar74 == 0) {
                      iVar74 = (int)local_488.cstep;
                      if ((char)local_500 == '\0') {
                        uVar121 = ((int)local_4c8 + local_488.w) / (int)local_518;
                        uVar91 = uVar121 + 1;
                        auVar130._4_4_ = 0;
                        uVar120 = 1;
                        uVar114 = 0;
                        if (uVar121 != 0) {
                          auVar130._4_4_ = 0x1f;
                          if (uVar121 != 0) {
                            for (; uVar121 >> auVar130._4_4_ == 0;
                                auVar130._4_4_ = auVar130._4_4_ - 1) {
                            }
                          }
                          iVar93 = 1 << (-(char)(auVar130._4_4_ ^ 0x1f) & 0x1fU);
                          if ((auVar130._4_4_ ^ 0x1f) == 0) {
                            iVar93 = 0;
                          }
                          auVar19._4_8_ = 0;
                          auVar19._0_4_ = uVar91;
                          auVar21._4_8_ = 0;
                          auVar21._0_4_ = iVar93 - uVar91;
                          uVar120 = SUB124((auVar21 << 0x20) / auVar19,0) + 1;
                          uVar114 = 1;
                        }
                        auVar137 = vpshufd_avx(ZEXT416(uVar120),0);
                        auVar154 = vpshufd_avx(ZEXT416(uVar91),0);
                        uVar121 = local_488.w * (int)local_4e0;
                        local_4f0 = CONCAT44(local_4f0._4_4_,uVar121);
                        auVar174 = vpshufd_avx(ZEXT416(uVar121),0);
                        iVar99 = local_488.w * (int)local_520;
                        iVar122 = iVar107 / 8;
                        uVar61 = (long)iVar98 / 8 & 0xffffffff;
                        iVar93 = 0;
                        if (0 < iVar122) {
                          iVar93 = iVar122;
                        }
                        uVar120 = 0;
                        pauVar64 = (undefined1 (*) [16])local_378.data;
                        while( true ) {
                          auVar158 = vpmovzxdq_avx(ZEXT416(uVar114));
                          auVar147 = ZEXT416(auVar130._4_4_);
                          if (iVar92 <= (int)(uVar120 | 7)) break;
                          auVar177 = vpshufd_avx(ZEXT416(iVar78 + uVar120),0);
                          auVar141 = vpaddd_avx(auVar177,_DAT_005397d0);
                          auVar186 = vpmuludq_avx(auVar141,auVar137);
                          auVar140 = vpsrlq_avx(auVar186,0x20);
                          auVar186 = vpsrlq_avx(auVar141,0x20);
                          auVar186 = vpmuludq_avx(auVar186,auVar137);
                          auVar140 = vpblendw_avx(auVar140,auVar186,0xcc);
                          auVar186 = vpsubd_avx(auVar141,auVar140);
                          auVar176 = vpsrld_avx(auVar186,auVar158);
                          auVar186 = vpaddd_avx(auVar177,_DAT_005397f0);
                          auVar140 = vpaddd_avx(auVar176,auVar140);
                          auVar177 = vpsrld_avx(auVar140,auVar147);
                          auVar140 = vpmuludq_avx(auVar186,auVar137);
                          auVar176 = vpsrlq_avx(auVar140,0x20);
                          auVar140 = vpsrlq_avx(auVar186,0x20);
                          auVar140 = vpmuludq_avx(auVar140,auVar137);
                          auVar140 = vpblendw_avx(auVar176,auVar140,0xcc);
                          auVar176 = vpsubd_avx(auVar186,auVar140);
                          auVar158 = vpsrld_avx(auVar176,auVar158);
                          auVar158 = vpaddd_avx(auVar158,auVar140);
                          auVar140 = vpsrld_avx(auVar158,auVar147);
                          auVar158 = vpmulld_avx(auVar177,auVar154);
                          auVar158 = vpsubd_avx(auVar141,auVar158);
                          auVar158 = vpmulld_avx(auVar158,local_4b8);
                          auVar147 = vpmulld_avx(auVar177,auVar174);
                          auVar141 = vpmulld_avx(auVar140,auVar174);
                          auVar158 = vpaddd_avx(auVar147,auVar158);
                          if (((int)local_518 == 1) && (auVar147._0_4_ == auVar141._12_4_)) {
                            iVar67 = auVar158._0_4_;
                            if (local_488.elempack == 1) {
                              for (iVar81 = 0; iVar81 + 1 < iVar107; iVar81 = iVar81 + 2) {
                                uVar71 = (long)(iVar98 + iVar81) % (long)iVar53;
                                iVar87 = iVar98 + iVar81 + 1;
                                uVar90 = (long)iVar87 % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                uVar90 = (ulong)(uint)((int)uVar90 >> 0x1f) << 0x20 |
                                         uVar90 & 0xffffffff;
                                auVar158._8_8_ = 0;
                                auVar158._0_8_ =
                                     *(ulong *)((long)local_488.data +
                                               (long)((int)((long)uVar71 % (long)auVar130._0_4_) *
                                                      auVar130._8_4_ +
                                                      ((iVar98 + iVar81) / iVar53) * iVar74 + iVar67
                                                     + (int)((long)uVar71 / (long)auVar130._0_4_) *
                                                       iVar99));
                                auVar147._8_8_ = 0;
                                auVar147._0_8_ =
                                     *(ulong *)((long)local_488.data +
                                               (long)((int)((long)uVar90 % (long)auVar130._0_4_) *
                                                      auVar130._8_4_ +
                                                      (iVar87 / iVar53) * iVar74 + iVar67 +
                                                     (int)((long)uVar90 / (long)auVar130._0_4_) *
                                                     iVar99));
                                auVar158 = vpunpcklbw_avx(auVar158,auVar147);
                                *pauVar64 = auVar158;
                                pauVar64 = pauVar64 + 1;
                              }
                              for (; iVar81 < iVar107; iVar81 = iVar81 + 1) {
                                uVar71 = (long)(iVar98 + iVar81) % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                *(undefined8 *)*pauVar64 =
                                     *(undefined8 *)
                                      ((long)local_488.data +
                                      (long)((int)((long)uVar71 % (long)auVar130._0_4_) *
                                             auVar130._8_4_ +
                                             ((iVar98 + iVar81) / iVar53) * iVar74 + iVar67 +
                                            (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99));
                                pauVar64 = (undefined1 (*) [16])(*pauVar64 + 8);
                              }
                            }
                            uVar71 = uVar61;
                            iVar81 = iVar93;
                            if (local_488.elempack == 8) {
                              while (iVar81 != 0) {
                                iVar87 = (int)uVar71;
                                uVar71 = (ulong)(uint)((int)((long)iVar87 % (long)iVar53) >> 0x1f)
                                         << 0x20 | (long)iVar87 % (long)iVar53 & 0xffffffffU;
                                lVar59 = (long)((int)((long)uVar71 % (long)auVar130._0_4_) *
                                                auVar130._8_4_ + (iVar87 / iVar53) * iVar74 + iVar67
                                               + (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99
                                               );
                                auVar158 = *(undefined1 (*) [16])((long)local_488.data + lVar59 * 8)
                                ;
                                auVar147 = *(undefined1 (*) [16])
                                            ((long)local_488.data + lVar59 * 8 + 0x10);
                                auVar141 = *(undefined1 (*) [16])
                                            ((long)local_488.data + lVar59 * 8 + 0x20);
                                auVar186 = *(undefined1 (*) [16])
                                            ((long)local_488.data + lVar59 * 8 + 0x30);
                                auVar140 = vpunpcklwd_avx(auVar158,auVar147);
                                auVar158 = vpunpckhwd_avx(auVar158,auVar147);
                                auVar177 = vpunpcklwd_avx(auVar141,auVar186);
                                auVar147 = vpunpckhwd_avx(auVar141,auVar186);
                                auVar141 = vpunpcklwd_avx(auVar140,auVar158);
                                auVar186 = vpunpcklwd_avx(auVar177,auVar147);
                                auVar158 = vpunpckhwd_avx(auVar140,auVar158);
                                auVar147 = vpunpckhwd_avx(auVar177,auVar147);
                                auVar140 = vpunpcklqdq_avx(auVar141,auVar186);
                                auVar141 = vpunpckhqdq_avx(auVar141,auVar186);
                                auVar186 = vpunpcklqdq_avx(auVar158,auVar147);
                                auVar158 = vpunpckhqdq_avx(auVar158,auVar147);
                                *pauVar64 = auVar140;
                                pauVar64[1] = auVar141;
                                pauVar64[2] = auVar186;
                                pauVar64[3] = auVar158;
                                pauVar64 = pauVar64 + 4;
                                uVar71 = (ulong)(iVar87 + 1);
                                iVar81 = iVar81 + -1;
                              }
                            }
                          }
                          else {
                            auVar147 = vpmulld_avx(auVar140,auVar154);
                            auVar147 = vpsubd_avx(auVar186,auVar147);
                            auVar147 = vpmulld_avx(auVar147,local_4b8);
                            auVar147 = vpaddd_avx(auVar141,auVar147);
                            if (local_488.elempack == 1) {
                              for (iVar67 = 0; iVar67 + 1 < iVar107; iVar67 = iVar67 + 2) {
                                uVar71 = (long)(iVar98 + iVar67) % (long)iVar53;
                                iVar81 = iVar98 + iVar67 + 1;
                                uVar90 = (long)iVar81 % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                uVar90 = (ulong)(uint)((int)uVar90 >> 0x1f) << 0x20 |
                                         uVar90 & 0xffffffff;
                                auVar186 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar71 %
                                                                           (long)auVar130._0_4_) *
                                                                      auVar130._8_4_ +
                                                                      ((iVar98 + iVar67) / iVar53) *
                                                                      iVar74 + (int)((long)uVar71 /
                                                                                    (long)auVar130.
                                                  _0_4_) * iVar99)),0);
                                auVar141 = vpaddd_avx(auVar186,auVar158);
                                auVar186 = vpaddd_avx(auVar186,auVar147);
                                auVar177 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar90 %
                                                                           (long)auVar130._0_4_) *
                                                                      auVar130._8_4_ +
                                                                      (iVar81 / iVar53) * iVar74 +
                                                                     (int)((long)uVar90 /
                                                                          (long)auVar130._0_4_) *
                                                                     iVar99)),0);
                                auVar140 = vpaddd_avx(auVar177,auVar158);
                                auVar177 = vpaddd_avx(auVar177,auVar147);
                                (*pauVar64)[0] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar141._0_4_);
                                (*pauVar64)[1] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar140._0_4_);
                                (*pauVar64)[2] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar141._4_4_);
                                (*pauVar64)[3] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar140._4_4_);
                                (*pauVar64)[4] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar141._8_4_);
                                (*pauVar64)[5] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar140._8_4_);
                                (*pauVar64)[6] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar141._12_4_);
                                (*pauVar64)[7] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar140._12_4_);
                                (*pauVar64)[8] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._0_4_);
                                (*pauVar64)[9] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar177._0_4_);
                                (*pauVar64)[10] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._4_4_);
                                (*pauVar64)[0xb] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar177._4_4_);
                                (*pauVar64)[0xc] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._8_4_);
                                (*pauVar64)[0xd] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar177._8_4_);
                                (*pauVar64)[0xe] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._12_4_);
                                (*pauVar64)[0xf] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar177._12_4_);
                                pauVar64 = pauVar64 + 1;
                              }
                              for (; iVar67 < iVar107; iVar67 = iVar67 + 1) {
                                uVar71 = (long)(iVar98 + iVar67) % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                auVar186 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar71 %
                                                                           (long)auVar130._0_4_) *
                                                                      auVar130._8_4_ +
                                                                      ((iVar98 + iVar67) / iVar53) *
                                                                      iVar74 + (int)((long)uVar71 /
                                                                                    (long)auVar130.
                                                  _0_4_) * iVar99)),0);
                                auVar141 = vpaddd_avx(auVar186,auVar158);
                                auVar186 = vpaddd_avx(auVar186,auVar147);
                                (*pauVar64)[0] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar141._0_4_);
                                (*pauVar64)[1] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar141._4_4_);
                                (*pauVar64)[2] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar141._8_4_);
                                (*pauVar64)[3] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar141._12_4_);
                                (*pauVar64)[4] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._0_4_);
                                (*pauVar64)[5] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._4_4_);
                                (*pauVar64)[6] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._8_4_);
                                (*pauVar64)[7] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._12_4_);
                                pauVar64 = (undefined1 (*) [16])(*pauVar64 + 8);
                              }
                            }
                            uVar71 = uVar61;
                            iVar67 = iVar93;
                            if (local_488.elempack == 8) {
                              while (iVar67 != 0) {
                                iVar81 = (int)uVar71;
                                uVar71 = (ulong)(uint)((int)((long)iVar81 % (long)iVar53) >> 0x1f)
                                         << 0x20 | (long)iVar81 % (long)iVar53 & 0xffffffffU;
                                auVar186 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar71 %
                                                                           (long)auVar130._0_4_) *
                                                                      auVar130._8_4_ +
                                                                      (iVar81 / iVar53) * iVar74 +
                                                                     (int)((long)uVar71 /
                                                                          (long)auVar130._0_4_) *
                                                                     iVar99)),0);
                                auVar141 = vpaddd_avx(auVar186,auVar158);
                                auVar186 = vpaddd_avx(auVar186,auVar147);
                                auVar140 = vpslld_avx(auVar141,3);
                                auVar177 = vpslld_avx(auVar186,3);
                                auVar187._8_8_ = 0;
                                auVar187._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)auVar140._0_4_);
                                auVar193._8_8_ = 0;
                                auVar193._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)auVar140._4_4_);
                                auVar141 = vpunpcklwd_avx(auVar187,auVar193);
                                auVar181._8_8_ = 0;
                                auVar181._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)auVar140._12_4_);
                                auVar194._8_8_ = 0;
                                auVar194._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)auVar140._8_4_);
                                auVar186 = vpunpcklwd_avx(auVar194,auVar181);
                                auVar195._8_8_ = 0;
                                auVar195._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)auVar177._0_4_);
                                auVar201._8_8_ = 0;
                                auVar201._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)auVar177._4_4_);
                                auVar140 = vpunpcklwd_avx(auVar195,auVar201);
                                auVar178._8_8_ = 0;
                                auVar178._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)auVar177._12_4_);
                                auVar202._8_8_ = 0;
                                auVar202._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)auVar177._8_4_);
                                auVar177 = vpunpcklwd_avx(auVar202,auVar178);
                                auVar176 = vpunpckldq_avx(auVar141,auVar186);
                                auVar141 = vpunpckhdq_avx(auVar141,auVar186);
                                auVar182 = vpunpckldq_avx(auVar140,auVar177);
                                auVar186 = vpunpckhdq_avx(auVar140,auVar177);
                                auVar177 = vpunpcklqdq_avx(auVar176,auVar182);
                                auVar140 = vpunpckhqdq_avx(auVar176,auVar182);
                                auVar176 = vpunpcklqdq_avx(auVar141,auVar186);
                                auVar141 = vpunpckhqdq_avx(auVar141,auVar186);
                                *pauVar64 = auVar177;
                                pauVar64[1] = auVar140;
                                pauVar64[2] = auVar176;
                                pauVar64[3] = auVar141;
                                pauVar64 = pauVar64 + 4;
                                uVar71 = (ulong)(iVar81 + 1);
                                iVar67 = iVar67 + -1;
                              }
                            }
                          }
                          uVar120 = uVar120 + 8;
                        }
                        for (; (int)(uVar120 | 3) < iVar92; uVar120 = uVar120 + 4) {
                          auVar141 = vpshufd_avx(ZEXT416(iVar78 + uVar120),0);
                          auVar141 = vpaddd_avx(auVar141,_DAT_005397d0);
                          auVar186 = vpmuludq_avx(auVar141,auVar137);
                          auVar140 = vpsrlq_avx(auVar186,0x20);
                          auVar186 = vpsrlq_avx(auVar141,0x20);
                          auVar186 = vpmuludq_avx(auVar186,auVar137);
                          auVar186 = vpblendw_avx(auVar140,auVar186,0xcc);
                          auVar140 = vpsubd_avx(auVar141,auVar186);
                          auVar140 = vpsrld_avx(auVar140,auVar158);
                          auVar186 = vpaddd_avx(auVar140,auVar186);
                          auVar140 = vpsrld_avx(auVar186,auVar147);
                          auVar186 = vpmulld_avx(auVar140,auVar154);
                          auVar141 = vpsubd_avx(auVar141,auVar186);
                          auVar141 = vpmulld_avx(auVar141,local_4b8);
                          auVar186 = vpmulld_avx(auVar140,auVar174);
                          auVar141 = vpaddd_avx(auVar141,auVar186);
                          if (((int)local_518 == 1) && (auVar186._0_4_ == auVar186._12_4_)) {
                            iVar67 = auVar141._0_4_;
                            if (local_488.elempack == 1) {
                              for (iVar81 = 0; iVar81 + 1 < iVar107; iVar81 = iVar81 + 2) {
                                uVar71 = (long)(iVar98 + iVar81) % (long)iVar53;
                                iVar87 = iVar98 + iVar81 + 1;
                                uVar90 = (long)iVar87 % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                uVar90 = (ulong)(uint)((int)uVar90 >> 0x1f) << 0x20 |
                                         uVar90 & 0xffffffff;
                                auVar141._8_8_ = 0;
                                auVar141._0_8_ =
                                     *(ulong *)((long)local_488.data +
                                               (long)((int)((long)uVar71 % (long)auVar130._0_4_) *
                                                      auVar130._8_4_ +
                                                      ((iVar98 + iVar81) / iVar53) * iVar74 + iVar67
                                                     + (int)((long)uVar71 / (long)auVar130._0_4_) *
                                                       iVar99));
                                auVar140._8_8_ = 0;
                                auVar140._0_8_ =
                                     *(ulong *)((long)local_488.data +
                                               (long)((int)((long)uVar90 % (long)auVar130._0_4_) *
                                                      auVar130._8_4_ +
                                                      (iVar87 / iVar53) * iVar74 + iVar67 +
                                                     (int)((long)uVar90 / (long)auVar130._0_4_) *
                                                     iVar99));
                                auVar141 = vpunpcklbw_avx(auVar141,auVar140);
                                *(long *)*pauVar64 = auVar141._0_8_;
                                pauVar64 = (undefined1 (*) [16])(*pauVar64 + 8);
                              }
                              for (; iVar81 < iVar107; iVar81 = iVar81 + 1) {
                                uVar71 = (long)(iVar98 + iVar81) % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                lVar59 = (long)((int)((long)uVar71 % (long)auVar130._0_4_) *
                                                auVar130._8_4_ +
                                                ((iVar98 + iVar81) / iVar53) * iVar74 + iVar67 +
                                               (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99);
                                (*pauVar64)[0] = *(undefined1 *)((long)local_488.data + lVar59);
                                (*pauVar64)[1] = *(undefined1 *)((long)local_488.data + lVar59 + 1);
                                (*pauVar64)[2] = *(undefined1 *)((long)local_488.data + lVar59 + 2);
                                (*pauVar64)[3] = *(undefined1 *)((long)local_488.data + lVar59 + 3);
                                pauVar64 = (undefined1 (*) [16])(*pauVar64 + 4);
                              }
                            }
                            uVar71 = uVar61;
                            iVar81 = iVar93;
                            if (local_488.elempack == 8) {
                              while (iVar81 != 0) {
                                iVar87 = (int)uVar71;
                                uVar71 = (ulong)(uint)((int)((long)iVar87 % (long)iVar53) >> 0x1f)
                                         << 0x20 | (long)iVar87 % (long)iVar53 & 0xffffffffU;
                                lVar59 = (long)((int)((long)uVar71 % (long)auVar130._0_4_) *
                                                auVar130._8_4_ + (iVar87 / iVar53) * iVar74 + iVar67
                                               + (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99
                                               );
                                auVar141 = *(undefined1 (*) [16])((long)local_488.data + lVar59 * 8)
                                ;
                                auVar186 = *(undefined1 (*) [16])
                                            ((long)local_488.data + lVar59 * 8 + 0x10);
                                auVar140 = vpunpcklwd_avx(auVar141,auVar186);
                                auVar141 = vpunpckhwd_avx(auVar141,auVar186);
                                auVar186 = vpunpcklwd_avx(auVar140,auVar141);
                                auVar141 = vpunpckhwd_avx(auVar140,auVar141);
                                *pauVar64 = auVar186;
                                pauVar64[1] = auVar141;
                                pauVar64 = pauVar64 + 2;
                                uVar71 = (ulong)(iVar87 + 1);
                                iVar81 = iVar81 + -1;
                              }
                            }
                          }
                          else {
                            if (local_488.elempack == 1) {
                              for (iVar67 = 0; iVar67 + 1 < iVar107; iVar67 = iVar67 + 2) {
                                uVar71 = (long)(iVar98 + iVar67) % (long)iVar53;
                                iVar81 = iVar98 + iVar67 + 1;
                                uVar90 = (long)iVar81 % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                uVar90 = (ulong)(uint)((int)uVar90 >> 0x1f) << 0x20 |
                                         uVar90 & 0xffffffff;
                                auVar186 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar71 %
                                                                           (long)auVar130._0_4_) *
                                                                      auVar130._8_4_ +
                                                                      ((iVar98 + iVar67) / iVar53) *
                                                                      iVar74 + (int)((long)uVar71 /
                                                                                    (long)auVar130.
                                                  _0_4_) * iVar99)),0);
                                auVar186 = vpaddd_avx(auVar186,auVar141);
                                auVar140 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar90 %
                                                                           (long)auVar130._0_4_) *
                                                                      auVar130._8_4_ +
                                                                      (iVar81 / iVar53) * iVar74 +
                                                                     (int)((long)uVar90 /
                                                                          (long)auVar130._0_4_) *
                                                                     iVar99)),0);
                                auVar140 = vpaddd_avx(auVar140,auVar141);
                                (*pauVar64)[0] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._0_4_);
                                (*pauVar64)[1] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar140._0_4_);
                                (*pauVar64)[2] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._4_4_);
                                (*pauVar64)[3] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar140._4_4_);
                                (*pauVar64)[4] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._8_4_);
                                (*pauVar64)[5] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar140._8_4_);
                                (*pauVar64)[6] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._12_4_);
                                (*pauVar64)[7] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar140._12_4_);
                                pauVar64 = (undefined1 (*) [16])(*pauVar64 + 8);
                              }
                              for (; iVar67 < iVar107; iVar67 = iVar67 + 1) {
                                uVar71 = (long)(iVar98 + iVar67) % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                auVar186 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar71 %
                                                                           (long)auVar130._0_4_) *
                                                                      auVar130._8_4_ +
                                                                      ((iVar98 + iVar67) / iVar53) *
                                                                      iVar74 + (int)((long)uVar71 /
                                                                                    (long)auVar130.
                                                  _0_4_) * iVar99)),0);
                                auVar186 = vpaddd_avx(auVar186,auVar141);
                                (*pauVar64)[0] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._0_4_);
                                (*pauVar64)[1] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._4_4_);
                                (*pauVar64)[2] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._8_4_);
                                (*pauVar64)[3] =
                                     *(undefined1 *)((long)local_488.data + (long)auVar186._12_4_);
                                pauVar64 = (undefined1 (*) [16])(*pauVar64 + 4);
                              }
                            }
                            uVar71 = uVar61;
                            iVar67 = iVar93;
                            if (local_488.elempack == 8) {
                              while (iVar67 != 0) {
                                iVar81 = (int)uVar71;
                                uVar71 = (ulong)(uint)((int)((long)iVar81 % (long)iVar53) >> 0x1f)
                                         << 0x20 | (long)iVar81 % (long)iVar53 & 0xffffffffU;
                                auVar186 = vpshufd_avx(ZEXT416((uint)((int)((long)uVar71 %
                                                                           (long)auVar130._0_4_) *
                                                                      auVar130._8_4_ +
                                                                      (iVar81 / iVar53) * iVar74 +
                                                                     (int)((long)uVar71 /
                                                                          (long)auVar130._0_4_) *
                                                                     iVar99)),0);
                                auVar186 = vpaddd_avx(auVar186,auVar141);
                                auVar140 = vpslld_avx(auVar186,3);
                                auVar186._8_8_ = 0;
                                auVar186._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)auVar140._0_4_);
                                auVar176._8_8_ = 0;
                                auVar176._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)auVar140._4_4_);
                                auVar186 = vpunpcklwd_avx(auVar186,auVar176);
                                auVar177._8_8_ = 0;
                                auVar177._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)auVar140._12_4_);
                                auVar182._8_8_ = 0;
                                auVar182._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)auVar140._8_4_);
                                auVar140 = vpunpcklwd_avx(auVar182,auVar177);
                                auVar177 = vpunpckldq_avx(auVar186,auVar140);
                                auVar186 = vpunpckhdq_avx(auVar186,auVar140);
                                *pauVar64 = auVar177;
                                pauVar64[1] = auVar186;
                                pauVar64 = pauVar64 + 2;
                                uVar71 = (ulong)(iVar81 + 1);
                                iVar67 = iVar67 + -1;
                              }
                            }
                          }
                        }
                        for (; (int)(uVar120 | 1) < iVar92; uVar120 = uVar120 + 2) {
                          iVar67 = uVar120 + iVar78 + 1;
                          iVar94 = ((int)(uVar120 + iVar78) / (int)uVar91) * uVar121;
                          iVar81 = (iVar67 / (int)uVar91) * uVar121;
                          iVar87 = ((int)(uVar120 + iVar78) % (int)uVar91) * (int)local_518 + iVar94
                          ;
                          if (((int)local_518 == 1) && (iVar94 == iVar81)) {
                            if (local_488.elempack == 1) {
                              for (iVar67 = 0; iVar67 + 1 < iVar107; iVar67 = iVar67 + 2) {
                                uVar71 = (long)(iVar98 + iVar67) % (long)iVar53;
                                iVar81 = iVar98 + iVar67 + 1;
                                uVar90 = (long)iVar81 % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                uVar90 = (ulong)(uint)((int)uVar90 >> 0x1f) << 0x20 |
                                         uVar90 & 0xffffffff;
                                lVar59 = (long)((int)((long)uVar71 % (long)auVar130._0_4_) *
                                                auVar130._8_4_ +
                                                ((iVar98 + iVar67) / iVar53) * iVar74 + iVar87 +
                                               (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99);
                                lVar60 = (long)((int)((long)uVar90 % (long)auVar130._0_4_) *
                                                auVar130._8_4_ + (iVar81 / iVar53) * iVar74 + iVar87
                                               + (int)((long)uVar90 / (long)auVar130._0_4_) * iVar99
                                               );
                                (*pauVar64)[0] = *(undefined1 *)((long)local_488.data + lVar59);
                                (*pauVar64)[1] = *(undefined1 *)((long)local_488.data + lVar60);
                                (*pauVar64)[2] = *(undefined1 *)((long)local_488.data + lVar59 + 1);
                                (*pauVar64)[3] = *(undefined1 *)((long)local_488.data + lVar60 + 1);
                                pauVar64 = (undefined1 (*) [16])(*pauVar64 + 4);
                              }
                              for (; iVar67 < iVar107; iVar67 = iVar67 + 1) {
                                uVar71 = (long)(iVar98 + iVar67) % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                lVar59 = (long)((int)((long)uVar71 % (long)auVar130._0_4_) *
                                                auVar130._8_4_ +
                                                ((iVar98 + iVar67) / iVar53) * iVar74 + iVar87 +
                                               (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99);
                                (*pauVar64)[0] = *(undefined1 *)((long)local_488.data + lVar59);
                                (*pauVar64)[1] = *(undefined1 *)((long)local_488.data + lVar59 + 1);
                                pauVar64 = (undefined1 (*) [16])(*pauVar64 + 2);
                              }
                            }
                            uVar71 = uVar61;
                            iVar67 = iVar93;
                            if (local_488.elempack == 8) {
                              while (iVar67 != 0) {
                                iVar81 = (int)uVar71;
                                uVar71 = (ulong)(uint)((int)((long)iVar81 % (long)iVar53) >> 0x1f)
                                         << 0x20 | (long)iVar81 % (long)iVar53 & 0xffffffffU;
                                auVar137 = vpshufb_avx(*(undefined1 (*) [16])
                                                        ((long)local_488.data +
                                                        (long)((int)((long)uVar71 %
                                                                    (long)auVar130._0_4_) *
                                                               auVar130._8_4_ +
                                                               (iVar81 / iVar53) * iVar74 + iVar87 +
                                                              (int)((long)uVar71 /
                                                                   (long)auVar130._0_4_) * iVar99) *
                                                        8),_DAT_00539ba0);
                                *pauVar64 = auVar137;
                                pauVar64 = pauVar64 + 1;
                                uVar71 = (ulong)(iVar81 + 1);
                                iVar67 = iVar67 + -1;
                              }
                            }
                          }
                          else {
                            iVar81 = (iVar67 % (int)uVar91) * (int)local_518 + iVar81;
                            iVar67 = 0;
                            if (local_488.elempack == 1) {
                              for (iVar67 = 0; iVar67 + 1 < iVar107; iVar67 = iVar67 + 2) {
                                uVar71 = (long)(iVar98 + iVar67) % (long)iVar53;
                                iVar94 = iVar98 + iVar67 + 1;
                                uVar90 = (long)iVar94 % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                iVar110 = (int)((long)uVar71 % (long)auVar130._0_4_) *
                                          auVar130._8_4_ + ((iVar98 + iVar67) / iVar53) * iVar74 +
                                          (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99;
                                uVar71 = (ulong)(uint)((int)uVar90 >> 0x1f) << 0x20 |
                                         uVar90 & 0xffffffff;
                                iVar94 = (int)((long)uVar71 % (long)auVar130._0_4_) * auVar130._8_4_
                                         + (iVar94 / iVar53) * iVar74 +
                                         (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99;
                                (*pauVar64)[0] =
                                     *(undefined1 *)
                                      ((long)local_488.data + (long)(iVar110 + iVar87));
                                (*pauVar64)[1] =
                                     *(undefined1 *)((long)local_488.data + (long)(iVar94 + iVar87))
                                ;
                                (*pauVar64)[2] =
                                     *(undefined1 *)
                                      ((long)local_488.data + (long)(iVar110 + iVar81));
                                (*pauVar64)[3] =
                                     *(undefined1 *)((long)local_488.data + (long)(iVar94 + iVar81))
                                ;
                                pauVar64 = (undefined1 (*) [16])(*pauVar64 + 4);
                              }
                              for (; iVar67 < iVar107; iVar67 = iVar67 + 1) {
                                uVar71 = (long)(iVar98 + iVar67) % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                iVar94 = (int)((long)uVar71 % (long)auVar130._0_4_) * auVar130._8_4_
                                         + ((iVar98 + iVar67) / iVar53) * iVar74 +
                                         (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99;
                                (*pauVar64)[0] =
                                     *(undefined1 *)((long)local_488.data + (long)(iVar94 + iVar87))
                                ;
                                (*pauVar64)[1] =
                                     *(undefined1 *)((long)local_488.data + (long)(iVar94 + iVar81))
                                ;
                                pauVar64 = (undefined1 (*) [16])(*pauVar64 + 2);
                              }
                            }
                            if (local_488.elempack == 8) {
                              for (; iVar67 < iVar122; iVar67 = iVar67 + 1) {
                                iVar94 = (int)((long)iVar98 / 8) + iVar67;
                                uVar71 = (long)iVar94 % (long)iVar53;
                                uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                         uVar71 & 0xffffffff;
                                iVar94 = (int)((long)uVar71 % (long)auVar130._0_4_) * auVar130._8_4_
                                         + (iVar94 / iVar53) * iVar74 +
                                         (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99;
                                auVar154._8_8_ = 0;
                                auVar154._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)(iVar94 + iVar87) * 8);
                                auVar174._8_8_ = 0;
                                auVar174._0_8_ =
                                     *(ulong *)((long)local_488.data + (long)(iVar94 + iVar81) * 8);
                                auVar137 = vpunpcklwd_avx(auVar154,auVar174);
                                *pauVar64 = auVar137;
                                pauVar64 = pauVar64 + 1;
                              }
                            }
                          }
                        }
                        for (; (int)uVar120 < iVar92; uVar120 = uVar120 + 1) {
                          iVar122 = ((int)(iVar78 + uVar120) / (int)uVar91) * uVar121 +
                                    ((int)(iVar78 + uVar120) % (int)uVar91) * (int)local_518;
                          if (local_488.elempack == 1) {
                            for (lVar59 = 0; iVar67 = (int)lVar59, iVar67 + 1 < iVar107;
                                lVar59 = lVar59 + 2) {
                              uVar71 = (long)(iVar98 + iVar67) % (long)iVar53;
                              iVar81 = iVar98 + iVar67 + 1;
                              uVar90 = (long)iVar81 % (long)iVar53;
                              uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                       uVar71 & 0xffffffff;
                              uVar90 = (ulong)(uint)((int)uVar90 >> 0x1f) << 0x20 |
                                       uVar90 & 0xffffffff;
                              (*pauVar64)[lVar59] =
                                   *(undefined1 *)
                                    ((long)local_488.data +
                                    (long)((int)((long)uVar71 % (long)auVar130._0_4_) *
                                           auVar130._8_4_ +
                                           ((iVar98 + iVar67) / iVar53) * iVar74 + iVar122 +
                                          (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99));
                              (*pauVar64)[lVar59 + 1] =
                                   *(undefined1 *)
                                    ((long)local_488.data +
                                    (long)((int)((long)uVar90 % (long)auVar130._0_4_) *
                                           auVar130._8_4_ + (iVar81 / iVar53) * iVar74 + iVar122 +
                                          (int)((long)uVar90 / (long)auVar130._0_4_) * iVar99));
                            }
                            for (; (int)lVar59 < iVar107; lVar59 = lVar59 + 1) {
                              iVar67 = iVar98 + (int)lVar59;
                              uVar71 = (long)iVar67 % (long)iVar53;
                              uVar71 = (ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 |
                                       uVar71 & 0xffffffff;
                              (*pauVar64)[lVar59] =
                                   *(undefined1 *)
                                    ((long)local_488.data +
                                    (long)((int)((long)uVar71 % (long)auVar130._0_4_) *
                                           auVar130._8_4_ + (iVar67 / iVar53) * iVar74 + iVar122 +
                                          (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99));
                            }
                            pauVar64 = (undefined1 (*) [16])(*pauVar64 + lVar59);
                          }
                          uVar71 = uVar61;
                          iVar67 = iVar93;
                          if (local_488.elempack == 8) {
                            while (iVar67 != 0) {
                              iVar81 = (int)uVar71;
                              uVar71 = (ulong)(uint)((int)((long)iVar81 % (long)iVar53) >> 0x1f) <<
                                       0x20 | (long)iVar81 % (long)iVar53 & 0xffffffffU;
                              *(undefined8 *)*pauVar64 =
                                   *(undefined8 *)
                                    ((long)local_488.data +
                                    (long)((int)((long)uVar71 % (long)auVar130._0_4_) *
                                           auVar130._8_4_ + (iVar81 / iVar53) * iVar74 + iVar122 +
                                          (int)((long)uVar71 / (long)auVar130._0_4_) * iVar99) * 8);
                              pauVar64 = (undefined1 (*) [16])(*pauVar64 + 8);
                              uVar71 = (ulong)(iVar81 + 1);
                              iVar67 = iVar67 + -1;
                            }
                          }
                        }
                      }
                      else {
                        lVar69 = (long)(iVar98 / 8);
                        iVar93 = iVar107 / 8;
                        lVar59 = (long)(iVar74 * 8);
                        local_4f0 = (ulong)iVar98;
                        lVar60 = (long)iVar74;
                        lVar113 = (long)(iVar74 * 2);
                        if (iVar93 < 1) {
                          iVar93 = 0;
                        }
                        local_428 = (undefined1 (*) [16])(long)iVar78;
                        lVar62 = (long)iVar92;
                        piVar77 = (int *)(*local_428 + lVar60);
                        lVar66 = (long)local_428 * 8 + 0x10;
                        local_578 = *local_428 + (iVar74 + 3);
                        local_558 = *local_428 + (iVar74 + 2);
                        puVar108 = *local_428 + (iVar74 + 1);
                        lVar75 = (long)local_428 * 8 + 8;
                        pauVar64 = local_428;
                        pauVar82 = (undefined1 (*) [16])local_378.data;
                        for (uVar61 = 0; (long)(uVar61 | 7) < lVar62; uVar61 = uVar61 + 8) {
                          if (local_488.elempack == 8) {
                            pauVar54 = (undefined1 (*) [16])
                                       ((long)local_488.data +
                                       (long)(*local_428 + uVar61) * 8 +
                                       local_488.cstep * lVar69 * local_488.elemsize);
                            iVar92 = iVar93;
                            while (bVar125 = iVar92 != 0, iVar92 = iVar92 + -1, bVar125) {
                              auVar174 = vpunpcklwd_avx(*pauVar54,pauVar54[1]);
                              auVar137 = vpunpckhwd_avx(*pauVar54,pauVar54[1]);
                              auVar158 = vpunpcklwd_avx(pauVar54[2],pauVar54[3]);
                              auVar154 = vpunpckhwd_avx(pauVar54[2],pauVar54[3]);
                              auVar147 = vpunpcklwd_avx(auVar174,auVar137);
                              auVar137 = vpunpckhwd_avx(auVar174,auVar137);
                              auVar174 = vpunpcklwd_avx(auVar158,auVar154);
                              auVar154 = vpunpckhwd_avx(auVar158,auVar154);
                              auVar158 = vpunpcklqdq_avx(auVar147,auVar174);
                              auVar174 = vpunpckhqdq_avx(auVar147,auVar174);
                              auVar147 = vpunpcklqdq_avx(auVar137,auVar154);
                              auVar137 = vpunpckhqdq_avx(auVar137,auVar154);
                              *pauVar82 = auVar158;
                              pauVar82[1] = auVar174;
                              pauVar82[2] = auVar147;
                              pauVar82[3] = auVar137;
                              pauVar82 = pauVar82 + 4;
                              pauVar54 = (undefined1 (*) [16])(*pauVar54 + lVar59);
                            }
                          }
                          if (local_488.elempack == 1) {
                            lVar63 = local_488.cstep * local_4f0 * local_488.elemsize;
                            lVar65 = (long)local_488.data + (long)pauVar64;
                            lVar70 = (long)local_488.data + (long)piVar77;
                            for (iVar92 = 0; iVar92 + 1 < iVar107; iVar92 = iVar92 + 2) {
                              auVar126._8_8_ = 0;
                              auVar126._0_8_ = *(ulong *)(lVar65 + lVar63);
                              auVar133._8_8_ = 0;
                              auVar133._0_8_ = *(ulong *)(lVar70 + lVar63);
                              auVar137 = vpunpcklbw_avx(auVar126,auVar133);
                              *pauVar82 = auVar137;
                              pauVar82 = pauVar82 + 1;
                              lVar65 = lVar65 + lVar113;
                              lVar70 = lVar70 + lVar113;
                            }
                            puVar55 = (undefined8 *)(lVar65 + lVar63);
                            for (; iVar92 < iVar107; iVar92 = iVar92 + 1) {
                              *(undefined8 *)*pauVar82 = *puVar55;
                              pauVar82 = (undefined1 (*) [16])(*pauVar82 + 8);
                              puVar55 = (undefined8 *)((long)puVar55 + lVar60);
                            }
                          }
                          pauVar64 = (undefined1 (*) [16])(*pauVar64 + 8);
                          piVar77 = piVar77 + 2;
                          lVar66 = lVar66 + 0x40;
                          local_578 = local_578 + 8;
                          local_558 = local_558 + 8;
                          puVar108 = puVar108 + 8;
                          lVar75 = lVar75 + 0x40;
                        }
                        for (; (long)(uVar61 | 3) < lVar62; uVar61 = uVar61 + 4) {
                          if (local_488.elempack == 8) {
                            lVar65 = local_488.cstep * lVar69 * local_488.elemsize;
                            lVar63 = (long)local_488.data + lVar66;
                            iVar92 = iVar93;
                            while (bVar125 = iVar92 != 0, iVar92 = iVar92 + -1, bVar125) {
                              auVar137 = *(undefined1 (*) [16])(lVar63 + -0x10 + lVar65);
                              auVar154 = *(undefined1 (*) [16])(lVar63 + lVar65);
                              auVar174 = vpunpcklwd_avx(auVar137,auVar154);
                              auVar137 = vpunpckhwd_avx(auVar137,auVar154);
                              auVar154 = vpunpcklwd_avx(auVar174,auVar137);
                              auVar137 = vpunpckhwd_avx(auVar174,auVar137);
                              *pauVar82 = auVar154;
                              pauVar82[1] = auVar137;
                              pauVar82 = pauVar82 + 2;
                              lVar63 = lVar63 + lVar59;
                            }
                          }
                          if (local_488.elempack == 1) {
                            lVar63 = local_488.cstep * local_4f0 * local_488.elemsize;
                            lVar65 = (long)local_488.data + (long)pauVar64;
                            puVar100 = local_578 + (long)local_488.data;
                            puVar103 = (undefined1 *)((long)local_488.data + (long)local_558);
                            puVar111 = (undefined1 *)((long)local_488.data + (long)puVar108);
                            lVar70 = (long)local_488.data + (long)piVar77;
                            for (iVar92 = 1; iVar92 < iVar107; iVar92 = iVar92 + 2) {
                              (*pauVar82)[0] = *(undefined1 *)(lVar65 + lVar63);
                              (*pauVar82)[1] = *(undefined1 *)(lVar70 + lVar63);
                              (*pauVar82)[2] = *(undefined1 *)(lVar65 + 1 + lVar63);
                              (*pauVar82)[3] = puVar111[lVar63];
                              (*pauVar82)[4] = *(undefined1 *)(lVar65 + 2 + lVar63);
                              (*pauVar82)[5] = puVar103[lVar63];
                              (*pauVar82)[6] = *(undefined1 *)(lVar65 + 3 + lVar63);
                              (*pauVar82)[7] = puVar100[lVar63];
                              pauVar82 = (undefined1 (*) [16])(*pauVar82 + 8);
                              lVar65 = lVar65 + lVar113;
                              puVar100 = puVar100 + lVar113;
                              puVar103 = puVar103 + lVar113;
                              puVar111 = puVar111 + lVar113;
                              lVar70 = lVar70 + lVar113;
                            }
                            puVar103 = (undefined1 *)(lVar65 + lVar63);
                            for (iVar92 = iVar92 + -1; local_4d0 = piVar77, iVar92 < iVar107;
                                iVar92 = iVar92 + 1) {
                              (*pauVar82)[0] = *puVar103;
                              (*pauVar82)[1] = puVar103[1];
                              (*pauVar82)[2] = puVar103[2];
                              (*pauVar82)[3] = puVar103[3];
                              pauVar82 = (undefined1 (*) [16])(*pauVar82 + 4);
                              puVar103 = puVar103 + lVar60;
                            }
                          }
                          lVar66 = lVar66 + 0x20;
                          pauVar64 = (undefined1 (*) [16])(*pauVar64 + 4);
                          local_578 = local_578 + 4;
                          local_558 = local_558 + 4;
                          puVar108 = puVar108 + 4;
                          piVar77 = piVar77 + 1;
                          lVar75 = lVar75 + 0x20;
                        }
                        for (; (long)(uVar61 | 1) < lVar62; uVar61 = uVar61 + 2) {
                          if (local_488.elempack == 8) {
                            lVar66 = local_488.cstep * lVar69 * local_488.elemsize;
                            lVar65 = (long)local_488.data + lVar75;
                            iVar92 = iVar93;
                            while (bVar125 = iVar92 != 0, iVar92 = iVar92 + -1, bVar125) {
                              auVar127._8_8_ = 0;
                              auVar127._0_8_ = *(ulong *)(lVar65 + -8 + lVar66);
                              auVar134._8_8_ = 0;
                              auVar134._0_8_ = *(ulong *)(lVar65 + lVar66);
                              auVar137 = vpunpcklwd_avx(auVar127,auVar134);
                              *pauVar82 = auVar137;
                              pauVar82 = pauVar82 + 1;
                              lVar65 = lVar65 + lVar59;
                            }
                          }
                          if (local_488.elempack == 1) {
                            lVar65 = local_488.cstep * local_4f0 * local_488.elemsize;
                            lVar66 = (long)local_488.data + (long)pauVar64;
                            puVar103 = (undefined1 *)((long)local_488.data + (long)puVar108);
                            lVar63 = (long)local_488.data + (long)piVar77;
                            for (iVar92 = 0; iVar92 + 1 < iVar107; iVar92 = iVar92 + 2) {
                              (*pauVar82)[0] = *(undefined1 *)(lVar66 + lVar65);
                              (*pauVar82)[1] = *(undefined1 *)(lVar63 + lVar65);
                              (*pauVar82)[2] = *(undefined1 *)(lVar66 + 1 + lVar65);
                              (*pauVar82)[3] = puVar103[lVar65];
                              pauVar82 = (undefined1 (*) [16])(*pauVar82 + 4);
                              lVar66 = lVar66 + lVar113;
                              puVar103 = puVar103 + lVar113;
                              lVar63 = lVar63 + lVar113;
                            }
                            for (; iVar92 < iVar107; iVar92 = iVar92 + 1) {
                              (*pauVar82)[0] = *(undefined1 *)(lVar66 + lVar65);
                              (*pauVar82)[1] = *(undefined1 *)(lVar66 + 1 + lVar65);
                              pauVar82 = (undefined1 (*) [16])(*pauVar82 + 2);
                              lVar65 = lVar65 + lVar60;
                            }
                          }
                          lVar75 = lVar75 + 0x10;
                          pauVar64 = (undefined1 (*) [16])(*pauVar64 + 2);
                          puVar108 = puVar108 + 2;
                          piVar77 = (int *)((long)piVar77 + 2);
                        }
                        if (iVar107 < 1) {
                          iVar107 = 0;
                        }
                        for (; (long)uVar61 < lVar62; uVar61 = uVar61 + 1) {
                          if (local_488.elempack == 8) {
                            puVar55 = (undefined8 *)
                                      ((long)local_488.data +
                                      (long)(*local_428 + uVar61) * 8 +
                                      local_488.cstep * lVar69 * local_488.elemsize);
                            iVar92 = iVar93;
                            while (bVar125 = iVar92 != 0, iVar92 = iVar92 + -1, bVar125) {
                              *(undefined8 *)*pauVar82 = *puVar55;
                              pauVar82 = (undefined1 (*) [16])(*pauVar82 + 8);
                              puVar55 = (undefined8 *)((long)puVar55 + lVar59);
                            }
                          }
                          if (local_488.elempack == 1) {
                            puVar108 = (undefined1 *)
                                       ((long)local_488.data +
                                       (long)(*local_428 +
                                             uVar61 + local_488.cstep * local_4f0 *
                                                      local_488.elemsize));
                            iVar92 = iVar107;
                            while (bVar125 = iVar92 != 0, iVar92 = iVar92 + -1, bVar125) {
                              (*pauVar82)[0] = *puVar108;
                              pauVar82 = (undefined1 (*) [16])(*pauVar82 + 1);
                              puVar108 = puVar108 + lVar60;
                            }
                          }
                        }
                      }
                    }
                    else {
                      convolution_im2col_input_tile_int8_avx2
                                (&local_488,&local_378,iVar78,iVar92,iVar98,iVar107,auVar130._0_4_,
                                 (int)local_4f8,auVar130._8_4_,(int)local_520,(int)local_518,
                                 (int)local_4e0);
                    }
                  }
                  else {
                    convolution_im2col_input_tile_int8_avxvnni
                              (&local_488,&local_378,iVar78,iVar92,iVar98,iVar107,auVar130._0_4_,
                               (int)local_4f8,auVar130._8_4_,(int)local_520,(int)local_518,
                               (int)local_4e0);
                  }
                }
                else {
                  convolution_im2col_input_tile_int8_avxvnniint8
                            (&local_488,&local_378,iVar78,iVar92,iVar98,iVar107,auVar130._0_4_,
                             (int)local_4f8,auVar130._8_4_,(int)local_520,(int)local_518,
                             (int)local_4e0);
                }
                uVar61 = local_498;
                pOVar116 = local_4e8;
                piVar77 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
                if (piVar77 != (int *)0x0) {
                  LOCK();
                  *piVar77 = *piVar77 + -1;
                  UNLOCK();
                  if (*piVar77 == 0) {
                    if (local_378.allocator == (Allocator *)0x0) {
                      free(local_378.data);
                    }
                    else {
                      (*(local_378.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              local_378.cstep = 0;
              local_378.data = (void *)0x0;
              local_378.refcount._0_4_ = 0;
              local_378.refcount._4_4_ = 0;
              local_378.elemsize = 0;
              local_378.elempack = 0;
              local_378.allocator = (Allocator *)0x0;
              local_378.dims = 0;
              local_378.w = 0;
              local_378.h = 0;
              local_378.d = 0;
              local_378.c = 0;
              Mat::create(&local_378,TILE_M * TILE_N,1,iVar52,4,pOVar116->workspace_allocator);
              local_438 = 0xffffffffffffff9c;
              if ((local_378.data != (void *)0x0) && ((long)local_378.c * local_378.cstep != 0)) {
                local_438 = 0;
                auVar130._0_4_ = (int)local_4a0;
                if ((int)local_4a0 < 1) {
                  auVar130._0_4_ = 0;
                }
                local_4a0 = (undefined1 (*) [16])CONCAT44(local_4a0._4_4_,auVar130._0_4_);
                auVar130._0_4_ = 0;
                uVar71 = local_4c0;
                while (auVar130._0_4_ != (int)local_4a0) {
                  local_518 = CONCAT44(local_518._4_4_,auVar130._0_4_);
                  local_520 = CONCAT44(local_520._4_4_,TILE_M * auVar130._0_4_);
                  auVar130._0_4_ = (int)uVar61 - TILE_M * auVar130._0_4_;
                  if (TILE_M < auVar130._0_4_) {
                    auVar130._0_4_ = TILE_M;
                  }
                  local_508 = CONCAT44(local_508._4_4_,auVar130._0_4_);
                  auVar130._0_4_ = get_omp_thread_num();
                  m.data = (void *)((long)auVar130._0_4_ * local_378.cstep * local_378.elemsize +
                                   (long)local_378.data);
                  m.refcount._0_4_ = 0;
                  m.refcount._4_4_ = 0;
                  m.elemsize = local_378.elemsize;
                  m.elempack = local_378.elempack;
                  m.allocator = local_378.allocator;
                  m.w = local_378.w;
                  m.h = local_378.h;
                  m.d = 1;
                  m.c = local_378.d;
                  m.dims = local_378.dims + -1;
                  m.cstep = (local_378.elemsize * (long)local_378.h * (long)local_378.w + 0xf &
                            0xfffffffffffffff0) / local_378.elemsize;
                  if (local_378.dims == 4) {
                    m.cstep = (long)local_378.h * (long)local_378.w;
                  }
                  lVar59 = (long)(int)local_520;
                  local_4b8._0_8_ = (long)(int)local_508;
                  local_500 = lVar59 * 4 + 4;
                  for (auVar130._0_4_ = 0; uVar61 = local_498,
                      iVar52 = (int)pvVar105 - auVar130._0_4_,
                      iVar52 != 0 && auVar130._0_4_ <= (int)pvVar105;
                      auVar130._0_4_ = auVar130._0_4_ + TILE_N) {
                    if (TILE_N < iVar52) {
                      iVar52 = TILE_N;
                    }
                    for (iVar53 = 0; iVar80 = (int)uVar71 - iVar53,
                        iVar80 != 0 && iVar53 <= (int)uVar71; iVar53 = iVar53 + TILE_K) {
                      if (TILE_K < iVar80) {
                        iVar80 = TILE_K;
                      }
                      m_1.w = (this->weight_sgemm_data).w;
                      m_1.cstep = (size_t)m_1.w;
                      m_1.elemsize = (this->weight_sgemm_data).elemsize;
                      m_1.elempack = (this->weight_sgemm_data).elempack;
                      m_1.allocator = (this->weight_sgemm_data).allocator;
                      m_1.data = (void *)((long)(this->weight_sgemm_data).data +
                                         m_1.elemsize * m_1.cstep * (long)(iVar53 / TILE_K) +
                                         (long)((int)local_520 / TILE_M) *
                                         (this->weight_sgemm_data).cstep * m_1.elemsize);
                      m_1.refcount = (int *)0x0;
                      m_1.dims = 2;
                      m_1.h = 1;
                      m_1.d = 1;
                      m_1.c = 1;
                      local_290.cstep = (size_t)(int)opt_q._44_4_;
                      local_290.elemsize =
                           CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_)
                      ;
                      local_290.data =
                           (void *)(local_290.cstep * local_290.elemsize * (long)(iVar53 / TILE_K) +
                                   (long)(auVar130._0_4_ / TILE_N) * local_208 * local_290.elemsize
                                   + opt_q._0_8_);
                      local_290.refcount = (int *)0x0;
                      local_290.elempack = opt_q.openmp_blocktime;
                      local_290.allocator = (Allocator *)opt_q._32_8_;
                      local_290.w._0_1_ = opt_q.use_reserved_1;
                      local_290.w._1_1_ = opt_q.use_image_storage;
                      local_290.w._2_1_ = opt_q.use_tensor_storage;
                      local_290.w._3_1_ = opt_q.use_reserved_2;
                      local_290.h = 1;
                      local_290.d = 1;
                      local_290.dims = m_1.dims;
                      local_290.c = m_1.c;
                      Gemm_x86_avx_utility::gemm_transB_packed_tile_int8
                                (&m_1,&local_290,&m,(int)local_520,(int)local_508,auVar130._0_4_,
                                 iVar52,iVar53,iVar80);
                      if (local_290.refcount != (int *)0x0) {
                        LOCK();
                        *local_290.refcount = *local_290.refcount + -1;
                        UNLOCK();
                        if (*local_290.refcount == 0) {
                          if (local_290.allocator == (Allocator *)0x0) {
                            free(local_290.data);
                          }
                          else {
                            (*(local_290.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      if (m_1.refcount != (int *)0x0) {
                        LOCK();
                        *m_1.refcount = *m_1.refcount + -1;
                        UNLOCK();
                        if (*m_1.refcount == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            free(m_1.data);
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                    }
                    iVar53 = cpu_support_x86_avx2();
                    if (iVar53 == 0) {
                      local_4d0 = (int *)(long)(local_418.elempack * auVar130._0_4_);
                      iVar53 = (int)local_418.cstep;
                      lVar60 = (long)iVar53;
                      lVar69 = (long)(iVar53 * 2);
                      lVar123 = (long)(local_418.cstep * 0x300000000) >> 0x20;
                      lVar63 = (long)(iVar53 * 4);
                      lVar66 = (long)(local_418.cstep * 0x500000000) >> 0x20;
                      lVar75 = (long)(local_418.cstep * 0x600000000) >> 0x20;
                      lVar65 = (long)(local_418.cstep * 0x700000000) >> 0x20;
                      lVar70 = (long)(iVar53 + 1);
                      lVar113 = (long)(iVar53 * 3 + 1);
                      lVar62 = (long)(iVar52 * 4) * 4;
                      local_428 = (undefined1 (*) [16])(lVar60 * 0x20);
                      local_4f8 = (ulong)auVar130._0_4_;
                      local_530 = (undefined1 *)(lVar59 * 4 * lVar60 + local_4f8 * 4);
                      local_560 = (undefined1 *)(local_500 * lVar60 + local_4f8 * 4 + 0x10);
                      local_558 = (undefined1 *)(local_500 * lVar60 + local_4f8 * 4);
                      local_570 = local_530 + lVar70 * 4;
                      uVar61 = 0;
                      pauVar83 = (undefined1 (*) [32])m.data;
                      while (uVar71 = uVar61, (long)(uVar71 | 7) < (long)local_4b8._0_8_) {
                        pauVar68 = (undefined1 (*) [32])
                                   ((long)local_418.data +
                                   (long)local_4d0 * 4 + (lVar59 + uVar71) * lVar60 * 4);
                        for (iVar80 = 0; iVar80 + 7 < iVar52; iVar80 = iVar80 + 8) {
                          auVar183._16_16_ = SUB3216(*(undefined1 (*) [32])(*pauVar83 + lVar62),0);
                          auVar183._0_16_ = SUB3216(*pauVar83,0);
                          auVar190._16_16_ = SUB3216(*(undefined1 (*) [32])(pauVar83[1] + lVar62),0)
                          ;
                          auVar190._0_16_ = SUB3216(pauVar83[1],0);
                          auVar198._16_16_ = SUB3216(*(undefined1 (*) [32])(pauVar83[2] + lVar62),0)
                          ;
                          auVar198._0_16_ = SUB3216(pauVar83[2],0);
                          auVar198 = vshufps_avx(auVar198,auVar198,0x93);
                          auVar204._16_16_ = SUB3216(*(undefined1 (*) [32])(pauVar83[3] + lVar62),0)
                          ;
                          auVar204._0_16_ = SUB3216(pauVar83[3],0);
                          auVar204 = vshufps_avx(auVar204,auVar204,0x93);
                          auVar160 = vperm2f128_avx(*pauVar83,
                                                    *(undefined1 (*) [32])(*pauVar83 + lVar62),0x31)
                          ;
                          auVar143 = vperm2f128_avx(pauVar83[1],
                                                    *(undefined1 (*) [32])(pauVar83[1] + lVar62),
                                                    0x31);
                          auVar159 = vperm2f128_avx(pauVar83[2],
                                                    *(undefined1 (*) [32])(pauVar83[2] + lVar62),
                                                    0x31);
                          auVar159 = vshufps_avx(auVar159,auVar159,0x93);
                          auVar167 = vperm2f128_avx(pauVar83[3],
                                                    *(undefined1 (*) [32])(pauVar83[3] + lVar62),
                                                    0x31);
                          auVar167 = vshufps_avx(auVar167,auVar167,0x93);
                          auVar200 = vunpcklps_avx(auVar183,auVar204);
                          auVar206 = vunpcklps_avx(auVar190,auVar198);
                          auVar190 = vunpckhps_avx(auVar190,auVar198);
                          auVar204 = vunpckhps_avx(auVar183,auVar204);
                          auVar184 = vunpcklps_avx(auVar160,auVar167);
                          auVar191 = vunpcklps_avx(auVar143,auVar159);
                          auVar143 = vunpckhps_avx(auVar143,auVar159);
                          auVar167 = vunpckhps_avx(auVar160,auVar167);
                          auVar160 = vunpcklpd_avx(auVar200,auVar206);
                          auVar183 = vunpcklpd_avx(auVar190,auVar204);
                          auVar168 = vunpcklpd_avx(auVar184,auVar191);
                          auVar192 = vunpcklpd_avx(auVar143,auVar167);
                          auVar198 = vshufps_avx(auVar200,auVar206,0xbe);
                          auVar198 = vshufps_avx(auVar198,auVar198,0xd2);
                          auVar204 = vshufps_avx(auVar190,auVar204,0xbe);
                          auVar204 = vshufps_avx(auVar204,auVar204,0xd2);
                          auVar159 = vshufps_avx(auVar184,auVar191,0xbe);
                          auVar159 = vshufps_avx(auVar159,auVar159,0xd2);
                          auVar167 = vshufps_avx(auVar143,auVar167,0xbe);
                          auVar167 = vshufps_avx(auVar167,auVar167,0xd2);
                          if (local_418.elempack == 1) {
                            auVar200 = vunpcklps_avx(auVar160,auVar198);
                            auVar190 = vunpckhps_avx(auVar160,auVar198);
                            auVar198 = vunpcklps_avx(auVar183,auVar204);
                            auVar204 = vunpckhps_avx(auVar183,auVar204);
                            auVar206 = vunpcklps_avx(auVar168,auVar159);
                            auVar143 = vunpckhps_avx(auVar168,auVar159);
                            auVar159 = vunpcklps_avx(auVar192,auVar167);
                            auVar167 = vunpckhps_avx(auVar192,auVar167);
                            auVar160 = vunpcklpd_avx(auVar200,auVar198);
                            auVar198 = vunpckhpd_avx(auVar200,auVar198);
                            auVar183 = vunpcklpd_avx(auVar190,auVar204);
                            auVar204 = vunpckhpd_avx(auVar190,auVar204);
                            auVar190 = vunpcklpd_avx(auVar206,auVar159);
                            auVar159 = vunpckhpd_avx(auVar206,auVar159);
                            auVar168 = vunpcklpd_avx(auVar143,auVar167);
                            auVar167 = vunpckhpd_avx(auVar143,auVar167);
                            auVar143._16_16_ = auVar190._0_16_;
                            auVar143._0_16_ = auVar160._0_16_;
                            auVar192._16_16_ = auVar159._0_16_;
                            auVar192._0_16_ = auVar198._0_16_;
                            auVar200._16_16_ = auVar168._0_16_;
                            auVar200._0_16_ = auVar183._0_16_;
                            auVar206._16_16_ = auVar167._0_16_;
                            auVar206._0_16_ = auVar204._0_16_;
                            auVar190 = vperm2f128_avx(auVar160,auVar190,0x31);
                            auVar198 = vperm2f128_avx(auVar198,auVar159,0x31);
                            auVar159 = vperm2f128_avx(auVar183,auVar168,0x31);
                            auVar204 = vperm2f128_avx(auVar204,auVar167,0x31);
                            *pauVar68 = auVar143;
                            *(undefined1 (*) [32])(*pauVar68 + lVar60 * 4) = auVar192;
                            *(undefined1 (*) [32])(*pauVar68 + lVar69 * 4) = auVar200;
                            *(undefined1 (*) [32])(*pauVar68 + lVar123 * 4) = auVar206;
                            *(undefined1 (*) [32])(*pauVar68 + lVar63 * 4) = auVar190;
                            *(undefined1 (*) [32])(*pauVar68 + lVar66 * 4) = auVar198;
                            *(undefined1 (*) [32])(*pauVar68 + lVar75 * 4) = auVar159;
                            *(undefined1 (*) [32])(*pauVar68 + lVar65 * 4) = auVar204;
                            pauVar68 = pauVar68 + 1;
                          }
                          else if (local_418.elempack == 4) {
                            auVar184._16_16_ = auVar198._0_16_;
                            auVar184._0_16_ = auVar160._0_16_;
                            auVar191._16_16_ = auVar204._0_16_;
                            auVar191._0_16_ = auVar183._0_16_;
                            auVar199._16_16_ = auVar159._0_16_;
                            auVar199._0_16_ = auVar168._0_16_;
                            auVar205._16_16_ = auVar167._0_16_;
                            auVar205._0_16_ = auVar192._0_16_;
                            auVar198 = vperm2f128_avx(auVar160,auVar198,0x31);
                            auVar204 = vperm2f128_avx(auVar183,auVar204,0x31);
                            auVar159 = vperm2f128_avx(auVar168,auVar159,0x31);
                            auVar167 = vperm2f128_avx(auVar192,auVar167,0x31);
                            *pauVar68 = auVar184;
                            pauVar68[1] = auVar191;
                            pauVar68[2] = auVar199;
                            pauVar68[3] = auVar205;
                            *(undefined1 (*) [32])(*pauVar68 + lVar63 * 4) = auVar198;
                            *(undefined1 (*) [32])(pauVar68[1] + lVar63 * 4) = auVar204;
                            *(undefined1 (*) [32])(pauVar68[2] + lVar63 * 4) = auVar159;
                            *(undefined1 (*) [32])(pauVar68[3] + lVar63 * 4) = auVar167;
                            pauVar68 = pauVar68 + 4;
                          }
                          else if (local_418.elempack == 8) {
                            *pauVar68 = auVar160;
                            pauVar68[1] = auVar198;
                            pauVar68[2] = auVar183;
                            pauVar68[3] = auVar204;
                            pauVar68[4] = auVar168;
                            pauVar68[5] = auVar159;
                            pauVar68[6] = auVar192;
                            pauVar68[7] = auVar167;
                            pauVar68 = pauVar68 + 8;
                          }
                          pauVar83 = pauVar83 + 4;
                        }
                        for (; iVar80 + 3 < iVar52; iVar80 = iVar80 + 4) {
                          auVar159._16_16_ = SUB3216(*(undefined1 (*) [32])(*pauVar83 + lVar62),0);
                          auVar159._0_16_ = SUB3216(*pauVar83,0);
                          auVar167._16_16_ = SUB3216(*(undefined1 (*) [32])(pauVar83[1] + lVar62),0)
                          ;
                          auVar167._0_16_ = SUB3216(pauVar83[1],0);
                          auVar198 = vperm2f128_avx(*pauVar83,
                                                    *(undefined1 (*) [32])(*pauVar83 + lVar62),0x31)
                          ;
                          auVar198 = vshufps_avx(auVar198,auVar198,0x93);
                          auVar204 = vperm2f128_avx(pauVar83[1],
                                                    *(undefined1 (*) [32])(pauVar83[1] + lVar62),
                                                    0x31);
                          auVar204 = vshufps_avx(auVar204,auVar204,0x93);
                          auVar143 = vunpcklps_avx(auVar159,auVar204);
                          auVar204 = vunpckhps_avx(auVar159,auVar204);
                          auVar160 = vunpcklps_avx(auVar167,auVar198);
                          auVar159 = vunpckhps_avx(auVar167,auVar198);
                          auVar167 = vunpcklpd_avx(auVar143,auVar160);
                          auVar190 = vunpcklpd_avx(auVar159,auVar204);
                          auVar198 = vshufps_avx(auVar143,auVar160,0xbe);
                          auVar198 = vshufps_avx(auVar198,auVar198,0xd2);
                          auVar204 = vshufps_avx(auVar159,auVar204,0xbe);
                          auVar204 = vshufps_avx(auVar204,auVar204,0xd2);
                          if (local_418.elempack == 1) {
                            auVar143 = vunpcklps_avx(auVar167,auVar198);
                            auVar159 = vunpckhps_avx(auVar167,auVar198);
                            auVar198 = vunpcklps_avx(auVar190,auVar204);
                            auVar204 = vunpckhps_avx(auVar190,auVar204);
                            auVar167 = vunpcklpd_avx(auVar143,auVar198);
                            auVar198 = vunpckhpd_avx(auVar143,auVar198);
                            auVar190 = vunpcklpd_avx(auVar159,auVar204);
                            auVar204 = vunpckhpd_avx(auVar159,auVar204);
                            *(undefined1 (*) [16])*pauVar68 = auVar167._0_16_;
                            *(undefined1 (*) [16])(*pauVar68 + lVar60 * 4) = auVar198._0_16_;
                            *(undefined1 (*) [16])(*pauVar68 + lVar69 * 4) = auVar190._0_16_;
                            *(undefined1 (*) [16])(*pauVar68 + lVar123 * 4) = auVar204._0_16_;
                            *(undefined1 (*) [16])(*pauVar68 + lVar63 * 4) = auVar167._16_16_;
                            *(undefined1 (*) [16])(*pauVar68 + lVar66 * 4) = auVar198._16_16_;
                            *(undefined1 (*) [16])(*pauVar68 + lVar75 * 4) = auVar190._16_16_;
                            *(undefined1 (*) [16])(*pauVar68 + lVar65 * 4) = auVar204._16_16_;
                            pauVar68 = (undefined1 (*) [32])(*pauVar68 + 0x10);
                          }
                          else if (local_418.elempack == 4) {
                            auVar160._16_16_ = auVar198._0_16_;
                            auVar160._0_16_ = auVar167._0_16_;
                            auVar168._16_16_ = auVar204._0_16_;
                            auVar168._0_16_ = auVar190._0_16_;
                            auVar198 = vperm2f128_avx(auVar167,auVar198,0x31);
                            auVar204 = vperm2f128_avx(auVar190,auVar204,0x31);
                            *pauVar68 = auVar160;
                            pauVar68[1] = auVar168;
                            *(undefined1 (*) [32])(*pauVar68 + lVar63 * 4) = auVar198;
                            *(undefined1 (*) [32])(pauVar68[1] + lVar63 * 4) = auVar204;
                            pauVar68 = pauVar68 + 2;
                          }
                          else if (local_418.elempack == 8) {
                            *pauVar68 = auVar167;
                            pauVar68[1] = auVar198;
                            pauVar68[2] = auVar190;
                            pauVar68[3] = auVar204;
                            pauVar68 = pauVar68 + 4;
                          }
                          pauVar83 = pauVar83 + 2;
                        }
                        pauVar117 = (undefined1 (*) [32])(*pauVar83 + lVar62);
                        for (; iVar80 + 1 < iVar52; iVar80 = iVar80 + 2) {
                          auVar149._16_16_ = SUB3216(*pauVar117,0);
                          auVar149._0_16_ = SUB3216(*pauVar83,0);
                          auVar204 = vperm2f128_avx(*pauVar83,*pauVar117,0x31);
                          auVar198 = vblendps_avx(auVar149,auVar204,0xaa);
                          auVar204 = vblendps_avx(auVar204,auVar149,0xaa);
                          auVar137 = auVar198._0_16_;
                          auVar154 = auVar198._16_16_;
                          auVar174 = auVar204._0_16_;
                          if (local_418.elempack == 1) {
                            auVar158 = vunpcklps_avx(auVar137,auVar174);
                            uVar3 = vmovlps_avx(auVar158);
                            *(undefined8 *)*pauVar68 = uVar3;
                            uVar73 = vextractps_avx(auVar137,1);
                            *(undefined4 *)(*pauVar68 + lVar60 * 4) = uVar73;
                            uVar73 = vextractps_avx(auVar174,1);
                            *(undefined4 *)(*pauVar68 + lVar70 * 4) = uVar73;
                            uVar73 = vextractps_avx(auVar137,2);
                            *(undefined4 *)(*pauVar68 + lVar69 * 4) = uVar73;
                            uVar73 = vextractps_avx(auVar174,2);
                            *(undefined4 *)(*pauVar68 + (long)(iVar53 * 2 + 1) * 4) = uVar73;
                            uVar73 = vextractps_avx(auVar137,3);
                            *(undefined4 *)(*pauVar68 + (long)(iVar53 * 3) * 4) = uVar73;
                            uVar73 = vextractps_avx(auVar174,3);
                            *(undefined4 *)(*pauVar68 + lVar113 * 4) = uVar73;
                            auVar174 = auVar204._16_16_;
                            auVar137 = vunpcklps_avx(auVar154,auVar174);
                            uVar3 = vmovlps_avx(auVar137);
                            *(undefined8 *)(*pauVar68 + lVar63 * 4) = uVar3;
                            uVar73 = vextractps_avx(auVar154,1);
                            *(undefined4 *)(*pauVar68 + (long)(iVar53 * 5) * 4) = uVar73;
                            uVar73 = vextractps_avx(auVar174,1);
                            *(undefined4 *)(*pauVar68 + (long)(iVar53 * 5 + 1) * 4) = uVar73;
                            auVar137 = vunpckhps_avx(auVar154,auVar174);
                            uVar3 = vmovlps_avx(auVar137);
                            *(undefined8 *)(*pauVar68 + lVar75 * 4) = uVar3;
                            uVar73 = vextractps_avx(auVar154,3);
                            *(undefined4 *)(*pauVar68 + (long)(iVar53 * 7) * 4) = uVar73;
                            uVar73 = vextractps_avx(auVar174,3);
                            *(undefined4 *)(*pauVar68 + (long)(iVar53 * 7 + 1) * 4) = uVar73;
                            pauVar68 = (undefined1 (*) [32])(*pauVar68 + 8);
                          }
                          else if (local_418.elempack == 4) {
                            auVar150._16_16_ = auVar174;
                            auVar150._0_16_ = auVar137;
                            auVar198 = vperm2f128_avx(auVar198,auVar204,0x31);
                            *pauVar68 = auVar150;
                            *(undefined1 (*) [32])(*pauVar68 + lVar63 * 4) = auVar198;
                            pauVar68 = pauVar68 + 1;
                          }
                          else if (local_418.elempack == 8) {
                            *pauVar68 = auVar198;
                            pauVar68[1] = auVar204;
                            pauVar68 = pauVar68 + 2;
                          }
                          pauVar83 = pauVar83 + 1;
                          pauVar117 = pauVar117 + 1;
                        }
                        lVar112 = 0;
                        for (; iVar80 < iVar52; iVar80 = iVar80 + 1) {
                          auVar137 = *(undefined1 (*) [16])(*pauVar83 + lVar112);
                          auVar154 = *(undefined1 (*) [16])(*pauVar117 + lVar112);
                          if (local_418.elempack == 1) {
                            *(int *)*pauVar68 = auVar137._0_4_;
                            uVar73 = vextractps_avx(auVar137,1);
                            *(undefined4 *)(*pauVar68 + lVar60 * 4) = uVar73;
                            uVar73 = vextractps_avx(auVar137,2);
                            *(undefined4 *)(*pauVar68 + lVar69 * 4) = uVar73;
                            uVar73 = vextractps_avx(auVar137,3);
                            *(undefined4 *)(*pauVar68 + lVar123 * 4) = uVar73;
                            *(int *)(*pauVar68 + lVar63 * 4) = auVar154._0_4_;
                            uVar73 = vextractps_avx(auVar154,1);
                            *(undefined4 *)(*pauVar68 + lVar66 * 4) = uVar73;
                            uVar73 = vextractps_avx(auVar154,2);
                            *(undefined4 *)(*pauVar68 + lVar75 * 4) = uVar73;
                            uVar73 = vextractps_avx(auVar154,3);
                            *(undefined4 *)(*pauVar68 + lVar65 * 4) = uVar73;
                            pauVar68 = (undefined1 (*) [32])(*pauVar68 + 4);
                          }
                          else if (local_418.elempack == 4) {
                            *(undefined1 (*) [16])*pauVar68 = auVar137;
                            *(undefined1 (*) [16])(*pauVar68 + lVar63 * 4) = auVar154;
                            pauVar68 = (undefined1 (*) [32])(*pauVar68 + 0x10);
                          }
                          else if (local_418.elempack == 8) {
                            *(undefined1 (*) [16])(*pauVar68 + 0x10) = auVar154;
                            *(undefined1 (*) [16])*pauVar68 = auVar137;
                            pauVar68 = pauVar68 + 1;
                          }
                          lVar112 = lVar112 + 0x10;
                        }
                        pauVar83 = (undefined1 (*) [32])(*pauVar117 + lVar112);
                        local_560 = *local_428 + (long)local_560;
                        local_530 = *local_428 + (long)local_530;
                        local_558 = *local_428 + (long)local_558;
                        local_570 = *local_428 + (long)local_570;
                        local_4f0 = uVar71;
                        uVar61 = uVar71 + 8;
                      }
                      lVar66 = lVar60 * 0x10;
                      for (; (long)(uVar71 | 3) < (long)local_4b8._0_8_; uVar71 = uVar71 + 4) {
                        pauVar64 = (undefined1 (*) [16])
                                   ((long)local_418.data +
                                   (long)local_4d0 * 4 + (lVar59 + uVar71) * lVar60 * 4);
                        for (iVar80 = 0; iVar80 + 7 < iVar52; iVar80 = iVar80 + 8) {
                          auVar137 = vpshufd_avx(*(undefined1 (*) [16])pauVar83[2],0x93);
                          auVar154 = vpshufd_avx(*(undefined1 (*) [16])(pauVar83[2] + 0x10),0x93);
                          auVar174 = vpshufd_avx(*(undefined1 (*) [16])pauVar83[3],0x93);
                          auVar158 = vpshufd_avx(*(undefined1 (*) [16])(pauVar83[3] + 0x10),0x93);
                          auVar186 = vpunpckldq_avx(*(undefined1 (*) [16])*pauVar83,auVar174);
                          auVar174 = vpunpckhdq_avx(*(undefined1 (*) [16])*pauVar83,auVar174);
                          auVar140 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar83 + 0x10),
                                                    auVar158);
                          auVar158 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar83 + 0x10),
                                                    auVar158);
                          auVar177 = vpunpckldq_avx(*(undefined1 (*) [16])pauVar83[1],auVar137);
                          auVar147 = vpunpckhdq_avx(*(undefined1 (*) [16])pauVar83[1],auVar137);
                          auVar176 = vpunpckldq_avx(*(undefined1 (*) [16])(pauVar83[1] + 0x10),
                                                    auVar154);
                          auVar141 = vpunpckhdq_avx(*(undefined1 (*) [16])(pauVar83[1] + 0x10),
                                                    auVar154);
                          auVar182 = vpunpcklqdq_avx(auVar186,auVar177);
                          auVar178 = vpunpcklqdq_avx(auVar147,auVar174);
                          auVar181 = vpunpcklqdq_avx(auVar140,auVar176);
                          auVar187 = vpunpcklqdq_avx(auVar141,auVar158);
                          auVar137 = vpunpckhdq_avx(auVar186,auVar177);
                          auVar137 = vpshufd_avx(auVar137,99);
                          auVar154 = vpunpckhdq_avx(auVar147,auVar174);
                          auVar154 = vpshufd_avx(auVar154,99);
                          auVar174 = vpunpckhdq_avx(auVar140,auVar176);
                          auVar174 = vpshufd_avx(auVar174,99);
                          auVar158 = vpunpckhdq_avx(auVar141,auVar158);
                          auVar158 = vpshufd_avx(auVar158,99);
                          if (local_418.elempack == 1) {
                            auVar147 = vpunpckldq_avx(auVar182,auVar137);
                            auVar137 = vpunpckhdq_avx(auVar182,auVar137);
                            auVar141 = vpunpckldq_avx(auVar178,auVar154);
                            auVar154 = vpunpckhdq_avx(auVar178,auVar154);
                            auVar140 = vpunpcklqdq_avx(auVar147,auVar141);
                            auVar147 = vpunpckhqdq_avx(auVar147,auVar141);
                            auVar177 = vpunpcklqdq_avx(auVar137,auVar154);
                            auVar141 = vpunpckhqdq_avx(auVar137,auVar154);
                            auVar186 = vpunpckldq_avx(auVar181,auVar174);
                            auVar137 = vpunpckhdq_avx(auVar181,auVar174);
                            auVar174 = vpunpckldq_avx(auVar187,auVar158);
                            auVar154 = vpunpckhdq_avx(auVar187,auVar158);
                            auVar158 = vpunpcklqdq_avx(auVar186,auVar174);
                            auVar174 = vpunpckhqdq_avx(auVar186,auVar174);
                            auVar186 = vpunpcklqdq_avx(auVar137,auVar154);
                            auVar137 = vpunpckhqdq_avx(auVar137,auVar154);
                            *pauVar64 = auVar140;
                            pauVar64[1] = auVar158;
                            *(undefined1 (*) [16])(*pauVar64 + lVar60 * 4) = auVar147;
                            *(undefined1 (*) [16])(pauVar64[1] + lVar60 * 4) = auVar174;
                            *(undefined1 (*) [16])(*pauVar64 + lVar69 * 4) = auVar177;
                            *(undefined1 (*) [16])(pauVar64[1] + lVar69 * 4) = auVar186;
                            *(undefined1 (*) [16])(*pauVar64 + lVar123 * 4) = auVar141;
                            *(undefined1 (*) [16])(pauVar64[1] + lVar123 * 4) = auVar137;
                            pauVar64 = pauVar64 + 2;
                          }
                          else if (local_418.elempack == 4) {
                            *pauVar64 = auVar182;
                            pauVar64[1] = auVar137;
                            pauVar64[2] = auVar178;
                            pauVar64[3] = auVar154;
                            pauVar64[4] = auVar181;
                            pauVar64[5] = auVar174;
                            pauVar64[6] = auVar187;
                            pauVar64[7] = auVar158;
                            pauVar64 = pauVar64 + 8;
                          }
                          pauVar83 = pauVar83 + 4;
                        }
                        for (; iVar80 + 3 < iVar52; iVar80 = iVar80 + 4) {
                          auVar137 = vpshufd_avx(*(undefined1 (*) [16])(*pauVar83 + 0x10),0x93);
                          auVar154 = vpshufd_avx(*(undefined1 (*) [16])(pauVar83[1] + 0x10),0x93);
                          auVar158 = vpunpckldq_avx(*(undefined1 (*) [16])*pauVar83,auVar154);
                          auVar154 = vpunpckhdq_avx(*(undefined1 (*) [16])*pauVar83,auVar154);
                          auVar147 = vpunpckldq_avx(*(undefined1 (*) [16])pauVar83[1],auVar137);
                          auVar174 = vpunpckhdq_avx(*(undefined1 (*) [16])pauVar83[1],auVar137);
                          auVar141 = vpunpcklqdq_avx(auVar158,auVar147);
                          auVar186 = vpunpcklqdq_avx(auVar174,auVar154);
                          auVar137 = vpunpckhdq_avx(auVar158,auVar147);
                          auVar137 = vpshufd_avx(auVar137,99);
                          auVar154 = vpunpckhdq_avx(auVar174,auVar154);
                          auVar154 = vpshufd_avx(auVar154,99);
                          if (local_418.elempack == 1) {
                            auVar174 = vpunpckldq_avx(auVar141,auVar137);
                            auVar137 = vpunpckhdq_avx(auVar141,auVar137);
                            auVar158 = vpunpckldq_avx(auVar186,auVar154);
                            auVar154 = vpunpckhdq_avx(auVar186,auVar154);
                            auVar147 = vpunpcklqdq_avx(auVar174,auVar158);
                            auVar174 = vpunpckhqdq_avx(auVar174,auVar158);
                            auVar158 = vpunpcklqdq_avx(auVar137,auVar154);
                            auVar137 = vpunpckhqdq_avx(auVar137,auVar154);
                            *pauVar64 = auVar147;
                            *(undefined1 (*) [16])(*pauVar64 + lVar60 * 4) = auVar174;
                            *(undefined1 (*) [16])(*pauVar64 + lVar69 * 4) = auVar158;
                            *(undefined1 (*) [16])(*pauVar64 + lVar123 * 4) = auVar137;
                            pauVar64 = pauVar64 + 1;
                          }
                          else if (local_418.elempack == 4) {
                            *pauVar64 = auVar141;
                            pauVar64[1] = auVar137;
                            pauVar64[2] = auVar186;
                            pauVar64[3] = auVar154;
                            pauVar64 = pauVar64 + 4;
                          }
                          pauVar83 = pauVar83 + 2;
                        }
                        for (; iVar80 + 1 < iVar52; iVar80 = iVar80 + 2) {
                          auVar137 = *(undefined1 (*) [16])*pauVar83;
                          auVar154 = *(undefined1 (*) [16])(*pauVar83 + 0x10);
                          if (local_418.elempack == 1) {
                            auVar174 = vpunpckldq_avx(auVar137,auVar154);
                            *(long *)*pauVar64 = auVar174._0_8_;
                            *(int *)(*pauVar64 + lVar60 * 4) = auVar154._4_4_;
                            *(int *)(*pauVar64 + lVar70 * 4) = auVar137._4_4_;
                            auVar174 = vpunpckhdq_avx(auVar137,auVar154);
                            *(long *)(*pauVar64 + lVar69 * 4) = auVar174._0_8_;
                            *(int *)(*pauVar64 + (long)(iVar53 * 3) * 4) = auVar154._12_4_;
                            *(int *)(*pauVar64 + lVar113 * 4) = auVar137._12_4_;
                            pauVar64 = (undefined1 (*) [16])(*pauVar64 + 8);
                          }
                          else if (local_418.elempack == 4) {
                            auVar174 = vpblendw_avx(auVar154,auVar137,0xcc);
                            auVar137 = vpblendw_avx(auVar137,auVar154,0xcc);
                            *pauVar64 = auVar137;
                            pauVar64[1] = auVar174;
                            pauVar64 = pauVar64 + 2;
                          }
                          pauVar83 = pauVar83 + 1;
                        }
                        for (; iVar80 < iVar52; iVar80 = iVar80 + 1) {
                          auVar137 = *(undefined1 (*) [16])*pauVar83;
                          if (local_418.elempack == 1) {
                            *(int *)*pauVar64 = auVar137._0_4_;
                            *(int *)(*pauVar64 + lVar60 * 4) = auVar137._4_4_;
                            *(int *)(*pauVar64 + lVar69 * 4) = auVar137._8_4_;
                            *(int *)(*pauVar64 + lVar123 * 4) = auVar137._12_4_;
                            pauVar64 = (undefined1 (*) [16])(*pauVar64 + 4);
                          }
                          else if (local_418.elempack == 4) {
                            *pauVar64 = auVar137;
                            pauVar64 = pauVar64 + 1;
                          }
                          pauVar83 = (undefined1 (*) [32])(*pauVar83 + 0x10);
                        }
                        local_560 = local_560 + lVar66;
                        local_530 = local_530 + lVar66;
                        local_558 = local_558 + lVar66;
                        local_570 = local_570 + lVar66;
                      }
                      lVar69 = lVar60 * 8;
                      while (uVar61 = uVar71, (long)(uVar61 | 1) < (long)local_4b8._0_8_) {
                        lVar113 = (long)local_418.data +
                                  local_4f8 * 4 + (lVar59 + uVar61) * lVar60 * 4;
                        puVar95 = (undefined4 *)((long)local_418.data + (long)local_558);
                        pauVar68 = pauVar83;
                        for (lVar66 = 0; (int)lVar66 + 7 < iVar52; lVar66 = lVar66 + 8) {
                          auVar137 = vpermilps_avx(*(undefined1 (*) [16])(pauVar83[1] + lVar66 * 8),
                                                   0xb1);
                          auVar154 = vpermilps_avx(*(undefined1 (*) [16])
                                                    (pauVar83[1] + lVar66 * 8 + 0x10),0xb1);
                          auVar147 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar83 + lVar66 * 8),
                                                   auVar137);
                          auVar174 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar83 + lVar66 * 8),
                                                   auVar137);
                          auVar141 = vunpcklps_avx(*(undefined1 (*) [16])
                                                    (*pauVar83 + lVar66 * 8 + 0x10),auVar154);
                          auVar158 = vunpckhps_avx(*(undefined1 (*) [16])
                                                    (*pauVar83 + lVar66 * 8 + 0x10),auVar154);
                          auVar137 = vmovlhps_avx(auVar147,auVar174);
                          auVar154 = vmovlhps_avx(auVar141,auVar158);
                          auVar174 = vshufps_avx(auVar147,auVar174,0xbb);
                          auVar158 = vshufps_avx(auVar141,auVar158,0xbb);
                          *(undefined1 (*) [16])
                           ((long)local_418.data + (long)(local_530 + lVar66 * 4)) = auVar137;
                          *(undefined1 (*) [16])
                           ((long)local_418.data + (long)(local_530 + lVar66 * 4 + 0x10)) = auVar154
                          ;
                          *(undefined1 (*) [16])
                           ((long)local_418.data + (long)(local_560 + lVar66 * 4 + -0x10)) =
                               auVar174;
                          *(undefined1 (*) [16])
                           ((long)local_418.data + (long)(local_560 + lVar66 * 4)) = auVar158;
                          lVar113 = lVar113 + 0x20;
                          pauVar68 = pauVar68 + 2;
                          puVar95 = puVar95 + 8;
                        }
                        for (; (int)lVar66 + 3 < iVar52; lVar66 = lVar66 + 4) {
                          auVar154 = vpunpckldq_avx(*(undefined1 (*) [16])(*pauVar83 + lVar66 * 8),
                                                    *(undefined1 (*) [16])
                                                     (*pauVar83 + lVar66 * 8 + 0x10));
                          auVar137 = vpunpckhdq_avx(*(undefined1 (*) [16])(*pauVar83 + lVar66 * 8),
                                                    *(undefined1 (*) [16])
                                                     (*pauVar83 + lVar66 * 8 + 0x10));
                          auVar174 = vpunpcklqdq_avx(auVar154,auVar137);
                          auVar137 = vpunpckhdq_avx(auVar137,auVar154);
                          auVar137 = vpshufd_avx(auVar137,0x36);
                          *(undefined1 (*) [16])
                           ((long)local_418.data + (long)(local_530 + lVar66 * 4)) = auVar174;
                          *(undefined1 (*) [16])
                           ((long)local_418.data + (long)(local_558 + lVar66 * 4)) = auVar137;
                          lVar113 = lVar113 + 0x10;
                          pauVar68 = pauVar68 + 1;
                          puVar95 = puVar95 + 4;
                        }
                        for (; (int)lVar66 + 1 < iVar52; lVar66 = lVar66 + 2) {
                          uVar73 = *(undefined4 *)(*pauVar83 + lVar66 * 8 + 8);
                          uVar15 = *(undefined4 *)(*pauVar83 + lVar66 * 8 + 0xc);
                          *(undefined8 *)((long)local_418.data + (long)(local_530 + lVar66 * 4)) =
                               *(undefined8 *)(*pauVar83 + lVar66 * 8);
                          *(undefined4 *)((long)local_418.data + (long)(local_558 + lVar66 * 4)) =
                               uVar73;
                          *(undefined4 *)((long)local_418.data + (long)(local_570 + lVar66 * 4)) =
                               uVar15;
                          lVar113 = lVar113 + 8;
                          pauVar68 = (undefined1 (*) [32])(*pauVar68 + 0x10);
                          puVar95 = puVar95 + 2;
                        }
                        for (lVar75 = 0; (int)lVar66 + (int)lVar75 < iVar52; lVar75 = lVar75 + 1) {
                          uVar73 = *(undefined4 *)(*pauVar68 + 4);
                          *(undefined4 *)(lVar113 + lVar75 * 4) = *(undefined4 *)*pauVar68;
                          *puVar95 = uVar73;
                          pauVar68 = (undefined1 (*) [32])(*pauVar68 + 8);
                          puVar95 = puVar95 + 1;
                        }
                        local_560 = local_560 + lVar69;
                        local_530 = local_530 + lVar69;
                        local_558 = local_558 + lVar69;
                        local_570 = local_570 + lVar69;
                        pauVar83 = pauVar68;
                        local_4f0 = uVar61;
                        uVar71 = uVar61 + 2;
                      }
                      for (; uVar71 = local_4c0, pvVar105 = local_490,
                          (long)uVar61 < (long)local_4b8._0_8_; uVar61 = uVar61 + 1) {
                        pauVar68 = (undefined1 (*) [32])
                                   ((long)local_418.data +
                                   local_4f8 * 4 + (lVar59 + uVar61) * lVar60 * 4);
                        for (iVar53 = 0; iVar53 + 7 < iVar52; iVar53 = iVar53 + 8) {
                          *pauVar68 = *pauVar83;
                          pauVar68 = pauVar68 + 1;
                          pauVar83 = pauVar83 + 1;
                        }
                        for (; iVar53 + 3 < iVar52; iVar53 = iVar53 + 4) {
                          *(undefined1 (*) [16])*pauVar68 = *(undefined1 (*) [16])*pauVar83;
                          pauVar68 = (undefined1 (*) [32])(*pauVar68 + 0x10);
                          pauVar83 = (undefined1 (*) [32])(*pauVar83 + 0x10);
                        }
                        for (; iVar53 + 1 < iVar52; iVar53 = iVar53 + 2) {
                          *(undefined8 *)*pauVar68 = *(undefined8 *)*pauVar83;
                          pauVar68 = (undefined1 (*) [32])(*pauVar68 + 8);
                          pauVar83 = (undefined1 (*) [32])(*pauVar83 + 8);
                        }
                        lVar69 = 0;
                        for (; iVar53 < iVar52; iVar53 = iVar53 + 1) {
                          *(undefined4 *)(*pauVar68 + lVar69) = *(undefined4 *)(*pauVar83 + lVar69);
                          lVar69 = lVar69 + 4;
                        }
                        pauVar83 = (undefined1 (*) [32])(*pauVar83 + lVar69);
                      }
                    }
                    else {
                      unpack_output_tile_int32_avx2
                                (&m,&local_418,(int)local_520,(int)local_508,auVar130._0_4_,iVar52);
                    }
                  }
                  piVar77 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                  if (piVar77 != (int *)0x0) {
                    LOCK();
                    *piVar77 = *piVar77 + -1;
                    UNLOCK();
                    if (*piVar77 == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        free(m.data);
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  auVar130._0_4_ = (int)local_518 + 1;
                }
              }
              piVar77 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
              if (piVar77 != (int *)0x0) {
                LOCK();
                *piVar77 = *piVar77 + -1;
                UNLOCK();
                if (*piVar77 == 0) {
                  if (local_378.allocator == (Allocator *)0x0) {
                    free(local_378.data);
                  }
                  else {
                    (*(local_378.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            auVar130._0_4_ = (int)local_438;
            if (piVar77 != (int *)0x0) {
              LOCK();
              *piVar77 = *piVar77 + -1;
              UNLOCK();
              if (*piVar77 == 0) {
                pvVar105 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) {
LAB_00207948:
                  free(pvVar105);
                }
                else {
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
            }
            goto LAB_0020770b;
          }
          iVar52 = cpu_support_x86_avx2();
          if (iVar52 == 0) {
            iVar80 = cpu_support_x86_xop();
            iVar53 = local_488.w;
            iVar52 = local_488.elempack;
            if (iVar80 == 0) {
              local_ac = (int)local_488.cstep;
              lVar59 = (long)local_488.elempack;
              lVar69 = (long)local_488.c;
              local_41c = local_418.w;
              local_328._0_4_ = local_418.h;
              local_4c8 = (ulong)local_418.elempack;
              lVar60 = (long)local_418.c;
              uVar121 = auVar130._4_4_ * auVar130._0_4_;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar121,
                         (allocator_type *)&local_378);
              iVar80 = auVar130._8_4_ * auVar130._0_4_;
              uVar120 = 0;
              if (auVar130._0_4_ < 1) {
                auVar130._0_4_ = 0;
              }
              if ((int)auVar130._4_4_ < 1) {
                auVar130._4_4_ = 0;
              }
              iVar119 = 0;
              iVar92 = 0;
              iVar78 = auVar130._0_4_;
              for (; uVar120 != auVar130._4_4_; uVar120 = uVar120 + 1) {
                iVar98 = iVar119 * iVar52;
                iVar119 = (iVar53 * (int)local_520 - iVar80) + iVar119;
                for (lVar113 = (long)iVar92; iVar78 != lVar113; lVar113 = lVar113 + 1) {
                  *(int *)(opt_q._0_8_ + lVar113 * 4) = iVar98;
                  iVar119 = iVar119 + auVar130._8_4_;
                  iVar98 = iVar98 + iVar52 * auVar130._8_4_;
                }
                iVar78 = iVar78 + auVar130._0_4_;
                iVar92 = iVar92 + auVar130._0_4_;
              }
              lVar69 = lVar69 * lVar59;
              uVar71 = lVar60 * local_4c8;
              uVar61 = (long)((ulong)(uint)((int)uVar71 >> 0x1f) << 0x20 | uVar71 & 0xffffffff) / 4;
              auVar130._0_4_ = iVar52 * (int)local_518;
              local_498 = CONCAT44(local_498._4_4_,auVar130._0_4_);
              pauVar64 = (undefined1 (*) [16])0x0;
              pauVar82 = (undefined1 (*) [16])(ulong)uVar121;
              if ((int)uVar121 < 1) {
                pauVar82 = pauVar64;
              }
              local_4f0 = (long)pauVar82 * 8;
              lVar59 = (long)pauVar82 * 4;
              lVar60 = (long)pauVar82 * 0x20;
              iVar53 = (int)uVar61;
              local_58 = (undefined1 (*) [16])0x0;
              if (0 < iVar53) {
                local_58 = (undefined1 (*) [16])(uVar61 & 0xffffffff);
              }
              while( true ) {
                pauVar54 = pauVar64;
                local_570._0_4_ = (int)lVar69;
                if (pauVar54 == local_58) break;
                local_580 = (undefined1 (*) [16])
                            ((long)(((int)pauVar54 * 4) / (int)local_4c8) * local_418.cstep *
                             local_418.elemsize + (long)local_418.data);
                iVar80 = (int)local_418.cstep * (int)local_4c8;
                local_438 = CONCAT44(local_438._4_4_,local_418.w);
                iVar119 = local_418.h * local_418.w;
                local_4a0 = (undefined1 (*) [16])CONCAT44(local_4a0._4_4_,iVar119);
                lVar112 = (long)((int)local_488.cstep * iVar52);
                lVar113 = lVar112 * 3;
                lVar123 = (long)iVar80;
                local_38 = (long)(iVar80 + 3);
                lVar75 = (long)(iVar80 * 2);
                local_40 = (long)(iVar80 * 2 + 2);
                lVar62 = (long)(iVar80 * 3);
                lVar65 = (long)(iVar80 * 3 + 1);
                local_48 = (long)(iVar80 * 3 + 2);
                local_50 = (long)(iVar80 * 3 + 3);
                lVar66 = lVar112 * 5;
                lVar63 = lVar112 * 6;
                lVar70 = lVar112 * 7;
                for (auVar130._4_4_ = 0; (int)(auVar130._4_4_ | 3) < iVar119;
                    auVar130._4_4_ = auVar130._4_4_ + 4) {
                  iVar98 = (int)auVar130._4_4_ % local_418.w;
                  uVar61 = CONCAT44((int)(auVar130._4_4_ | 1) >> 0x1f,auVar130._4_4_) | 1;
                  local_500 = CONCAT44(local_500._4_4_,auVar130._4_4_);
                  uVar90 = CONCAT44((int)(auVar130._4_4_ | 2) >> 0x1f,auVar130._4_4_) | 2;
                  uVar86 = CONCAT44((int)(auVar130._4_4_ | 3) >> 0x1f,auVar130._4_4_) | 3;
                  local_5b0 = (void *)((this->weight_data_tm).cstep * (long)pauVar54 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                  local_330 = CONCAT44(local_330._4_4_,iVar98);
                  iVar92 = (int)((long)uVar61 % (long)local_418.w);
                  iVar78 = (int)((long)uVar90 % (long)local_418.w);
                  lVar84 = local_488.cstep * local_488.elemsize;
                  lVar109 = (long)local_488.w * local_488.elemsize;
                  iVar107 = (int)((long)uVar86 % (long)local_418.w);
                  lVar85 = (((int)auVar130._4_4_ / local_418.w) * (int)local_4e0) * lVar109;
                  lVar88 = ((int)((long)uVar61 / (long)local_418.w) * (int)local_4e0) * lVar109;
                  lVar79 = ((int)((long)uVar90 / (long)local_418.w) * (int)local_4e0) * lVar109;
                  lVar109 = ((int)((long)uVar86 / (long)local_418.w) * (int)local_4e0) * lVar109;
                  local_4d0 = (int *)((long)local_488.data + iVar98 * auVar130._0_4_ + lVar85);
                  local_490 = (void *)((long)local_488.data + iVar92 * auVar130._0_4_ + lVar88);
                  local_428 = (undefined1 (*) [16])
                              ((long)local_488.data + iVar78 * auVar130._0_4_ + lVar79);
                  local_4c0 = (long)local_488.data + iVar107 * auVar130._0_4_ + lVar109;
                  auVar144 = ZEXT1664((undefined1  [16])0x0);
                  auVar151 = ZEXT1664((undefined1  [16])0x0);
                  auVar156 = ZEXT1664((undefined1  [16])0x0);
                  auVar161 = ZEXT1664((undefined1  [16])0x0);
                  uVar61 = 0;
                  while (uVar90 = uVar61, (int)((uint)uVar90 | 7) < (int)local_570) {
                    lVar104 = (int)((long)((ulong)(uint)((int)(uint)uVar90 >> 0x1f) << 0x20 |
                                          uVar90 & 0xffffffff) / (long)iVar52) * lVar84;
                    local_4b8._0_8_ = (int *)((long)local_4d0 + lVar104);
                    for (lVar89 = 0; lVar59 != lVar89; lVar89 = lVar89 + 4) {
                      lVar101 = (long)*(int *)(opt_q._0_8_ + lVar89);
                      puVar76 = (ulong *)((long)local_4d0 + lVar104 + lVar101);
                      puVar57 = (ulong *)((long)local_490 + lVar101 + lVar104);
                      puVar2 = (ulong *)(*local_428 + lVar101 + lVar104);
                      puVar102 = (ulong *)(lVar101 + lVar104 + local_4c0);
                      if (iVar52 == 8) {
                        auVar162._8_8_ = 0;
                        auVar162._0_8_ = *puVar76;
                        auVar170._8_8_ = 0;
                        auVar170._0_8_ = *puVar57;
                        auVar188._8_8_ = 0;
                        auVar188._0_8_ = *puVar2;
                        auVar196._8_8_ = 0;
                        auVar196._0_8_ = *puVar102;
                      }
                      else {
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar76),
                                               (uint)*(byte *)((long)puVar76 + lVar112),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar112 * 2)
                                               ,2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar113),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar112 * 4)
                                               ,4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar63),6);
                        auVar162 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar70),7);
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar57),
                                               (uint)*(byte *)((long)puVar57 + lVar112),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar112 * 2)
                                               ,2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar113),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar112 * 4)
                                               ,4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar63),6);
                        auVar170 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar70),7);
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar2),
                                               (uint)*(byte *)((long)puVar2 + lVar112),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar112 * 2),
                                               2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar113),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar112 * 4),
                                               4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar63),6);
                        auVar188 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar70),7);
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar102),
                                               (uint)*(byte *)((long)puVar102 + lVar112),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar112 * 2
                                                                       ),2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar113),3)
                        ;
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar112 * 4
                                                                       ),4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar63),6);
                        auVar196 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar70),7);
                      }
                      auVar176 = vpmovsxbw_avx(auVar162);
                      auVar182 = vpmovsxbw_avx(auVar170);
                      auVar178 = vpmovsxbw_avx(auVar188);
                      auVar181 = vpmovsxbw_avx(auVar196);
                      auVar137 = *(undefined1 (*) [16])((long)local_5b0 + lVar89 * 8);
                      auVar154 = *(undefined1 (*) [16])((long)local_5b0 + lVar89 * 8 + 0x10);
                      auVar174 = vpcmpgtb_avx((undefined1  [16])0x0,auVar137);
                      auVar158 = vpcmpgtb_avx((undefined1  [16])0x0,auVar154);
                      auVar147 = vpunpcklbw_avx(auVar137,auVar174);
                      auVar177 = vpunpckhbw_avx(auVar137,auVar174);
                      auVar193 = vpunpcklbw_avx(auVar154,auVar158);
                      auVar187 = vpunpckhbw_avx(auVar154,auVar158);
                      auVar137 = vpshufd_avx(auVar176,0);
                      auVar137 = vpmaddwd_avx(auVar137,auVar147);
                      auVar137 = vpaddd_avx(auVar137,auVar161._0_16_);
                      auVar154 = vpshufd_avx(auVar182,0);
                      auVar154 = vpmaddwd_avx(auVar154,auVar147);
                      auVar154 = vpaddd_avx(auVar154,auVar156._0_16_);
                      auVar174 = vpshufd_avx(auVar178,0);
                      auVar174 = vpmaddwd_avx(auVar174,auVar147);
                      auVar174 = vpaddd_avx(auVar174,auVar151._0_16_);
                      auVar158 = vpshufd_avx(auVar181,0);
                      auVar158 = vpmaddwd_avx(auVar158,auVar147);
                      auVar158 = vpaddd_avx(auVar158,auVar144._0_16_);
                      auVar147 = vpshufd_avx(auVar176,0x55);
                      auVar147 = vpmaddwd_avx(auVar147,auVar177);
                      auVar141 = vpshufd_avx(auVar182,0x55);
                      auVar141 = vpmaddwd_avx(auVar141,auVar177);
                      auVar186 = vpshufd_avx(auVar178,0x55);
                      auVar186 = vpmaddwd_avx(auVar186,auVar177);
                      auVar140 = vpshufd_avx(auVar181,0x55);
                      auVar140 = vpmaddwd_avx(auVar140,auVar177);
                      auVar177 = vpshufd_avx(auVar176,0xaa);
                      auVar177 = vpmaddwd_avx(auVar177,auVar193);
                      auVar147 = vpaddd_avx(auVar147,auVar177);
                      auVar137 = vpaddd_avx(auVar147,auVar137);
                      auVar147 = vpshufd_avx(auVar182,0xaa);
                      auVar147 = vpmaddwd_avx(auVar147,auVar193);
                      auVar147 = vpaddd_avx(auVar141,auVar147);
                      auVar154 = vpaddd_avx(auVar147,auVar154);
                      auVar147 = vpshufd_avx(auVar178,0xaa);
                      auVar147 = vpmaddwd_avx(auVar147,auVar193);
                      auVar147 = vpaddd_avx(auVar186,auVar147);
                      auVar174 = vpaddd_avx(auVar147,auVar174);
                      auVar147 = vpshufd_avx(auVar181,0xaa);
                      auVar147 = vpmaddwd_avx(auVar147,auVar193);
                      auVar147 = vpaddd_avx(auVar140,auVar147);
                      auVar158 = vpaddd_avx(auVar147,auVar158);
                      auVar147 = vpshufd_avx(auVar176,0xff);
                      auVar147 = vpmaddwd_avx(auVar147,auVar187);
                      auVar137 = vpaddd_avx(auVar147,auVar137);
                      auVar161 = ZEXT1664(auVar137);
                      auVar137 = vpshufd_avx(auVar182,0xff);
                      auVar137 = vpmaddwd_avx(auVar187,auVar137);
                      auVar137 = vpaddd_avx(auVar154,auVar137);
                      auVar156 = ZEXT1664(auVar137);
                      auVar137 = vpshufd_avx(auVar178,0xff);
                      auVar137 = vpmaddwd_avx(auVar187,auVar137);
                      auVar137 = vpaddd_avx(auVar174,auVar137);
                      auVar151 = ZEXT1664(auVar137);
                      auVar137 = vpshufd_avx(auVar181,0xff);
                      auVar137 = vpmaddwd_avx(auVar187,auVar137);
                      auVar137 = vpaddd_avx(auVar158,auVar137);
                      auVar144 = ZEXT1664(auVar137);
                    }
                    local_5b0 = (void *)((long)local_5b0 + lVar60);
                    local_4f8 = uVar90;
                    uVar61 = uVar90 + 8;
                  }
                  lVar85 = iVar98 * (int)local_518 + lVar85;
                  lVar88 = iVar92 * (int)local_518 + lVar88;
                  local_520 = (long)local_488.data + iVar78 * (int)local_518 + lVar79;
                  local_508 = (long)local_488.data + iVar107 * (int)local_518 + lVar109;
                  for (; (long)(uVar90 | 1) < lVar69; uVar90 = uVar90 + 2) {
                    lVar89 = uVar90 * lVar84;
                    lVar109 = lVar89 + lVar85;
                    lVar79 = lVar89 + lVar88;
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      lVar104 = (long)*(int *)(opt_q._0_8_ + (long)pauVar64 * 4);
                      auVar137 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_488.data +
                                                              lVar104 + lVar109)),
                                             (uint)*(byte *)((long)local_488.data +
                                                            lVar112 + lVar104 + lVar109),1);
                      auVar137 = vpmovsxbw_avx(auVar137);
                      auVar174 = vpshufd_avx(auVar137,0);
                      auVar137 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_488.data +
                                                              lVar104 + lVar79)),
                                             (uint)*(byte *)((long)local_488.data +
                                                            lVar112 + lVar104 + lVar79),1);
                      auVar154 = vpmovsxbw_avx(auVar137);
                      auVar137 = vpinsrb_avx(ZEXT116(*(byte *)(local_520 + lVar89 + lVar104)),
                                             (uint)*(byte *)(lVar112 + local_520 + lVar89 + lVar104)
                                             ,1);
                      auVar158 = vpshufd_avx(auVar154,0);
                      auVar137 = vpmovsxbw_avx(auVar137);
                      auVar147 = vpshufd_avx(auVar137,0);
                      auVar137 = vpinsrb_avx(ZEXT116(*(byte *)(lVar89 + local_508 + lVar104)),
                                             (uint)*(byte *)(lVar112 + lVar89 + local_508 + lVar104)
                                             ,1);
                      auVar137 = vpmovsxbw_avx(auVar137);
                      auVar141 = vpshufd_avx(auVar137,0);
                      auVar5._8_8_ = 0;
                      auVar5._0_8_ = *(ulong *)((long)local_5b0 + (long)pauVar64 * 8);
                      auVar154 = vpmovsxbw_avx(auVar5);
                      auVar137 = vpmaddwd_avx(auVar154,auVar174);
                      auVar137 = vpaddd_avx(auVar137,auVar161._0_16_);
                      auVar161 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar154,auVar158);
                      auVar137 = vpaddd_avx(auVar137,auVar156._0_16_);
                      auVar156 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar154,auVar147);
                      auVar137 = vpaddd_avx(auVar137,auVar151._0_16_);
                      auVar151 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar141,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar144._0_16_);
                      auVar144 = ZEXT1664(auVar137);
                    }
                    local_5b0 = (void *)((long)local_5b0 + local_4f0);
                  }
                  for (; (long)uVar90 < lVar69; uVar90 = uVar90 + 1) {
                    lVar109 = uVar90 * lVar84;
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      lVar79 = (long)*(int *)(opt_q._0_8_ + (long)pauVar64 * 4);
                      auVar137 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_488.data +
                                                                          lVar79 + lVar109 + lVar85)
                                                     ),0);
                      auVar154 = vpshufd_avx(auVar137,0);
                      auVar137 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_488.data +
                                                                          lVar79 + lVar109 + lVar88)
                                                     ),0);
                      auVar158 = vpshufd_avx(auVar137,0);
                      auVar137 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)(local_520 + lVar109 +
                                                                          lVar79)),0);
                      auVar147 = vpshufd_avx(auVar137,0);
                      auVar137 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)(lVar109 + local_508 +
                                                                          lVar79)),0);
                      auVar141 = vpshufd_avx(auVar137,0);
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = *(ulong *)((long)local_5b0 + (long)pauVar64 * 4);
                      auVar137 = vpmovsxbw_avx(auVar6);
                      auVar174 = vpmullw_avx(auVar137,auVar154);
                      auVar154 = vpmulhw_avx(auVar137,auVar154);
                      auVar186 = vpunpcklwd_avx(auVar174,auVar154);
                      auVar174 = vpmullw_avx(auVar137,auVar158);
                      auVar154 = vpmulhw_avx(auVar137,auVar158);
                      auVar158 = vpunpcklwd_avx(auVar174,auVar154);
                      auVar174 = vpmullw_avx(auVar137,auVar147);
                      auVar154 = vpmulhw_avx(auVar137,auVar147);
                      auVar174 = vpunpcklwd_avx(auVar174,auVar154);
                      auVar154 = vpmullw_avx(auVar141,auVar137);
                      auVar137 = vpmulhw_avx(auVar141,auVar137);
                      auVar154 = vpunpcklwd_avx(auVar154,auVar137);
                      auVar137 = vpaddd_avx(auVar161._0_16_,auVar186);
                      auVar161 = ZEXT1664(auVar137);
                      auVar137 = vpaddd_avx(auVar156._0_16_,auVar158);
                      auVar156 = ZEXT1664(auVar137);
                      auVar137 = vpaddd_avx(auVar151._0_16_,auVar174);
                      auVar151 = ZEXT1664(auVar137);
                      auVar137 = vpaddd_avx(auVar154,auVar144._0_16_);
                      auVar144 = ZEXT1664(auVar137);
                    }
                    local_5b0 = (void *)((long)local_5b0 + lVar59);
                  }
                  auVar158 = auVar161._0_16_;
                  auVar174 = auVar156._0_16_;
                  auVar154 = auVar151._0_16_;
                  auVar137 = auVar144._0_16_;
                  if ((int)local_4c8 == 1) {
                    auVar147 = vpunpckldq_avx(auVar158,auVar174);
                    auVar141 = vpunpcklqdq_avx(auVar147,auVar154);
                    auVar147 = vpshufd_avx(auVar137,0);
                    auVar147 = vpblendw_avx(auVar141,auVar147,0xc0);
                    *local_580 = auVar147;
                    *(int *)(*local_580 + lVar123 * 4) = auVar161._4_4_;
                    *(int *)(*local_580 + (long)(iVar80 + 1) * 4) = auVar156._4_4_;
                    *(int *)(*local_580 + (long)(iVar80 + 2) * 4) = auVar151._4_4_;
                    *(int *)(*local_580 + local_38 * 4) = auVar144._4_4_;
                    auVar174 = vpunpckhdq_avx(auVar158,auVar174);
                    *(long *)(*local_580 + lVar75 * 4) = auVar174._0_8_;
                    auVar137 = vpunpckhdq_avx(auVar154,auVar137);
                    *(long *)(*local_580 + local_40 * 4) = auVar137._0_8_;
                    *(int *)(*local_580 + lVar62 * 4) = auVar161._12_4_;
                    *(int *)(*local_580 + lVar65 * 4) = auVar156._12_4_;
                    *(int *)(*local_580 + local_48 * 4) = auVar151._12_4_;
                    *(int *)(*local_580 + local_50 * 4) = auVar144._12_4_;
                    local_580 = local_580 + 1;
                  }
                  else if ((int)local_4c8 == 4) {
                    *local_580 = auVar158;
                    local_580[1] = auVar174;
                    local_580[2] = auVar154;
                    local_580[3] = auVar137;
                    local_580 = local_580 + 4;
                  }
                }
                for (; (int)(auVar130._4_4_ | 1) < iVar119; auVar130._4_4_ = auVar130._4_4_ + 2) {
                  local_500 = CONCAT44(local_500._4_4_,auVar130._4_4_);
                  iVar78 = (int)auVar130._4_4_ % local_418.w;
                  uVar61 = CONCAT44((int)(auVar130._4_4_ | 1) >> 0x1f,auVar130._4_4_) | 1;
                  pvVar105 = (void *)((this->weight_data_tm).cstep * (long)pauVar54 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  local_520 = CONCAT44(local_520._4_4_,iVar78);
                  lVar109 = local_488.cstep * local_488.elemsize;
                  iVar92 = (int)((long)uVar61 % (long)local_418.w);
                  local_508 = CONCAT44(local_508._4_4_,iVar92);
                  lVar88 = (long)(((int)auVar130._4_4_ / local_418.w) * (int)local_4e0) *
                           (long)local_488.w * local_488.elemsize;
                  lVar85 = (long)((int)((long)uVar61 / (long)local_418.w) * (int)local_4e0) *
                           (long)local_488.w * local_488.elemsize;
                  auVar144 = ZEXT1664((undefined1  [16])0x0);
                  auVar151 = ZEXT1664((undefined1  [16])0x0);
                  auVar156 = ZEXT1664((undefined1  [16])0x0);
                  auVar161 = ZEXT1664((undefined1  [16])0x0);
                  for (uVar61 = 0; (int)((uint)uVar61 | 7) < (int)local_570; uVar61 = uVar61 + 8) {
                    lVar79 = (int)((long)((ulong)(uint)((int)(uint)uVar61 >> 0x1f) << 0x20 |
                                         uVar61 & 0xffffffff) / (long)iVar52) * lVar109;
                    for (lVar84 = 0; lVar59 != lVar84; lVar84 = lVar84 + 4) {
                      puVar76 = (ulong *)((long)local_488.data +
                                         (long)*(int *)(opt_q._0_8_ + lVar84) +
                                         lVar79 + iVar78 * auVar130._0_4_ + lVar88);
                      puVar57 = (ulong *)((long)local_488.data +
                                         (long)*(int *)(opt_q._0_8_ + lVar84) +
                                         lVar79 + iVar92 * auVar130._0_4_ + lVar85);
                      if (iVar52 == 8) {
                        auVar163._8_8_ = 0;
                        auVar163._0_8_ = *puVar76;
                        auVar171._8_8_ = 0;
                        auVar171._0_8_ = *puVar57;
                      }
                      else {
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar76),
                                               (uint)*(byte *)((long)puVar76 + lVar112),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar112 * 2)
                                               ,2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar113),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar112 * 4)
                                               ,4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar63),6);
                        auVar163 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar70),7);
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar57),
                                               (uint)*(byte *)((long)puVar57 + lVar112),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar112 * 2)
                                               ,2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar113),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar112 * 4)
                                               ,4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar63),6);
                        auVar171 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar70),7);
                      }
                      auVar141 = vpmovsxbw_avx(auVar163);
                      auVar186 = vpmovsxbw_avx(auVar171);
                      auVar137 = *(undefined1 (*) [16])((long)pvVar105 + lVar84 * 8);
                      auVar154 = *(undefined1 (*) [16])((long)pvVar105 + lVar84 * 8 + 0x10);
                      auVar174 = vpcmpgtb_avx((undefined1  [16])0x0,auVar137);
                      auVar158 = vpcmpgtb_avx((undefined1  [16])0x0,auVar154);
                      auVar177 = vpunpcklbw_avx(auVar137,auVar174);
                      auVar147 = vpunpckhbw_avx(auVar137,auVar174);
                      auVar176 = vpunpcklbw_avx(auVar154,auVar158);
                      auVar140 = vpunpckhbw_avx(auVar154,auVar158);
                      auVar137 = vpshufd_avx(auVar141,0);
                      auVar137 = vpmaddwd_avx(auVar137,auVar177);
                      auVar137 = vpaddd_avx(auVar137,auVar161._0_16_);
                      auVar154 = vpshufd_avx(auVar186,0);
                      auVar154 = vpmaddwd_avx(auVar154,auVar177);
                      auVar154 = vpaddd_avx(auVar154,auVar156._0_16_);
                      auVar174 = vpshufd_avx(auVar141,0x55);
                      auVar174 = vpmaddwd_avx(auVar174,auVar147);
                      auVar174 = vpaddd_avx(auVar174,auVar151._0_16_);
                      auVar158 = vpshufd_avx(auVar186,0x55);
                      auVar158 = vpmaddwd_avx(auVar158,auVar147);
                      auVar158 = vpaddd_avx(auVar158,auVar144._0_16_);
                      auVar147 = vpshufd_avx(auVar141,0xaa);
                      auVar147 = vpmaddwd_avx(auVar176,auVar147);
                      auVar137 = vpaddd_avx(auVar137,auVar147);
                      auVar161 = ZEXT1664(auVar137);
                      auVar137 = vpshufd_avx(auVar186,0xaa);
                      auVar137 = vpmaddwd_avx(auVar176,auVar137);
                      auVar137 = vpaddd_avx(auVar154,auVar137);
                      auVar156 = ZEXT1664(auVar137);
                      auVar137 = vpshufd_avx(auVar141,0xff);
                      auVar137 = vpmaddwd_avx(auVar140,auVar137);
                      auVar137 = vpaddd_avx(auVar174,auVar137);
                      auVar151 = ZEXT1664(auVar137);
                      auVar137 = vpshufd_avx(auVar186,0xff);
                      auVar137 = vpmaddwd_avx(auVar140,auVar137);
                      auVar137 = vpaddd_avx(auVar158,auVar137);
                      auVar144 = ZEXT1664(auVar137);
                    }
                    pvVar105 = (void *)((long)pvVar105 + lVar60);
                  }
                  local_4b8._0_8_ = (long)local_488.data + iVar78 * (int)local_518 + lVar88;
                  lVar85 = iVar92 * (int)local_518 + lVar85;
                  for (; (long)(uVar61 | 1) < lVar69; uVar61 = uVar61 + 2) {
                    lVar79 = local_4b8._0_8_ + uVar61 * lVar109;
                    lVar88 = uVar61 * lVar109 + lVar85;
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      lVar84 = (long)*(int *)(opt_q._0_8_ + (long)pauVar64 * 4);
                      auVar137 = vpinsrb_avx(ZEXT116(*(byte *)(lVar79 + lVar84)),
                                             (uint)*(byte *)(lVar112 + lVar79 + lVar84),1);
                      auVar137 = vpmovsxbw_avx(auVar137);
                      auVar174 = vpshufd_avx(auVar137,0);
                      auVar137 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_488.data +
                                                              lVar84 + lVar88)),
                                             (uint)*(byte *)((long)local_488.data +
                                                            lVar112 + lVar84 + lVar88),1);
                      auVar137 = vpmovsxbw_avx(auVar137);
                      auVar158 = vpshufd_avx(auVar137,0);
                      auVar7._8_8_ = 0;
                      auVar7._0_8_ = *(ulong *)((long)pvVar105 + (long)pauVar64 * 8);
                      auVar154 = vpmovsxbw_avx(auVar7);
                      auVar137 = vpmaddwd_avx(auVar174,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar161._0_16_);
                      auVar161 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar158,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar156._0_16_);
                      auVar156 = ZEXT1664(auVar137);
                    }
                    pvVar105 = (void *)((long)pvVar105 + local_4f0);
                  }
                  for (; (long)uVar61 < lVar69; uVar61 = uVar61 + 1) {
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      lVar88 = (long)*(int *)(opt_q._0_8_ + (long)pauVar64 * 4);
                      auVar137 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)(local_4b8._0_8_ +
                                                                           uVar61 * lVar109 + lVar88
                                                                          )),0);
                      auVar154 = vpshufd_avx(auVar137,0);
                      auVar137 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_488.data +
                                                                          lVar88 + uVar61 * lVar109
                                                                                   + lVar85)),0);
                      auVar158 = vpshufd_avx(auVar137,0);
                      auVar8._8_8_ = 0;
                      auVar8._0_8_ = *(ulong *)((long)pvVar105 + (long)pauVar64 * 4);
                      auVar137 = vpmovsxbw_avx(auVar8);
                      auVar174 = vpmullw_avx(auVar154,auVar137);
                      auVar154 = vpmulhw_avx(auVar154,auVar137);
                      auVar174 = vpunpcklwd_avx(auVar174,auVar154);
                      auVar154 = vpmullw_avx(auVar158,auVar137);
                      auVar137 = vpmulhw_avx(auVar158,auVar137);
                      auVar154 = vpunpcklwd_avx(auVar154,auVar137);
                      auVar137 = vpaddd_avx(auVar161._0_16_,auVar174);
                      auVar161 = ZEXT1664(auVar137);
                      auVar137 = vpaddd_avx(auVar156._0_16_,auVar154);
                      auVar156 = ZEXT1664(auVar137);
                    }
                    pvVar105 = (void *)((long)pvVar105 + lVar59);
                  }
                  auVar137 = vpaddd_avx(auVar161._0_16_,auVar151._0_16_);
                  auVar154 = vpaddd_avx(auVar156._0_16_,auVar144._0_16_);
                  if ((int)local_4c8 == 1) {
                    auVar174 = vpunpckldq_avx(auVar137,auVar154);
                    *(long *)*local_580 = auVar174._0_8_;
                    *(int *)(*local_580 + lVar123 * 4) = auVar137._4_4_;
                    *(int *)(*local_580 + (long)(iVar80 + 1) * 4) = auVar154._4_4_;
                    auVar174 = vpunpckhdq_avx(auVar137,auVar154);
                    *(long *)(*local_580 + lVar75 * 4) = auVar174._0_8_;
                    *(int *)(*local_580 + lVar62 * 4) = auVar137._12_4_;
                    *(int *)(*local_580 + lVar65 * 4) = auVar154._12_4_;
                    local_580 = (undefined1 (*) [16])(*local_580 + 8);
                  }
                  else if ((int)local_4c8 == 4) {
                    *local_580 = auVar137;
                    local_580[1] = auVar154;
                    local_580 = local_580 + 2;
                  }
                }
                for (; (int)auVar130._4_4_ < iVar119; auVar130._4_4_ = auVar130._4_4_ + 1) {
                  pvVar105 = (void *)((this->weight_data_tm).cstep * (long)pauVar54 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  lVar65 = (long)local_488.w * local_488.elemsize *
                           (long)(((int)auVar130._4_4_ / local_418.w) * (int)local_4e0);
                  lVar85 = local_488.cstep * local_488.elemsize;
                  auVar144 = ZEXT1664((undefined1  [16])0x0);
                  auVar151 = ZEXT1664((undefined1  [16])0x0);
                  auVar156 = ZEXT1664((undefined1  [16])0x0);
                  auVar161 = ZEXT1664((undefined1  [16])0x0);
                  for (uVar61 = 0; (int)((uint)uVar61 | 7) < (int)local_570; uVar61 = uVar61 + 8) {
                    for (lVar88 = 0; lVar59 != lVar88; lVar88 = lVar88 + 4) {
                      puVar76 = (ulong *)((long)local_488.data +
                                         (long)*(int *)(opt_q._0_8_ + lVar88) +
                                         (int)((long)((ulong)(uint)((int)(uint)uVar61 >> 0x1f) <<
                                                      0x20 | uVar61 & 0xffffffff) / (long)iVar52) *
                                         lVar85 + ((int)auVar130._4_4_ % local_418.w) *
                                                  auVar130._0_4_ + lVar65);
                      if (iVar52 == 8) {
                        auVar164._8_8_ = 0;
                        auVar164._0_8_ = *puVar76;
                      }
                      else {
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar76),
                                               (uint)*(byte *)((long)puVar76 + lVar112),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar112 * 2)
                                               ,2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar113),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar112 * 4)
                                               ,4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar63),6);
                        auVar164 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar70),7);
                      }
                      auVar147 = vpmovsxbw_avx(auVar164);
                      auVar137 = *(undefined1 (*) [16])((long)pvVar105 + lVar88 * 8);
                      auVar154 = *(undefined1 (*) [16])((long)pvVar105 + lVar88 * 8 + 0x10);
                      auVar174 = vpcmpgtb_avx((undefined1  [16])0x0,auVar137);
                      auVar158 = vpcmpgtb_avx((undefined1  [16])0x0,auVar154);
                      auVar141 = vpunpcklbw_avx(auVar137,auVar174);
                      auVar174 = vpunpckhbw_avx(auVar137,auVar174);
                      auVar186 = vpunpcklbw_avx(auVar154,auVar158);
                      auVar154 = vpunpckhbw_avx(auVar154,auVar158);
                      auVar137 = vpshufd_avx(auVar147,0);
                      auVar137 = vpmaddwd_avx(auVar137,auVar141);
                      auVar137 = vpaddd_avx(auVar137,auVar161._0_16_);
                      auVar161 = ZEXT1664(auVar137);
                      auVar137 = vpshufd_avx(auVar147,0x55);
                      auVar137 = vpmaddwd_avx(auVar137,auVar174);
                      auVar137 = vpaddd_avx(auVar137,auVar156._0_16_);
                      auVar156 = ZEXT1664(auVar137);
                      auVar137 = vpshufd_avx(auVar147,0xaa);
                      auVar137 = vpmaddwd_avx(auVar186,auVar137);
                      auVar137 = vpaddd_avx(auVar137,auVar151._0_16_);
                      auVar151 = ZEXT1664(auVar137);
                      auVar137 = vpshufd_avx(auVar147,0xff);
                      auVar137 = vpmaddwd_avx(auVar137,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar144._0_16_);
                      auVar144 = ZEXT1664(auVar137);
                    }
                    pvVar105 = (void *)((long)pvVar105 + lVar60);
                  }
                  auVar137 = vpaddd_avx(auVar151._0_16_,auVar144._0_16_);
                  auVar154 = vpaddd_avx(auVar156._0_16_,auVar161._0_16_);
                  auVar137 = vpaddd_avx(auVar137,auVar154);
                  auVar144 = ZEXT1664(auVar137);
                  lVar65 = ((int)auVar130._4_4_ % local_418.w) * (int)local_518 + lVar65;
                  for (; (long)(uVar61 | 1) < lVar69; uVar61 = uVar61 + 2) {
                    lVar88 = uVar61 * lVar85 + lVar65;
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      lVar109 = (long)*(int *)(opt_q._0_8_ + (long)pauVar64 * 4);
                      auVar137 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_488.data +
                                                              lVar109 + lVar88)),
                                             (uint)*(byte *)((long)local_488.data +
                                                            lVar112 + lVar109 + lVar88),1);
                      auVar137 = vpmovsxbw_avx(auVar137);
                      auVar9._8_8_ = 0;
                      auVar9._0_8_ = *(ulong *)((long)pvVar105 + (long)pauVar64 * 8);
                      auVar154 = vpmovsxbw_avx(auVar9);
                      auVar137 = vpshufd_avx(auVar137,0);
                      auVar137 = vpmaddwd_avx(auVar137,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar144._0_16_);
                      auVar144 = ZEXT1664(auVar137);
                    }
                    pvVar105 = (void *)((long)pvVar105 + local_4f0);
                  }
                  for (; (long)uVar61 < lVar69; uVar61 = uVar61 + 1) {
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      auVar137 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)local_488.data +
                                                                          (long)*(int *)(opt_q._0_8_
                                                                                        + (long)
                                                  pauVar64 * 4) + uVar61 * lVar85 + lVar65)),0);
                      auVar174 = vpshufd_avx(auVar137,0);
                      auVar10._8_8_ = 0;
                      auVar10._0_8_ = *(ulong *)((long)pvVar105 + (long)pauVar64 * 4);
                      auVar137 = vpmovsxbw_avx(auVar10);
                      auVar154 = vpmullw_avx(auVar174,auVar137);
                      auVar137 = vpmulhw_avx(auVar174,auVar137);
                      auVar137 = vpunpcklwd_avx(auVar154,auVar137);
                      auVar137 = vpaddd_avx(auVar144._0_16_,auVar137);
                      auVar144 = ZEXT1664(auVar137);
                    }
                    pvVar105 = (void *)((long)pvVar105 + lVar59);
                  }
                  if ((int)local_4c8 == 1) {
                    *(int *)*local_580 = auVar144._0_4_;
                    *(int *)(*local_580 + lVar123 * 4) = auVar144._4_4_;
                    *(int *)(*local_580 + lVar75 * 4) = auVar144._8_4_;
                    *(int *)(*local_580 + lVar62 * 4) = auVar144._12_4_;
                    local_580 = (undefined1 (*) [16])(*local_580 + 4);
                  }
                  else if ((int)local_4c8 == 4) {
                    *local_580 = auVar144._0_16_;
                    local_580 = local_580 + 1;
                  }
                }
                pauVar64 = (undefined1 (*) [16])(*pauVar54 + 1);
                local_430 = pauVar54;
              }
              auVar130._4_4_ = iVar53 * 4;
              local_c0 = (ulong)auVar130._4_4_;
              uVar61 = (long)((int)uVar71 + iVar53 * -4) / 2;
              local_b8 = uVar61 & 0xffffffff;
              lVar60 = (long)pauVar82 * 2;
              uVar90 = 0;
              uVar86 = 0;
              if (0 < (int)uVar61) {
                uVar86 = uVar61 & 0xffffffff;
              }
              for (; uVar90 != uVar86; uVar90 = uVar90 + 1) {
                uVar96 = (long)(int)auVar130._4_4_ + uVar90 * 2;
                uVar97 = (ulong)(uint)((int)uVar96 >> 0x1f) << 0x20 | uVar96 & 0xffffffff;
                local_330 = CONCAT44(local_330._4_4_,local_418.w);
                iVar53 = local_418.h * local_418.w;
                local_438 = CONCAT44(local_438._4_4_,iVar53);
                lVar75 = (long)(((int)((long)uVar97 % 4) >> 1) + (int)((long)uVar97 / 4));
                lVar63 = (long)((int)local_488.cstep * iVar52);
                lVar113 = lVar63 * 3;
                lVar66 = lVar63 * 5;
                lVar62 = lVar63 * 6;
                lVar65 = lVar63 * 7;
                local_4b8._0_8_ = lVar65;
                pauVar64 = (undefined1 (*) [16])
                           (local_418.elemsize * local_418.cstep * uVar96 + (long)local_418.data);
                pauVar54 = (undefined1 (*) [16])
                           (((long)(int)auVar130._4_4_ + uVar90 * 2 + 1) *
                            local_418.elemsize * local_418.cstep + (long)local_418.data);
                for (uVar121 = 0; pauVar118 = pauVar54, pauVar124 = pauVar64,
                    (int)(uVar121 | 3) < iVar53; uVar121 = uVar121 + 4) {
                  uVar96 = CONCAT44((int)(uVar121 | 1) >> 0x1f,uVar121) | 1;
                  local_4c8 = CONCAT44(local_4c8._4_4_,uVar121);
                  uVar97 = CONCAT44((int)(uVar121 | 2) >> 0x1f,uVar121) | 2;
                  uVar20 = CONCAT44((int)(uVar121 | 3) >> 0x1f,uVar121) | 3;
                  local_5b0 = (void *)((this->weight_data_tm).cstep * lVar75 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                  iVar119 = (int)((long)uVar96 % (long)local_418.w);
                  iVar80 = (int)((long)uVar97 % (long)local_418.w);
                  lVar85 = local_488.cstep * local_488.elemsize;
                  lVar70 = (long)local_488.w * local_488.elemsize;
                  iVar92 = (int)((long)uVar20 % (long)local_418.w);
                  lVar123 = (((int)uVar121 / local_418.w) * (int)local_4e0) * lVar70;
                  lVar112 = ((int)((long)uVar96 / (long)local_418.w) * (int)local_4e0) * lVar70;
                  lVar88 = ((int)((long)uVar97 / (long)local_418.w) * (int)local_4e0) * lVar70;
                  lVar70 = ((int)((long)uVar20 / (long)local_418.w) * (int)local_4e0) * lVar70;
                  local_428 = (undefined1 (*) [16])
                              ((long)local_488.data +
                              ((int)uVar121 % local_418.w) * auVar130._0_4_ + lVar123);
                  local_4c0 = (long)local_488.data + iVar119 * auVar130._0_4_ + lVar112;
                  local_500 = (long)local_488.data + iVar92 * auVar130._0_4_ + lVar70;
                  auVar144 = ZEXT1664((undefined1  [16])0x0);
                  auVar156 = ZEXT1664((undefined1  [16])0x0);
                  auVar151 = ZEXT1664((undefined1  [16])0x0);
                  auVar169 = ZEXT1664((undefined1  [16])0x0);
                  auVar161 = ZEXT1664((undefined1  [16])0x0);
                  auVar180 = ZEXT1664((undefined1  [16])0x0);
                  auVar175 = ZEXT1664((undefined1  [16])0x0);
                  auVar185 = ZEXT1664((undefined1  [16])0x0);
                  pvVar105 = (void *)0x0;
                  while (pvVar56 = pvVar105, (int)((uint)pvVar56 | 7) < (int)local_570) {
                    lVar109 = (int)((long)((ulong)(uint)((int)(uint)pvVar56 >> 0x1f) << 0x20 |
                                          (ulong)pvVar56 & 0xffffffff) / (long)iVar52) * lVar85;
                    for (lVar79 = 0; lVar59 != lVar79; lVar79 = lVar79 + 4) {
                      lVar84 = (long)*(int *)(opt_q._0_8_ + lVar79);
                      puVar76 = (ulong *)(*local_428 + lVar84 + lVar109);
                      puVar57 = (ulong *)(local_4c0 + lVar109 + lVar84);
                      puVar2 = (ulong *)((long)local_488.data +
                                        lVar84 + lVar109 + iVar80 * auVar130._0_4_ + lVar88);
                      puVar102 = (ulong *)(lVar84 + lVar109 + local_500);
                      if (iVar52 == 8) {
                        auVar189._8_8_ = 0;
                        auVar189._0_8_ = *puVar76;
                        auVar197._8_8_ = 0;
                        auVar197._0_8_ = *puVar57;
                        auVar203._8_8_ = 0;
                        auVar203._0_8_ = *puVar2;
                        auVar207._8_8_ = 0;
                        auVar207._0_8_ = *puVar102;
                      }
                      else {
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar76),
                                               (uint)*(byte *)((long)puVar76 + lVar63),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar63 * 2),
                                               2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar113),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar63 * 4),
                                               4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar62),6);
                        auVar189 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar65),7);
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar57),
                                               (uint)*(byte *)((long)puVar57 + lVar63),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar63 * 2),
                                               2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar113),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar63 * 4),
                                               4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar62),6);
                        auVar197 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar65),7);
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar2),
                                               (uint)*(byte *)((long)puVar2 + lVar63),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar63 * 2),2
                                              );
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar113),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar63 * 4),4
                                              );
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar62),6);
                        auVar203 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar65),7);
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar102),
                                               (uint)*(byte *)((long)puVar102 + lVar63),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar63 * 2)
                                               ,2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar113),3)
                        ;
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar63 * 4)
                                               ,4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar62),6);
                        auVar207 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar65),7);
                      }
                      auVar174 = vpmovsxbw_avx(auVar189);
                      auVar158 = vpmovsxbw_avx(auVar197);
                      auVar147 = vpmovsxbw_avx(auVar203);
                      auVar141 = vpmovsxbw_avx(auVar207);
                      auVar137 = *(undefined1 (*) [16])((long)local_5b0 + lVar79 * 4);
                      auVar154 = vpcmpgtb_avx((undefined1  [16])0x0,auVar137);
                      auVar186 = vpunpcklbw_avx(auVar137,auVar154);
                      auVar154 = vpunpckhbw_avx(auVar137,auVar154);
                      auVar137 = vpmaddwd_avx(auVar174,auVar186);
                      auVar137 = vpaddd_avx(auVar137,auVar185._0_16_);
                      auVar185 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar174,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar175._0_16_);
                      auVar175 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar158,auVar186);
                      auVar137 = vpaddd_avx(auVar137,auVar180._0_16_);
                      auVar180 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar158,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar161._0_16_);
                      auVar161 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar147,auVar186);
                      auVar137 = vpaddd_avx(auVar137,auVar169._0_16_);
                      auVar169 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar147,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar151._0_16_);
                      auVar151 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar141,auVar186);
                      auVar137 = vpaddd_avx(auVar137,auVar156._0_16_);
                      auVar156 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar141,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar144._0_16_);
                      auVar144 = ZEXT1664(auVar137);
                    }
                    local_5b0 = (void *)((long)local_5b0 + (long)pauVar82 * 0x10);
                    local_490 = pvVar56;
                    pvVar105 = (void *)((long)pvVar56 + 8);
                  }
                  auVar137 = vpunpckldq_avx(auVar185._0_16_,auVar180._0_16_);
                  auVar141 = vpunpckldq_avx(auVar169._0_16_,auVar156._0_16_);
                  auVar154 = vpunpckhdq_avx(auVar185._0_16_,auVar180._0_16_);
                  auVar174 = vpunpckhdq_avx(auVar169._0_16_,auVar156._0_16_);
                  auVar186 = vpunpckldq_avx(auVar175._0_16_,auVar161._0_16_);
                  auVar140 = vpunpckldq_avx(auVar151._0_16_,auVar144._0_16_);
                  auVar158 = vpunpckhdq_avx(auVar175._0_16_,auVar161._0_16_);
                  auVar147 = vpunpckhdq_avx(auVar151._0_16_,auVar144._0_16_);
                  auVar177 = vpunpcklqdq_avx(auVar137,auVar141);
                  auVar137 = vpunpckhqdq_avx(auVar137,auVar141);
                  auVar137 = vpaddd_avx(auVar177,auVar137);
                  auVar141 = vpunpcklqdq_avx(auVar154,auVar174);
                  auVar154 = vpunpckhqdq_avx(auVar154,auVar174);
                  auVar154 = vpaddd_avx(auVar154,auVar141);
                  auVar137 = vpaddd_avx(auVar137,auVar154);
                  auVar144 = ZEXT1664(auVar137);
                  auVar154 = vpunpcklqdq_avx(auVar186,auVar140);
                  auVar137 = vpunpckhqdq_avx(auVar186,auVar140);
                  auVar137 = vpaddd_avx(auVar154,auVar137);
                  auVar174 = vpunpcklqdq_avx(auVar158,auVar147);
                  auVar154 = vpunpckhqdq_avx(auVar158,auVar147);
                  auVar154 = vpaddd_avx(auVar154,auVar174);
                  auVar137 = vpaddd_avx(auVar137,auVar154);
                  auVar151 = ZEXT1664(auVar137);
                  local_520 = (long)local_488.data +
                              ((int)uVar121 % local_418.w) * (int)local_518 + lVar123;
                  local_508 = (long)local_488.data + iVar119 * (int)local_518 + lVar112;
                  local_4f8 = (long)local_488.data + iVar80 * (int)local_518 + lVar88;
                  lVar70 = iVar92 * (int)local_518 + lVar70;
                  for (; (long)((ulong)pvVar56 | 1) < lVar69; pvVar56 = (void *)((long)pvVar56 + 2))
                  {
                    lVar112 = (long)pvVar56 * lVar85;
                    lVar123 = lVar112 + lVar70;
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      lVar88 = (long)*(int *)(opt_q._0_8_ + (long)pauVar64 * 4);
                      auVar137 = vpinsrw_avx(ZEXT416((uint)(int)*(char *)(local_520 + lVar112 +
                                                                         lVar88)),
                                             (int)*(char *)(lVar63 + local_520 + lVar112 + lVar88),1
                                            );
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)(local_508 + lVar112 + lVar88),2
                                            );
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)(lVar63 + local_508 + lVar112 +
                                                                              lVar88),3);
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)(local_4f8 + lVar112 + lVar88),4
                                            );
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)(lVar63 + local_4f8 + lVar112 +
                                                                              lVar88),5);
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)((long)local_488.data +
                                                                    lVar88 + lVar123),6);
                      auVar154 = vpinsrw_avx(auVar137,(int)*(char *)((long)local_488.data +
                                                                    lVar63 + lVar88 + lVar123),7);
                      auVar137 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_5b0 + (long)pauVar64 * 4)
                                                    ),(uint)*(byte *)((long)local_5b0 +
                                                                     (long)pauVar64 * 4 + 2),1);
                      auVar174 = vpmovsxbw_avx(auVar137);
                      auVar137 = vpinsrb_avx(ZEXT116(*(byte *)((long)local_5b0 +
                                                              (long)pauVar64 * 4 + 1)),
                                             (uint)*(byte *)((long)local_5b0 +
                                                            (long)pauVar64 * 4 + 3),1);
                      auVar174 = vpshufd_avx(auVar174,0);
                      auVar137 = vpmovsxbw_avx(auVar137);
                      auVar158 = vpshufd_avx(auVar137,0);
                      auVar137 = vpmaddwd_avx(auVar154,auVar174);
                      auVar137 = vpaddd_avx(auVar137,auVar144._0_16_);
                      auVar144 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar154,auVar158);
                      auVar137 = vpaddd_avx(auVar137,auVar151._0_16_);
                      auVar151 = ZEXT1664(auVar137);
                    }
                    local_5b0 = (void *)((long)local_5b0 + lVar59);
                  }
                  for (; (long)pvVar56 < lVar69; pvVar56 = (void *)((long)pvVar56 + 1)) {
                    lVar123 = (long)pvVar56 * lVar85;
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      lVar112 = (long)*(int *)(opt_q._0_8_ + (long)pauVar64 * 4);
                      auVar137 = vpinsrb_avx(ZEXT116(*(byte *)(local_520 + lVar123 + lVar112)),
                                             (uint)*(byte *)(local_508 + lVar123 + lVar112),1);
                      auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)(local_4f8 + lVar123 + lVar112)
                                             ,2);
                      auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)local_488.data +
                                                                     lVar112 + lVar123 + lVar70),3);
                      auVar137 = vpmovsxbw_avx(auVar137);
                      auVar174 = vpshufd_avx(auVar137,0x44);
                      auVar137 = vpmovsxbw_avx(ZEXT216(*(ushort *)
                                                        ((long)local_5b0 + (long)pauVar64 * 2)));
                      auVar137 = vpshuflw_avx(auVar137,0x50);
                      auVar137 = vpshufd_avx(auVar137,0x50);
                      auVar154 = vpmullw_avx(auVar137,auVar174);
                      auVar137 = vpmulhw_avx(auVar174,auVar137);
                      auVar174 = vpunpcklwd_avx(auVar154,auVar137);
                      auVar154 = vpunpckhwd_avx(auVar154,auVar137);
                      auVar137 = vpaddd_avx(auVar144._0_16_,auVar174);
                      auVar144 = ZEXT1664(auVar137);
                      auVar137 = vpaddd_avx(auVar151._0_16_,auVar154);
                      auVar151 = ZEXT1664(auVar137);
                    }
                    local_5b0 = (void *)((long)local_5b0 + lVar60);
                  }
                  *pauVar124 = auVar144._0_16_;
                  *pauVar118 = auVar151._0_16_;
                  pauVar64 = pauVar124 + 1;
                  pauVar54 = pauVar118 + 1;
                  local_4a0 = pauVar124;
                  local_430 = pauVar118;
                }
                local_4d0 = (int *)((this->weight_data_tm).cstep * lVar75 *
                                    (this->weight_data_tm).elemsize +
                                   (long)(this->weight_data_tm).data);
                for (; pauVar54 = pauVar118, pauVar64 = pauVar124, (int)(uVar121 | 1) < iVar53;
                    uVar121 = uVar121 + 2) {
                  local_4c8 = CONCAT44(local_4c8._4_4_,uVar121);
                  iVar119 = (int)uVar121 % local_418.w;
                  uVar96 = CONCAT44((int)(uVar121 | 1) >> 0x1f,uVar121) | 1;
                  iVar80 = (int)((long)uVar96 % (long)local_418.w);
                  local_508 = CONCAT44(local_508._4_4_,iVar119);
                  local_4f8 = CONCAT44(local_4f8._4_4_,iVar80);
                  lVar112 = local_488.cstep * local_488.elemsize;
                  lVar70 = (long)(((int)uVar121 / local_418.w) * (int)local_4e0) *
                           (long)local_488.w * local_488.elemsize;
                  local_520 = (long)local_488.data + iVar119 * auVar130._0_4_ + lVar70;
                  lVar123 = (long)((int)((long)uVar96 / (long)local_418.w) * (int)local_4e0) *
                            (long)local_488.w * local_488.elemsize;
                  auVar144 = ZEXT1664((undefined1  [16])0x0);
                  auVar151 = ZEXT1664((undefined1  [16])0x0);
                  auVar156 = ZEXT1664((undefined1  [16])0x0);
                  auVar161 = ZEXT1664((undefined1  [16])0x0);
                  piVar77 = local_4d0;
                  for (uVar96 = 0; (int)((uint)uVar96 | 7) < (int)local_570; uVar96 = uVar96 + 8) {
                    lVar85 = (int)((long)((ulong)(uint)((int)(uint)uVar96 >> 0x1f) << 0x20 |
                                         uVar96 & 0xffffffff) / (long)iVar52) * lVar112;
                    for (lVar88 = 0; lVar59 != lVar88; lVar88 = lVar88 + 4) {
                      puVar76 = (ulong *)(local_520 + lVar85 + (long)*(int *)(opt_q._0_8_ + lVar88))
                      ;
                      puVar57 = (ulong *)((long)local_488.data +
                                         (long)*(int *)(opt_q._0_8_ + lVar88) +
                                         lVar85 + iVar80 * auVar130._0_4_ + lVar123);
                      if (iVar52 == 8) {
                        auVar165._8_8_ = 0;
                        auVar165._0_8_ = *puVar76;
                        auVar172._8_8_ = 0;
                        auVar172._0_8_ = *puVar57;
                      }
                      else {
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar76),
                                               (uint)*(byte *)((long)puVar76 + lVar63),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar63 * 2),
                                               2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar113),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar63 * 4),
                                               4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar62),6);
                        auVar165 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar65),7);
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar57),
                                               (uint)*(byte *)((long)puVar57 + lVar63),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar63 * 2),
                                               2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar113),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar63 * 4),
                                               4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar62),6);
                        auVar172 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar65),7);
                      }
                      auVar174 = vpmovsxbw_avx(auVar165);
                      auVar158 = vpmovsxbw_avx(auVar172);
                      auVar137 = *(undefined1 (*) [16])(piVar77 + lVar88);
                      auVar154 = vpcmpgtb_avx((undefined1  [16])0x0,auVar137);
                      auVar147 = vpunpcklbw_avx(auVar137,auVar154);
                      auVar154 = vpunpckhbw_avx(auVar137,auVar154);
                      auVar137 = vpmaddwd_avx(auVar147,auVar174);
                      auVar137 = vpaddd_avx(auVar137,auVar161._0_16_);
                      auVar161 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar174,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar156._0_16_);
                      auVar156 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar147,auVar158);
                      auVar137 = vpaddd_avx(auVar137,auVar151._0_16_);
                      auVar151 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar158,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar144._0_16_);
                      auVar144 = ZEXT1664(auVar137);
                    }
                    piVar77 = piVar77 + (long)pauVar82 * 4;
                  }
                  auVar137 = vphaddd_avx(auVar161._0_16_,auVar161._0_16_);
                  auVar137 = vphaddd_avx(auVar137,auVar137);
                  auVar154 = vphaddd_avx(auVar156._0_16_,auVar156._0_16_);
                  auVar154 = vphaddd_avx(auVar154,auVar154);
                  auVar174 = vphaddd_avx(auVar151._0_16_,auVar151._0_16_);
                  auVar174 = vphaddd_avx(auVar174,auVar174);
                  iVar107 = auVar137._0_4_;
                  auVar137 = vphaddd_avx(auVar144._0_16_,auVar144._0_16_);
                  iVar98 = auVar154._0_4_;
                  auVar137 = vphaddd_avx(auVar137,auVar137);
                  iVar78 = auVar174._0_4_;
                  iVar92 = auVar137._0_4_;
                  lVar70 = iVar119 * (int)local_518 + lVar70;
                  lVar123 = iVar80 * (int)local_518 + lVar123;
                  while (uVar97 = uVar96, (long)(uVar97 | 1) < lVar69) {
                    lVar85 = uVar97 * lVar112 + lVar70;
                    lVar88 = uVar97 * lVar112 + lVar123;
                    for (pauVar124 = (undefined1 (*) [16])0x0; pauVar82 != pauVar124;
                        pauVar124 = (undefined1 (*) [16])(*pauVar124 + 1)) {
                      lVar109 = (long)*(int *)(opt_q._0_8_ + (long)pauVar124 * 4);
                      iVar122 = (int)*(char *)((long)local_488.data + lVar109 + lVar85);
                      iVar80 = (int)*(char *)((long)piVar77 + (long)pauVar124 * 4 + 1);
                      iVar119 = (int)*(char *)((long)local_488.data + lVar63 + lVar109 + lVar85);
                      iVar99 = (int)*(char *)((long)local_488.data + lVar109 + lVar88);
                      iVar74 = (int)*(char *)((long)piVar77 + (long)pauVar124 * 4 + 2);
                      iVar107 = iVar74 * iVar119 +
                                (char)piVar77[(long)pauVar124] * iVar122 + iVar107;
                      iVar93 = (int)*(char *)((long)piVar77 + (long)pauVar124 * 4 + 3);
                      iVar98 = iVar119 * iVar93 + iVar122 * iVar80 + iVar98;
                      iVar119 = (int)*(char *)((long)local_488.data + lVar63 + lVar109 + lVar88);
                      iVar78 = iVar74 * iVar119 + (char)piVar77[(long)pauVar124] * iVar99 + iVar78;
                      iVar92 = iVar119 * iVar93 + iVar99 * iVar80 + iVar92;
                    }
                    piVar77 = piVar77 + (long)pauVar82;
                    local_520 = uVar97;
                    uVar96 = uVar97 + 2;
                  }
                  for (; (long)uVar97 < lVar69; uVar97 = uVar97 + 1) {
                    for (pauVar124 = (undefined1 (*) [16])0x0; pauVar82 != pauVar124;
                        pauVar124 = (undefined1 (*) [16])(*pauVar124 + 1)) {
                      lVar85 = (long)*(int *)(opt_q._0_8_ + (long)pauVar124 * 4);
                      iVar80 = (int)*(char *)((long)local_488.data +
                                             lVar85 + uVar97 * lVar112 + lVar70);
                      iVar74 = (int)*(char *)((long)piVar77 + (long)pauVar124 * 2);
                      iVar107 = iVar107 + iVar74 * iVar80;
                      iVar119 = (int)*(char *)((long)piVar77 + (long)pauVar124 * 2 + 1);
                      iVar98 = iVar98 + iVar80 * iVar119;
                      iVar80 = (int)*(char *)((long)local_488.data +
                                             lVar85 + uVar97 * lVar112 + lVar123);
                      iVar78 = iVar78 + iVar74 * iVar80;
                      iVar92 = iVar92 + iVar80 * iVar119;
                    }
                    piVar77 = (int *)((long)piVar77 + lVar60);
                  }
                  *(int *)*pauVar64 = iVar107;
                  *(int *)(*pauVar64 + 4) = iVar78;
                  *(int *)*pauVar54 = iVar98;
                  *(int *)(*pauVar54 + 4) = iVar92;
                  pauVar124 = (undefined1 (*) [16])(*pauVar64 + 8);
                  pauVar118 = (undefined1 (*) [16])(*pauVar54 + 8);
                  local_4a0 = pauVar64;
                  local_430 = pauVar54;
                }
                sVar18 = (this->weight_data_tm).cstep;
                sVar16 = (this->weight_data_tm).elemsize;
                pvVar105 = (this->weight_data_tm).data;
                for (; pauVar124 = pauVar64, (int)uVar121 < iVar53; uVar121 = uVar121 + 1) {
                  local_4c8 = CONCAT44(local_4c8._4_4_,uVar121);
                  lVar123 = local_488.cstep * local_488.elemsize;
                  lVar70 = (long)local_488.w * local_488.elemsize *
                           (long)(((int)uVar121 / local_418.w) * (int)local_4e0);
                  auVar144 = ZEXT1664((undefined1  [16])0x0);
                  auVar151 = ZEXT1664((undefined1  [16])0x0);
                  pvVar56 = (void *)(lVar75 * sVar18 * sVar16 + (long)pvVar105);
                  for (uVar96 = 0; (int)((uint)uVar96 | 7) < (int)local_570; uVar96 = uVar96 + 8) {
                    for (lVar112 = 0; lVar59 != lVar112; lVar112 = lVar112 + 4) {
                      puVar76 = (ulong *)((long)local_488.data +
                                         (long)*(int *)(opt_q._0_8_ + lVar112) +
                                         (int)((long)((ulong)(uint)((int)(uint)uVar96 >> 0x1f) <<
                                                      0x20 | uVar96 & 0xffffffff) / (long)iVar52) *
                                         lVar123 + ((int)uVar121 % local_418.w) * auVar130._0_4_ +
                                                   lVar70);
                      if (iVar52 == 8) {
                        auVar152._8_8_ = 0;
                        auVar152._0_8_ = *puVar76;
                      }
                      else {
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar76),
                                               (uint)*(byte *)((long)puVar76 + lVar63),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar63 * 2),
                                               2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar113),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar63 * 4),
                                               4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar66),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar62),6);
                        auVar152 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar65),7);
                      }
                      auVar174 = vpmovsxbw_avx(auVar152);
                      auVar137 = *(undefined1 (*) [16])((long)pvVar56 + lVar112 * 4);
                      auVar154 = vpcmpgtb_avx((undefined1  [16])0x0,auVar137);
                      auVar158 = vpunpcklbw_avx(auVar137,auVar154);
                      auVar154 = vpunpckhbw_avx(auVar137,auVar154);
                      auVar137 = vpmaddwd_avx(auVar174,auVar158);
                      auVar137 = vpaddd_avx(auVar137,auVar144._0_16_);
                      auVar144 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar174,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar151._0_16_);
                      auVar151 = ZEXT1664(auVar137);
                    }
                    pvVar56 = (void *)((long)pvVar56 + (long)pauVar82 * 0x10);
                  }
                  auVar137 = vphaddd_avx(auVar144._0_16_,auVar144._0_16_);
                  auVar137 = vphaddd_avx(auVar137,auVar137);
                  auVar154 = vphaddd_avx(auVar151._0_16_,auVar151._0_16_);
                  iVar80 = auVar137._0_4_;
                  auVar137 = vphaddd_avx(auVar154,auVar154);
                  iVar119 = auVar137._0_4_;
                  lVar70 = ((int)uVar121 % local_418.w) * (int)local_518 + lVar70;
                  for (; (long)(uVar96 | 1) < lVar69; uVar96 = uVar96 + 2) {
                    lVar112 = uVar96 * lVar123 + lVar70;
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      lVar85 = (long)*(int *)(opt_q._0_8_ + (long)pauVar64 * 4);
                      iVar92 = (int)*(char *)((long)local_488.data + lVar85 + lVar112);
                      iVar78 = (int)*(char *)((long)local_488.data + lVar63 + lVar85 + lVar112);
                      iVar80 = *(char *)((long)pvVar56 + (long)pauVar64 * 4 + 2) * iVar78 +
                               *(char *)((long)pvVar56 + (long)pauVar64 * 4) * iVar92 + iVar80;
                      iVar119 = *(char *)((long)pvVar56 + (long)pauVar64 * 4 + 3) * iVar78 +
                                *(char *)((long)pvVar56 + (long)pauVar64 * 4 + 1) * iVar92 + iVar119
                      ;
                    }
                    pvVar56 = (void *)((long)pvVar56 + lVar59);
                  }
                  for (; (long)uVar96 < lVar69; uVar96 = uVar96 + 1) {
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      iVar92 = (int)*(char *)((long)local_488.data +
                                             (long)*(int *)(opt_q._0_8_ + (long)pauVar64 * 4) +
                                             uVar96 * lVar123 + lVar70);
                      iVar80 = iVar80 + *(char *)((long)pvVar56 + (long)pauVar64 * 2) * iVar92;
                      iVar119 = iVar119 + *(char *)((long)pvVar56 + (long)pauVar64 * 2 + 1) * iVar92
                      ;
                    }
                    pvVar56 = (void *)((long)pvVar56 + lVar60);
                  }
                  *(int *)*pauVar124 = iVar80;
                  *(int *)*pauVar54 = iVar119;
                  pauVar54 = (undefined1 (*) [16])(*pauVar54 + 4);
                  pauVar64 = (undefined1 (*) [16])(*pauVar124 + 4);
                  local_4a0 = pauVar124;
                }
              }
              local_328._0_4_ = (int)local_328 * local_41c;
              lVar62 = (long)(local_ac * iVar52);
              lVar59 = lVar62 * 3;
              lVar113 = lVar62 * 5;
              lVar66 = lVar62 * 6;
              lVar75 = lVar62 * 7;
              uVar61 = (long)(int)(auVar130._4_4_ + (int)uVar61 * 2);
              while (uVar90 = uVar61, (long)uVar90 < (long)uVar71) {
                auVar130._4_4_ = (int)uVar90 >> 0x1f;
                uVar61 = (ulong)auVar130._4_4_ << 0x20 | uVar90 & 0xffffffff;
                local_430 = (undefined1 (*) [16])
                            (long)((int)((long)((ulong)auVar130._4_4_ << 0x20 | uVar90 & 0xffffffff)
                                        % 2) + (int)((long)uVar61 / 4) +
                                  (int)(char)((char)((long)uVar61 % 4) / '\x02'));
                pauVar64 = (undefined1 (*) [16])
                           (local_418.cstep * uVar90 * local_418.elemsize + (long)local_418.data);
                for (auVar130._4_4_ = 0; pauVar54 = pauVar64,
                    (int)(auVar130._4_4_ | 3) < (int)local_328; auVar130._4_4_ = auVar130._4_4_ + 4)
                {
                  uVar61 = CONCAT44((int)(auVar130._4_4_ | 1) >> 0x1f,auVar130._4_4_) | 1;
                  local_4c0 = CONCAT44(local_4c0._4_4_,auVar130._4_4_);
                  uVar86 = CONCAT44((int)(auVar130._4_4_ | 2) >> 0x1f,auVar130._4_4_) | 2;
                  uVar96 = CONCAT44((int)(auVar130._4_4_ | 3) >> 0x1f,auVar130._4_4_) | 3;
                  pvVar105 = (void *)((this->weight_data_tm).cstep * (long)local_430 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  iVar119 = (int)((long)uVar61 % (long)local_41c);
                  local_500 = CONCAT44(local_500._4_4_,iVar119);
                  iVar80 = (int)((long)uVar86 % (long)local_41c);
                  local_4a0 = (undefined1 (*) [16])CONCAT44(local_4a0._4_4_,iVar80);
                  lVar112 = local_488.cstep * local_488.elemsize;
                  lVar70 = (long)local_488.w * local_488.elemsize;
                  iVar53 = (int)((long)uVar96 % (long)local_41c);
                  local_4c8 = CONCAT44(local_4c8._4_4_,iVar53);
                  lVar123 = (((int)auVar130._4_4_ / local_41c) * (int)local_4e0) * lVar70;
                  lVar65 = ((int)((long)uVar61 / (long)local_41c) * (int)local_4e0) * lVar70;
                  lVar63 = ((int)((long)uVar86 / (long)local_41c) * (int)local_4e0) * lVar70;
                  lVar70 = ((int)((long)uVar96 / (long)local_41c) * (int)local_4e0) * lVar70;
                  local_508 = (long)local_488.data +
                              ((int)auVar130._4_4_ % local_41c) * auVar130._0_4_ + lVar123;
                  local_4f8 = (long)local_488.data + iVar119 * auVar130._0_4_ + lVar65;
                  local_4d0 = (int *)((long)local_488.data + iVar80 * auVar130._0_4_ + lVar63);
                  local_490 = (void *)((long)local_488.data + iVar53 * auVar130._0_4_ + lVar70);
                  auVar144 = ZEXT1664((undefined1  [16])0x0);
                  auVar151 = ZEXT1664((undefined1  [16])0x0);
                  auVar156 = ZEXT1664((undefined1  [16])0x0);
                  auVar161 = ZEXT1664((undefined1  [16])0x0);
                  uVar61 = 0;
                  while (uVar86 = uVar61, (int)((uint)uVar86 | 7) < (int)local_570) {
                    lVar85 = (int)((long)((ulong)(uint)((int)(uint)uVar86 >> 0x1f) << 0x20 |
                                         uVar86 & 0xffffffff) / (long)iVar52) * lVar112;
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      lVar88 = (long)*(int *)(opt_q._0_8_ + (long)pauVar64 * 4);
                      puVar76 = (ulong *)(local_508 + lVar85 + lVar88);
                      puVar57 = (ulong *)(lVar88 + local_4f8 + lVar85);
                      puVar2 = (ulong *)((long)local_4d0 + lVar88 + lVar85);
                      puVar102 = (ulong *)((long)local_490 + lVar88 + lVar85);
                      if (iVar52 == 8) {
                        auVar157._8_8_ = 0;
                        auVar157._0_8_ = *puVar76;
                        auVar166._8_8_ = 0;
                        auVar166._0_8_ = *puVar57;
                        auVar173._8_8_ = 0;
                        auVar173._0_8_ = *puVar2;
                        auVar179._8_8_ = 0;
                        auVar179._0_8_ = *puVar102;
                      }
                      else {
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar76),
                                               (uint)*(byte *)((long)puVar76 + lVar62),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar62 * 2),
                                               2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar59),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar62 * 4),
                                               4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar113),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar66),6);
                        auVar157 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar75),7);
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar57),
                                               (uint)*(byte *)((long)puVar57 + lVar62),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar62 * 2),
                                               2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar59),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar62 * 4),
                                               4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar113),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar66),6);
                        auVar166 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar75),7);
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar2),
                                               (uint)*(byte *)((long)puVar2 + lVar62),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar62 * 2),2
                                              );
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar59),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar62 * 4),4
                                              );
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar113),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar66),6);
                        auVar173 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar2 + lVar75),7);
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar102),
                                               (uint)*(byte *)((long)puVar102 + lVar62),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar62 * 2)
                                               ,2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar59),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar62 * 4)
                                               ,4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar113),5)
                        ;
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar66),6);
                        auVar179 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar102 + lVar75),7);
                      }
                      auVar137 = vpmovsxbw_avx(auVar157);
                      auVar154 = vpmovsxbw_avx(auVar166);
                      auVar174 = vpmovsxbw_avx(auVar173);
                      auVar158 = vpmovsxbw_avx(auVar179);
                      auVar11._8_8_ = 0;
                      auVar11._0_8_ = *(ulong *)((long)pvVar105 + (long)pauVar64 * 8);
                      auVar147 = vpmovsxbw_avx(auVar11);
                      auVar137 = vpmaddwd_avx(auVar147,auVar137);
                      auVar137 = vpaddd_avx(auVar137,auVar144._0_16_);
                      auVar144 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar147,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar151._0_16_);
                      auVar151 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar147,auVar174);
                      auVar137 = vpaddd_avx(auVar137,auVar156._0_16_);
                      auVar156 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar147,auVar158);
                      auVar137 = vpaddd_avx(auVar137,auVar161._0_16_);
                      auVar161 = ZEXT1664(auVar137);
                    }
                    pvVar105 = (void *)((long)pvVar105 + local_4f0);
                    local_520 = uVar86;
                    uVar61 = uVar86 + 8;
                  }
                  auVar137 = vphaddd_avx(auVar144._0_16_,auVar151._0_16_);
                  auVar154 = vphaddd_avx(auVar156._0_16_,auVar161._0_16_);
                  auVar137 = vphaddd_avx(auVar137,auVar154);
                  auVar144 = ZEXT1664(auVar137);
                  local_4b8._0_8_ =
                       (long)local_488.data +
                       ((int)auVar130._4_4_ % local_41c) * (int)local_518 + lVar123;
                  lVar65 = iVar119 * (int)local_518 + lVar65;
                  lVar63 = iVar80 * (int)local_518 + lVar63;
                  lVar70 = iVar53 * (int)local_518 + lVar70;
                  for (; (long)(uVar86 | 1) < lVar69; uVar86 = uVar86 + 2) {
                    lVar109 = uVar86 * lVar112;
                    lVar123 = lVar109 + lVar65;
                    lVar85 = lVar109 + lVar63;
                    lVar88 = lVar109 + lVar70;
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      lVar79 = (long)*(int *)(opt_q._0_8_ + (long)pauVar64 * 4);
                      auVar137 = vpinsrw_avx(ZEXT416((uint)(int)*(char *)(local_4b8._0_8_ + lVar109
                                                                         + lVar79)),
                                             (int)*(char *)(lVar62 + local_4b8._0_8_ + lVar109 +
                                                                     lVar79),1);
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)((long)local_488.data +
                                                                    lVar79 + lVar123),2);
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)((long)local_488.data +
                                                                    lVar62 + lVar79 + lVar123),3);
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)((long)local_488.data +
                                                                    lVar79 + lVar85),4);
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)((long)local_488.data +
                                                                    lVar62 + lVar79 + lVar85),5);
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)((long)local_488.data +
                                                                    lVar79 + lVar88),6);
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)((long)local_488.data +
                                                                    lVar62 + lVar79 + lVar88),7);
                      auVar154 = vpmovsxbw_avx(ZEXT216(*(ushort *)
                                                        ((long)pvVar105 + (long)pauVar64 * 2)));
                      auVar154 = vpshufd_avx(auVar154,0);
                      auVar137 = vpmaddwd_avx(auVar137,auVar154);
                      auVar137 = vpaddd_avx(auVar137,auVar144._0_16_);
                      auVar144 = ZEXT1664(auVar137);
                    }
                    pvVar105 = (void *)((long)pvVar105 + lVar60);
                  }
                  for (; (long)uVar86 < lVar69; uVar86 = uVar86 + 1) {
                    lVar123 = uVar86 * lVar112;
                    for (pauVar64 = (undefined1 (*) [16])0x0; pauVar82 != pauVar64;
                        pauVar64 = (undefined1 (*) [16])(*pauVar64 + 1)) {
                      lVar85 = (long)*(int *)(opt_q._0_8_ + (long)pauVar64 * 4);
                      auVar154 = vpshuflw_avx(ZEXT416((uint)(int)(char)(*pauVar64)[(long)pvVar105]),
                                              0);
                      auVar137 = vpinsrw_avx(ZEXT416((int)*(char *)(local_4b8._0_8_ + lVar123 +
                                                                   lVar85) & 0xffff),
                                             (int)*(char *)((long)local_488.data +
                                                           lVar85 + lVar123 + lVar65),1);
                      auVar174 = vpshufd_avx(auVar154,0);
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)((long)local_488.data +
                                                                    lVar85 + lVar123 + lVar63),2);
                      auVar137 = vpinsrw_avx(auVar137,(int)*(char *)((long)local_488.data +
                                                                    lVar85 + lVar123 + lVar70),3);
                      auVar154 = vpmullw_avx(auVar137,auVar174);
                      auVar137 = vpmulhw_avx(auVar137,auVar174);
                      auVar137 = vpunpcklwd_avx(auVar154,auVar137);
                      auVar137 = vpaddd_avx(auVar144._0_16_,auVar137);
                      auVar144 = ZEXT1664(auVar137);
                    }
                    pvVar105 = *pauVar82 + (long)pvVar105;
                  }
                  *pauVar54 = auVar144._0_16_;
                  pauVar64 = pauVar54 + 1;
                  local_428 = pauVar54;
                }
                sVar18 = (this->weight_data_tm).cstep;
                sVar16 = (this->weight_data_tm).elemsize;
                pvVar105 = (this->weight_data_tm).data;
                for (; pauVar64 = pauVar54, (int)(auVar130._4_4_ | 1) < (int)local_328;
                    auVar130._4_4_ = auVar130._4_4_ + 2) {
                  local_4c0 = CONCAT44(local_4c0._4_4_,auVar130._4_4_);
                  uVar61 = CONCAT44((int)(auVar130._4_4_ | 1) >> 0x1f,auVar130._4_4_) | 1;
                  iVar53 = (int)((long)uVar61 % (long)local_41c);
                  lVar70 = local_488.cstep * local_488.elemsize;
                  lVar65 = (long)(((int)auVar130._4_4_ / local_41c) * (int)local_4e0) *
                           (long)local_488.w * local_488.elemsize;
                  lVar63 = (long)((int)((long)uVar61 / (long)local_41c) * (int)local_4e0) *
                           (long)local_488.w * local_488.elemsize;
                  auVar144 = ZEXT1664((undefined1  [16])0x0);
                  auVar151 = ZEXT1664((undefined1  [16])0x0);
                  pvVar56 = (void *)(sVar18 * (long)local_430 * sVar16 + (long)pvVar105);
                  for (uVar61 = 0; (int)((uint)uVar61 | 7) < (int)local_570; uVar61 = uVar61 + 8) {
                    lVar123 = (int)((long)((ulong)(uint)((int)(uint)uVar61 >> 0x1f) << 0x20 |
                                          uVar61 & 0xffffffff) / (long)iVar52) * lVar70;
                    for (pauVar54 = (undefined1 (*) [16])0x0; pauVar82 != pauVar54;
                        pauVar54 = (undefined1 (*) [16])(*pauVar54 + 1)) {
                      lVar112 = (long)*(int *)(opt_q._0_8_ + (long)pauVar54 * 4);
                      puVar76 = (ulong *)((long)local_488.data +
                                         lVar112 + lVar123 + ((int)auVar130._4_4_ % local_41c) *
                                                             auVar130._0_4_ + lVar65);
                      puVar57 = (ulong *)((long)local_488.data +
                                         lVar112 + lVar123 + iVar53 * auVar130._0_4_ + lVar63);
                      if (iVar52 == 8) {
                        auVar145._8_8_ = 0;
                        auVar145._0_8_ = *puVar76;
                        auVar153._8_8_ = 0;
                        auVar153._0_8_ = *puVar57;
                      }
                      else {
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar76),
                                               (uint)*(byte *)((long)puVar76 + lVar62),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar62 * 2),
                                               2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar59),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar62 * 4),
                                               4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar113),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar66),6);
                        auVar145 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar75),7);
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar57),
                                               (uint)*(byte *)((long)puVar57 + lVar62),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar62 * 2),
                                               2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar59),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar62 * 4),
                                               4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar113),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar66),6);
                        auVar153 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar57 + lVar75),7);
                      }
                      auVar137 = vpmovsxbw_avx(auVar145);
                      auVar154 = vpmovsxbw_avx(auVar153);
                      auVar12._8_8_ = 0;
                      auVar12._0_8_ = *(ulong *)((long)pvVar56 + (long)pauVar54 * 8);
                      auVar174 = vpmovsxbw_avx(auVar12);
                      auVar137 = vpmaddwd_avx(auVar137,auVar174);
                      auVar137 = vpaddd_avx(auVar137,auVar144._0_16_);
                      auVar144 = ZEXT1664(auVar137);
                      auVar137 = vpmaddwd_avx(auVar154,auVar174);
                      auVar137 = vpaddd_avx(auVar137,auVar151._0_16_);
                      auVar151 = ZEXT1664(auVar137);
                    }
                    pvVar56 = (void *)((long)pvVar56 + local_4f0);
                  }
                  auVar137 = vphaddd_avx(auVar144._0_16_,auVar144._0_16_);
                  auVar137 = vphaddd_avx(auVar137,auVar137);
                  auVar154 = vphaddd_avx(auVar151._0_16_,auVar151._0_16_);
                  auVar154 = vphaddd_avx(auVar154,auVar154);
                  iVar80 = auVar137._0_4_;
                  iVar119 = auVar154._0_4_;
                  lVar65 = ((int)auVar130._4_4_ % local_41c) * (int)local_518 + lVar65;
                  local_4b8._0_8_ = (long)local_488.data + iVar53 * (int)local_518 + lVar63;
                  for (; (long)(uVar61 | 1) < lVar69; uVar61 = uVar61 + 2) {
                    lVar63 = uVar61 * lVar70 + lVar65;
                    lVar123 = uVar61 * lVar70 + local_4b8._0_8_;
                    for (pauVar54 = (undefined1 (*) [16])0x0; pauVar82 != pauVar54;
                        pauVar54 = (undefined1 (*) [16])(*pauVar54 + 1)) {
                      lVar112 = (long)*(int *)(opt_q._0_8_ + (long)pauVar54 * 4);
                      iVar53 = (int)*(char *)((long)pvVar56 + (long)pauVar54 * 2);
                      iVar92 = (int)*(char *)((long)pvVar56 + (long)pauVar54 * 2 + 1);
                      iVar80 = *(char *)((long)local_488.data + lVar62 + lVar112 + lVar63) * iVar92
                               + *(char *)((long)local_488.data + lVar112 + lVar63) * iVar53 +
                                 iVar80;
                      iVar119 = *(char *)(lVar62 + lVar123 + lVar112) * iVar92 +
                                *(char *)(lVar123 + lVar112) * iVar53 + iVar119;
                    }
                    pvVar56 = (void *)((long)pvVar56 + lVar60);
                  }
                  for (; (long)uVar61 < lVar69; uVar61 = uVar61 + 1) {
                    for (pauVar54 = (undefined1 (*) [16])0x0; pauVar82 != pauVar54;
                        pauVar54 = (undefined1 (*) [16])(*pauVar54 + 1)) {
                      lVar63 = (long)*(int *)(opt_q._0_8_ + (long)pauVar54 * 4);
                      iVar80 = iVar80 + (int)*(char *)((long)local_488.data +
                                                      lVar63 + uVar61 * lVar70 + lVar65) *
                                        (int)(char)(*pauVar54)[(long)pvVar56];
                      iVar119 = iVar119 + (int)*(char *)(uVar61 * lVar70 + local_4b8._0_8_ + lVar63)
                                          * (int)(char)(*pauVar54)[(long)pvVar56];
                    }
                    pvVar56 = *pauVar82 + (long)pvVar56;
                  }
                  *(int *)*pauVar64 = iVar80;
                  *(int *)(*pauVar64 + 4) = iVar119;
                  pauVar54 = (undefined1 (*) [16])(*pauVar64 + 8);
                  local_428 = pauVar64;
                }
                sVar18 = (this->weight_data_tm).cstep;
                sVar16 = (this->weight_data_tm).elemsize;
                pvVar105 = (this->weight_data_tm).data;
                for (; (int)auVar130._4_4_ < (int)local_328; auVar130._4_4_ = auVar130._4_4_ + 1) {
                  lVar63 = local_488.cstep * local_488.elemsize;
                  lVar65 = (long)local_488.w * local_488.elemsize *
                           (long)(((int)auVar130._4_4_ / local_41c) * (int)local_4e0);
                  auVar144 = ZEXT1664((undefined1  [16])0x0);
                  pvVar56 = (void *)((long)local_430 * sVar18 * sVar16 + (long)pvVar105);
                  for (uVar61 = 0; (int)((uint)uVar61 | 7) < (int)local_570; uVar61 = uVar61 + 8) {
                    for (pauVar54 = (undefined1 (*) [16])0x0; pauVar82 != pauVar54;
                        pauVar54 = (undefined1 (*) [16])(*pauVar54 + 1)) {
                      puVar76 = (ulong *)((long)local_488.data +
                                         (long)*(int *)(opt_q._0_8_ + (long)pauVar54 * 4) +
                                         (int)((long)((ulong)(uint)((int)(uint)uVar61 >> 0x1f) <<
                                                      0x20 | uVar61 & 0xffffffff) / (long)iVar52) *
                                         lVar63 + ((int)auVar130._4_4_ % local_41c) * auVar130._0_4_
                                                  + lVar65);
                      if (iVar52 == 8) {
                        auVar135._8_8_ = 0;
                        auVar135._0_8_ = *puVar76;
                      }
                      else {
                        auVar137 = vpinsrb_avx(ZEXT116((byte)*puVar76),
                                               (uint)*(byte *)((long)puVar76 + lVar62),1);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar62 * 2),
                                               2);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar59),3);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar62 * 4),
                                               4);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar113),5);
                        auVar137 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar66),6);
                        auVar135 = vpinsrb_avx(auVar137,(uint)*(byte *)((long)puVar76 + lVar75),7);
                      }
                      auVar13._8_8_ = 0;
                      auVar13._0_8_ = *(ulong *)((long)pvVar56 + (long)pauVar54 * 8);
                      auVar137 = vpmovsxbw_avx(auVar13);
                      auVar154 = vpmovsxbw_avx(auVar135);
                      auVar137 = vpmaddwd_avx(auVar154,auVar137);
                      auVar137 = vpaddd_avx(auVar137,auVar144._0_16_);
                      auVar144 = ZEXT1664(auVar137);
                    }
                    pvVar56 = (void *)((long)pvVar56 + local_4f0);
                  }
                  auVar137 = vphaddd_avx(auVar144._0_16_,auVar144._0_16_);
                  auVar137 = vphaddd_avx(auVar137,auVar137);
                  iVar53 = auVar137._0_4_;
                  lVar65 = ((int)auVar130._4_4_ % local_41c) * (int)local_518 + lVar65;
                  for (; (long)(uVar61 | 1) < lVar69; uVar61 = uVar61 + 2) {
                    lVar70 = uVar61 * lVar63 + lVar65;
                    for (pauVar54 = (undefined1 (*) [16])0x0; pauVar82 != pauVar54;
                        pauVar54 = (undefined1 (*) [16])(*pauVar54 + 1)) {
                      lVar123 = (long)*(int *)(opt_q._0_8_ + (long)pauVar54 * 4);
                      iVar53 = (int)*(char *)((long)pvVar56 + (long)pauVar54 * 2 + 1) *
                               (int)*(char *)((long)local_488.data + lVar62 + lVar123 + lVar70) +
                               (int)*(char *)((long)pvVar56 + (long)pauVar54 * 2) *
                               (int)*(char *)((long)local_488.data + lVar123 + lVar70) + iVar53;
                    }
                    pvVar56 = (void *)((long)pvVar56 + lVar60);
                  }
                  for (; (long)uVar61 < lVar69; uVar61 = uVar61 + 1) {
                    for (pauVar54 = (undefined1 (*) [16])0x0; pauVar82 != pauVar54;
                        pauVar54 = (undefined1 (*) [16])(*pauVar54 + 1)) {
                      iVar53 = iVar53 + (int)(char)(*pauVar54)[(long)pvVar56] *
                                        (int)*(char *)((long)local_488.data +
                                                      (long)*(int *)(opt_q._0_8_ +
                                                                    (long)pauVar54 * 4) +
                                                      uVar61 * lVar63 + lVar65);
                    }
                    pvVar56 = *pauVar82 + (long)pvVar56;
                  }
                  *(int *)*pauVar64 = iVar53;
                  pauVar64 = (undefined1 (*) [16])(*pauVar64 + 4);
                }
                local_438 = uVar90;
                uVar61 = uVar90 + 1;
              }
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
            }
            else {
              convolution_packed_int8_xop
                        (&local_488,&local_418,&this->weight_data_tm,auVar130._0_4_,auVar130._4_4_,
                         auVar130._8_4_,auVar130._12_4_,(int)local_518,(int)local_4e0,local_4e8);
            }
          }
          else {
            convolution_packed_int8_avx2
                      (&local_488,&local_418,&this->weight_data_tm,auVar130._0_4_,auVar130._4_4_,
                       auVar130._8_4_,auVar130._12_4_,(int)local_518,(int)local_4e0,local_4e8);
          }
        }
        pOVar116 = local_4e8;
        uVar121 = local_418.c;
        if (local_4e8->use_packing_layout == true) {
          if (100 < iVar14) {
            if (local_418.elempack == 4) {
              if ((local_418.c & 0x80000001U) == 1) {
                local_208 = 0;
                opt_q.lightmode = false;
                opt_q.use_shader_pack8 = false;
                opt_q.use_subgroup_ops = false;
                opt_q.use_reserved_0 = false;
                opt_q.num_threads = 0;
                opt_q.blob_allocator._0_4_ = 0;
                opt_q.blob_allocator._4_4_ = 0;
                opt_q.workspace_allocator._0_4_ = 0;
                opt_q.workspace_allocator._4_4_ = 0;
                opt_q.openmp_blocktime = 0;
                opt_q.use_bf16_storage = false;
                opt_q.use_fp16_packed = false;
                opt_q.use_fp16_storage = false;
                opt_q.use_fp16_arithmetic = false;
                opt_q.use_int8_packed = false;
                opt_q.use_int8_storage = false;
                opt_q.use_int8_arithmetic = false;
                opt_q.use_packing_layout = false;
                opt_q.vulkan_device_index = 0;
                opt_q.use_reserved_1 = false;
                opt_q.use_image_storage = false;
                opt_q.use_tensor_storage = false;
                opt_q.use_reserved_2 = false;
                opt_q.flush_denormals = 0;
                opt_q.use_local_pool_allocator = false;
                opt_q.use_shader_local_memory = false;
                opt_q.use_cooperative_matrix = false;
                opt_q.use_winograd23_convolution = false;
                opt_q.use_winograd43_convolution = false;
                opt_q.use_winograd63_convolution = false;
                opt_q.use_a53_a55_optimized_kernel = false;
                opt_q.use_fp16_uniform = false;
                convert_packing(&local_418,(Mat *)&opt_q,1,local_4e8);
                piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                if (piVar77 != (int *)0x0) {
                  LOCK();
                  *piVar77 = *piVar77 + 1;
                  UNLOCK();
                }
                piVar77 = (int *)CONCAT44(local_418.refcount._4_4_,local_418.refcount._0_4_);
                if (piVar77 != (int *)0x0) {
                  LOCK();
                  *piVar77 = *piVar77 + -1;
                  UNLOCK();
                  if (*piVar77 == 0) {
                    if (local_418.allocator == (Allocator *)0x0) {
                      free(local_418.data);
                    }
                    else {
                      (*(local_418.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                local_418.data = (void *)opt_q._0_8_;
                local_418.refcount._0_4_ = opt_q.blob_allocator._0_4_;
                local_418.refcount._4_4_ = opt_q.blob_allocator._4_4_;
                local_418.elemsize =
                     CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
                local_418.elempack = opt_q.openmp_blocktime;
                local_418.allocator = (Allocator *)opt_q._32_8_;
                local_418.dims = opt_q.vulkan_device_index;
                local_418.w._0_1_ = opt_q.use_reserved_1;
                local_418.w._1_1_ = opt_q.use_image_storage;
                local_418.w._2_1_ = opt_q.use_tensor_storage;
                local_418.w._3_1_ = opt_q.use_reserved_2;
                local_418.h = opt_q.flush_denormals;
                local_418.d._0_1_ = opt_q.use_local_pool_allocator;
                local_418.d._1_1_ = opt_q.use_shader_local_memory;
                local_418.d._2_1_ = opt_q.use_cooperative_matrix;
                local_418.d._3_1_ = opt_q.use_winograd23_convolution;
                local_418.c._0_1_ = opt_q.use_winograd43_convolution;
                local_418.c._1_1_ = opt_q.use_winograd63_convolution;
                local_418.c._2_1_ = opt_q.use_a53_a55_optimized_kernel;
                local_418.c._3_1_ = opt_q.use_fp16_uniform;
                local_418.cstep = local_208;
                if (piVar77 != (int *)0x0) {
                  LOCK();
                  *piVar77 = *piVar77 + -1;
                  UNLOCK();
                  if (*piVar77 == 0) {
                    if (opt_q._32_8_ == 0) {
                      free((void *)opt_q._0_8_);
                    }
                    else {
                      (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                    }
                  }
                }
                uVar121 = local_418.c;
                if (local_418.elempack != 4) goto LAB_00207809;
              }
              uVar121 = local_418.c;
              if ((local_418.c & 1U) == 0) {
                local_208 = 0;
                opt_q.lightmode = false;
                opt_q.use_shader_pack8 = false;
                opt_q.use_subgroup_ops = false;
                opt_q.use_reserved_0 = false;
                opt_q.num_threads = 0;
                opt_q.blob_allocator._0_4_ = 0;
                opt_q.blob_allocator._4_4_ = 0;
                opt_q.workspace_allocator._0_4_ = 0;
                opt_q.workspace_allocator._4_4_ = 0;
                opt_q.openmp_blocktime = 0;
                opt_q.use_bf16_storage = false;
                opt_q.use_fp16_packed = false;
                opt_q.use_fp16_storage = false;
                opt_q.use_fp16_arithmetic = false;
                opt_q.use_int8_packed = false;
                opt_q.use_int8_storage = false;
                opt_q.use_int8_arithmetic = false;
                opt_q.use_packing_layout = false;
                opt_q.vulkan_device_index = 0;
                opt_q.use_reserved_1 = false;
                opt_q.use_image_storage = false;
                opt_q.use_tensor_storage = false;
                opt_q.use_reserved_2 = false;
                opt_q.flush_denormals = 0;
                opt_q.use_local_pool_allocator = false;
                opt_q.use_shader_local_memory = false;
                opt_q.use_cooperative_matrix = false;
                opt_q.use_winograd23_convolution = false;
                opt_q.use_winograd43_convolution = false;
                opt_q.use_winograd63_convolution = false;
                opt_q.use_a53_a55_optimized_kernel = false;
                opt_q.use_fp16_uniform = false;
                convert_packing(&local_418,(Mat *)&opt_q,8,pOVar116);
                piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                if (piVar77 != (int *)0x0) {
                  LOCK();
                  *piVar77 = *piVar77 + 1;
                  UNLOCK();
                }
                piVar77 = (int *)CONCAT44(local_418.refcount._4_4_,local_418.refcount._0_4_);
                if (piVar77 != (int *)0x0) {
                  LOCK();
                  *piVar77 = *piVar77 + -1;
                  UNLOCK();
                  if (*piVar77 == 0) {
                    if (local_418.allocator == (Allocator *)0x0) {
                      free(local_418.data);
                    }
                    else {
                      (*(local_418.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                local_418.data = (void *)opt_q._0_8_;
                local_418.refcount._0_4_ = opt_q.blob_allocator._0_4_;
                local_418.refcount._4_4_ = opt_q.blob_allocator._4_4_;
                local_418.elemsize =
                     CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
                local_418.elempack = opt_q.openmp_blocktime;
                local_418.allocator = (Allocator *)opt_q._32_8_;
                local_418.dims = opt_q.vulkan_device_index;
                local_418.w._0_1_ = opt_q.use_reserved_1;
                local_418.w._1_1_ = opt_q.use_image_storage;
                local_418.w._2_1_ = opt_q.use_tensor_storage;
                local_418.w._3_1_ = opt_q.use_reserved_2;
                local_418.h = opt_q.flush_denormals;
                local_418.d._0_1_ = opt_q.use_local_pool_allocator;
                local_418.d._1_1_ = opt_q.use_shader_local_memory;
                local_418.d._2_1_ = opt_q.use_cooperative_matrix;
                local_418.d._3_1_ = opt_q.use_winograd23_convolution;
                uVar121._0_1_ = opt_q.use_winograd43_convolution;
                uVar121._1_1_ = opt_q.use_winograd63_convolution;
                uVar121._2_1_ = opt_q.use_a53_a55_optimized_kernel;
                uVar121._3_1_ = opt_q.use_fp16_uniform;
                local_418.c._0_1_ = opt_q.use_winograd43_convolution;
                local_418.c._1_1_ = opt_q.use_winograd63_convolution;
                local_418.c._2_1_ = opt_q.use_a53_a55_optimized_kernel;
                local_418.c._3_1_ = opt_q.use_fp16_uniform;
                local_418.cstep = local_208;
                if (piVar77 != (int *)0x0) {
                  LOCK();
                  *piVar77 = *piVar77 + -1;
                  UNLOCK();
                  uVar121 = local_418.c;
                  if (*piVar77 == 0) {
                    if (opt_q._32_8_ == 0) {
                      free((void *)opt_q._0_8_);
                      uVar121 = local_418.c;
                    }
                    else {
                      (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                      uVar121 = local_418.c;
                    }
                  }
                }
              }
            }
LAB_00207809:
            local_418.c = uVar121;
            auVar130._0_4_ = 0;
            requantize_from_int32_to_int8
                      (&local_418,top_blob,&this->scale_in_data,
                       &(this->super_Convolution).top_blob_int8_scales,
                       &(this->super_Convolution).bias_data,
                       (this->super_Convolution).activation_type,
                       &(this->super_Convolution).activation_params,pOVar116);
            goto LAB_002081a9;
          }
          if ((local_418.elempack == 4) && ((local_418.c & 1U) == 0)) {
            local_208 = 0;
            opt_q.lightmode = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_ops = false;
            opt_q.use_reserved_0 = false;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.vulkan_device_index = 0;
            opt_q.use_reserved_1 = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_2 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_a53_a55_optimized_kernel = false;
            opt_q.use_fp16_uniform = false;
            convert_packing(&local_418,(Mat *)&opt_q,8,local_4e8);
            piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar77 != (int *)0x0) {
              LOCK();
              *piVar77 = *piVar77 + 1;
              UNLOCK();
            }
            piVar77 = (int *)CONCAT44(local_418.refcount._4_4_,local_418.refcount._0_4_);
            if (piVar77 != (int *)0x0) {
              LOCK();
              *piVar77 = *piVar77 + -1;
              UNLOCK();
              if (*piVar77 == 0) {
                if (local_418.allocator == (Allocator *)0x0) {
                  free(local_418.data);
                }
                else {
                  (*(local_418.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            piVar77 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            local_418.data = (void *)opt_q._0_8_;
            local_418.refcount._0_4_ = opt_q.blob_allocator._0_4_;
            local_418.refcount._4_4_ = opt_q.blob_allocator._4_4_;
            local_418.elemsize =
                 CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
            local_418.elempack = opt_q.openmp_blocktime;
            local_418.allocator = (Allocator *)opt_q._32_8_;
            local_418.dims = opt_q.vulkan_device_index;
            local_418.w._0_1_ = opt_q.use_reserved_1;
            local_418.w._1_1_ = opt_q.use_image_storage;
            local_418.w._2_1_ = opt_q.use_tensor_storage;
            local_418.w._3_1_ = opt_q.use_reserved_2;
            local_418.h = opt_q.flush_denormals;
            local_418.d._0_1_ = opt_q.use_local_pool_allocator;
            local_418.d._1_1_ = opt_q.use_shader_local_memory;
            local_418.d._2_1_ = opt_q.use_cooperative_matrix;
            local_418.d._3_1_ = opt_q.use_winograd23_convolution;
            local_418.c._0_1_ = opt_q.use_winograd43_convolution;
            local_418.c._1_1_ = opt_q.use_winograd63_convolution;
            local_418.c._2_1_ = opt_q.use_a53_a55_optimized_kernel;
            local_418.c._3_1_ = opt_q.use_fp16_uniform;
            local_418.cstep = local_208;
            if (piVar77 != (int *)0x0) {
              LOCK();
              *piVar77 = *piVar77 + -1;
              UNLOCK();
              if (*piVar77 == 0) {
                if (opt_q._32_8_ == 0) {
                  free((void *)opt_q._0_8_);
                }
                else {
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
            }
          }
        }
        else if (100 < iVar14) goto LAB_00207809;
        dequantize_from_int32
                  (&local_418,top_blob,&this->scale_in_data,&(this->super_Convolution).bias_data,
                   pOVar116);
        pLVar17 = this->activation;
        auVar130._0_4_ = 0;
        if (pLVar17 != (Layer *)0x0) {
          (*pLVar17->_vptr_Layer[9])(pLVar17,top_blob,local_4e8);
        }
      }
LAB_002081a9:
      piVar77 = (int *)CONCAT44(local_418.refcount._4_4_,local_418.refcount._0_4_);
      if (piVar77 != (int *)0x0) {
        LOCK();
        *piVar77 = *piVar77 + -1;
        UNLOCK();
        if (*piVar77 == 0) {
          if (local_418.allocator == (Allocator *)0x0) {
            free(local_418.data);
          }
          else {
            (*(local_418.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  piVar77 = (int *)CONCAT44(local_488.refcount._4_4_,local_488.refcount._0_4_);
  if (piVar77 != (int *)0x0) {
    LOCK();
    *piVar77 = *piVar77 + -1;
    UNLOCK();
    if (*piVar77 == 0) {
      if (local_488.allocator == (Allocator *)0x0) {
        free(local_488.data);
      }
      else {
        (*(local_488.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00208226:
  if (local_a8.refcount != (int *)0x0) {
    LOCK();
    *local_a8.refcount = *local_a8.refcount + -1;
    UNLOCK();
    if (*local_a8.refcount == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        free(local_a8.data);
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return auVar130._0_4_;
}

Assistant:

int Convolution_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    //     NCNN_LOGE("Convolution_x86_avx input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
        {
#if __AVX512F__
            out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_x86 %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
        {
#if __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
        else
        {
#if __AVX512F__
            out_elempack_int32 = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

#if __SSE2__
    if (opt.use_packing_layout)
    {
        if ((opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1) || (!opt.use_sgemm_convolution))
        {
            // TODO implement winograd and packed int8 avx pack8 output
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
        }
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution && !weight_winograd43_data.empty())
            ret = conv3x3s1_winograd43_int8(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, _nT, opt);
        else
            ret = conv3x3s1_winograd23_int8(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, _nT, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        ret = convolution_im2col_gemm_int8(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
    }
    else
    {
        convolution_packed_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
    }
    if (ret != 0)
        return ret;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        // NCNN_LOGE("top_blob_int32  %d  %d", top_blob_int32.c, top_blob_int32.elempack);
        if (use_int8_requantize)
        {
            // TODO implement winograd and packed int8 pack1 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 1)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 1, opt);
                top_blob_int32 = tmp;
            }
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
        }
        else
        {
#if __AVX__
            // TODO implement winograd and packed int8 avx pack8 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
#endif // __AVX__
        }
    }
#endif

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}